

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive PVar1;
  uint uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  RTCRayQueryContext *pRVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  byte bVar82;
  byte bVar83;
  byte bVar84;
  ulong uVar85;
  byte bVar86;
  byte bVar87;
  ulong uVar88;
  int iVar89;
  ulong uVar90;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  uint uVar91;
  long lVar92;
  byte bVar93;
  uint uVar94;
  uint uVar95;
  uint uVar161;
  uint uVar162;
  uint uVar164;
  uint uVar165;
  uint uVar166;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  uint uVar163;
  uint uVar167;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  float pp;
  float fVar168;
  float fVar169;
  undefined1 auVar170 [16];
  undefined1 auVar174 [32];
  float fVar186;
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar171 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar182 [32];
  float fVar184;
  float fVar185;
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar183 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar190;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar191 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar210;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar226;
  float fVar227;
  float fVar228;
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  float fVar229;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar242 [32];
  float fVar246;
  float fVar253;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar251;
  float fVar252;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar257;
  undefined1 auVar256 [64];
  undefined1 auVar258 [32];
  undefined1 auVar261 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar262 [64];
  float fVar263;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar270;
  undefined1 auVar266 [32];
  float fVar268;
  float fVar269;
  undefined1 auVar267 [64];
  undefined1 auVar271 [16];
  undefined1 auVar272 [64];
  float fVar274;
  undefined1 auVar273 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [32];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  undefined1 auVar282 [64];
  undefined1 auVar283 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_b70;
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  undefined1 local_a80 [32];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 (*local_a28) [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_930 [16];
  undefined1 local_920 [16];
  undefined1 local_910 [8];
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [16];
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  Primitive *local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  undefined1 auStack_850 [16];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [32];
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  
  PVar1 = prim[1];
  uVar85 = (ulong)(byte)PVar1;
  fVar263 = *(float *)(prim + uVar85 * 0x19 + 0x12);
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar21 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar100 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar101 = vsubps_avx(auVar20,*(undefined1 (*) [16])(prim + uVar85 * 0x19 + 6));
  fVar229 = fVar263 * auVar101._0_4_;
  fVar168 = fVar263 * auVar100._0_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar85 * 4 + 6);
  auVar114 = vpmovsxbd_avx2(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar85 * 5 + 6);
  auVar112 = vpmovsxbd_avx2(auVar21);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar85 * 6 + 6);
  auVar115 = vpmovsxbd_avx2(auVar98);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar85 * 0xb + 6);
  auVar116 = vpmovsxbd_avx2(auVar103);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6);
  auVar121 = vpmovsxbd_avx2(auVar96);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar117 = vcvtdq2ps_avx(auVar121);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + (uint)(byte)PVar1 * 0xc + uVar85 + 6);
  auVar113 = vpmovsxbd_avx2(auVar108);
  auVar113 = vcvtdq2ps_avx(auVar113);
  uVar88 = (ulong)(uint)((int)(uVar85 * 9) * 2);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar88 + 6);
  auVar118 = vpmovsxbd_avx2(auVar104);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar88 + uVar85 + 6);
  auVar119 = vpmovsxbd_avx2(auVar97);
  auVar119 = vcvtdq2ps_avx(auVar119);
  uVar90 = (ulong)(uint)((int)(uVar85 * 5) << 2);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar90 + 6);
  auVar111 = vpmovsxbd_avx2(auVar99);
  auVar120 = vcvtdq2ps_avx(auVar111);
  auVar131._4_4_ = fVar168;
  auVar131._0_4_ = fVar168;
  auVar131._8_4_ = fVar168;
  auVar131._12_4_ = fVar168;
  auVar131._16_4_ = fVar168;
  auVar131._20_4_ = fVar168;
  auVar131._24_4_ = fVar168;
  auVar131._28_4_ = fVar168;
  auVar133._8_4_ = 1;
  auVar133._0_8_ = 0x100000001;
  auVar133._12_4_ = 1;
  auVar133._16_4_ = 1;
  auVar133._20_4_ = 1;
  auVar133._24_4_ = 1;
  auVar133._28_4_ = 1;
  auVar109 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar123 = ZEXT1632(CONCAT412(fVar263 * auVar100._12_4_,
                                CONCAT48(fVar263 * auVar100._8_4_,
                                         CONCAT44(fVar263 * auVar100._4_4_,fVar168))));
  auVar122 = vpermps_avx2(auVar133,auVar123);
  auVar110 = vpermps_avx512vl(auVar109,auVar123);
  fVar168 = auVar110._0_4_;
  fVar268 = auVar110._4_4_;
  auVar123._4_4_ = fVar268 * auVar115._4_4_;
  auVar123._0_4_ = fVar168 * auVar115._0_4_;
  fVar269 = auVar110._8_4_;
  auVar123._8_4_ = fVar269 * auVar115._8_4_;
  fVar270 = auVar110._12_4_;
  auVar123._12_4_ = fVar270 * auVar115._12_4_;
  fVar243 = auVar110._16_4_;
  auVar123._16_4_ = fVar243 * auVar115._16_4_;
  fVar244 = auVar110._20_4_;
  auVar123._20_4_ = fVar244 * auVar115._20_4_;
  fVar245 = auVar110._24_4_;
  auVar123._24_4_ = fVar245 * auVar115._24_4_;
  auVar123._28_4_ = auVar121._28_4_;
  auVar121._4_4_ = auVar113._4_4_ * fVar268;
  auVar121._0_4_ = auVar113._0_4_ * fVar168;
  auVar121._8_4_ = auVar113._8_4_ * fVar269;
  auVar121._12_4_ = auVar113._12_4_ * fVar270;
  auVar121._16_4_ = auVar113._16_4_ * fVar243;
  auVar121._20_4_ = auVar113._20_4_ * fVar244;
  auVar121._24_4_ = auVar113._24_4_ * fVar245;
  auVar121._28_4_ = auVar111._28_4_;
  auVar111._4_4_ = auVar120._4_4_ * fVar268;
  auVar111._0_4_ = auVar120._0_4_ * fVar168;
  auVar111._8_4_ = auVar120._8_4_ * fVar269;
  auVar111._12_4_ = auVar120._12_4_ * fVar270;
  auVar111._16_4_ = auVar120._16_4_ * fVar243;
  auVar111._20_4_ = auVar120._20_4_ * fVar244;
  auVar111._24_4_ = auVar120._24_4_ * fVar245;
  auVar111._28_4_ = auVar110._28_4_;
  auVar20 = vfmadd231ps_fma(auVar123,auVar122,auVar112);
  auVar21 = vfmadd231ps_fma(auVar121,auVar122,auVar117);
  auVar98 = vfmadd231ps_fma(auVar111,auVar119,auVar122);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar131,auVar114);
  auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar131,auVar116);
  auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar118,auVar131);
  auVar132._4_4_ = fVar229;
  auVar132._0_4_ = fVar229;
  auVar132._8_4_ = fVar229;
  auVar132._12_4_ = fVar229;
  auVar132._16_4_ = fVar229;
  auVar132._20_4_ = fVar229;
  auVar132._24_4_ = fVar229;
  auVar132._28_4_ = fVar229;
  auVar111 = ZEXT1632(CONCAT412(fVar263 * auVar101._12_4_,
                                CONCAT48(fVar263 * auVar101._8_4_,
                                         CONCAT44(fVar263 * auVar101._4_4_,fVar229))));
  auVar121 = vpermps_avx2(auVar133,auVar111);
  auVar111 = vpermps_avx512vl(auVar109,auVar111);
  fVar263 = auVar111._0_4_;
  fVar168 = auVar111._4_4_;
  auVar122._4_4_ = fVar168 * auVar115._4_4_;
  auVar122._0_4_ = fVar263 * auVar115._0_4_;
  fVar268 = auVar111._8_4_;
  auVar122._8_4_ = fVar268 * auVar115._8_4_;
  fVar269 = auVar111._12_4_;
  auVar122._12_4_ = fVar269 * auVar115._12_4_;
  fVar270 = auVar111._16_4_;
  auVar122._16_4_ = fVar270 * auVar115._16_4_;
  fVar243 = auVar111._20_4_;
  auVar122._20_4_ = fVar243 * auVar115._20_4_;
  fVar244 = auVar111._24_4_;
  auVar122._24_4_ = fVar244 * auVar115._24_4_;
  auVar122._28_4_ = 1;
  auVar109._4_4_ = auVar113._4_4_ * fVar168;
  auVar109._0_4_ = auVar113._0_4_ * fVar263;
  auVar109._8_4_ = auVar113._8_4_ * fVar268;
  auVar109._12_4_ = auVar113._12_4_ * fVar269;
  auVar109._16_4_ = auVar113._16_4_ * fVar270;
  auVar109._20_4_ = auVar113._20_4_ * fVar243;
  auVar109._24_4_ = auVar113._24_4_ * fVar244;
  auVar109._28_4_ = auVar115._28_4_;
  auVar113._4_4_ = auVar120._4_4_ * fVar168;
  auVar113._0_4_ = auVar120._0_4_ * fVar263;
  auVar113._8_4_ = auVar120._8_4_ * fVar268;
  auVar113._12_4_ = auVar120._12_4_ * fVar269;
  auVar113._16_4_ = auVar120._16_4_ * fVar270;
  auVar113._20_4_ = auVar120._20_4_ * fVar243;
  auVar113._24_4_ = auVar120._24_4_ * fVar244;
  auVar113._28_4_ = auVar111._28_4_;
  auVar103 = vfmadd231ps_fma(auVar122,auVar121,auVar112);
  auVar96 = vfmadd231ps_fma(auVar109,auVar121,auVar117);
  auVar108 = vfmadd231ps_fma(auVar113,auVar121,auVar119);
  auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar132,auVar114);
  auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar132,auVar116);
  auVar128._8_4_ = 0x7fffffff;
  auVar128._0_8_ = 0x7fffffff7fffffff;
  auVar128._12_4_ = 0x7fffffff;
  auVar128._16_4_ = 0x7fffffff;
  auVar128._20_4_ = 0x7fffffff;
  auVar128._24_4_ = 0x7fffffff;
  auVar128._28_4_ = 0x7fffffff;
  auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar132,auVar118);
  auVar114 = vandps_avx(ZEXT1632(auVar20),auVar128);
  auVar130._8_4_ = 0x219392ef;
  auVar130._0_8_ = 0x219392ef219392ef;
  auVar130._12_4_ = 0x219392ef;
  auVar130._16_4_ = 0x219392ef;
  auVar130._20_4_ = 0x219392ef;
  auVar130._24_4_ = 0x219392ef;
  auVar130._28_4_ = 0x219392ef;
  uVar88 = vcmpps_avx512vl(auVar114,auVar130,1);
  bVar6 = (bool)((byte)uVar88 & 1);
  auVar110._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar20._0_4_;
  bVar6 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar110._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar20._4_4_;
  bVar6 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar110._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar20._8_4_;
  bVar6 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar110._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar20._12_4_;
  auVar110._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar110._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar110._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar110._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar114 = vandps_avx(ZEXT1632(auVar21),auVar128);
  uVar88 = vcmpps_avx512vl(auVar114,auVar130,1);
  bVar6 = (bool)((byte)uVar88 & 1);
  auVar124._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar21._0_4_;
  bVar6 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar124._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar21._4_4_;
  bVar6 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar124._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar21._8_4_;
  bVar6 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar124._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar21._12_4_;
  auVar124._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar124._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar124._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar124._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar114 = vandps_avx(ZEXT1632(auVar98),auVar128);
  uVar88 = vcmpps_avx512vl(auVar114,auVar130,1);
  bVar6 = (bool)((byte)uVar88 & 1);
  auVar114._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar98._0_4_;
  bVar6 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar114._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar98._4_4_;
  bVar6 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar114._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar98._8_4_;
  bVar6 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar114._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar98._12_4_;
  auVar114._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar114._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar114._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar114._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar112 = vrcp14ps_avx512vl(auVar110);
  auVar129._8_4_ = 0x3f800000;
  auVar129._0_8_ = 0x3f8000003f800000;
  auVar129._12_4_ = 0x3f800000;
  auVar129._16_4_ = 0x3f800000;
  auVar129._20_4_ = 0x3f800000;
  auVar129._24_4_ = 0x3f800000;
  auVar129._28_4_ = 0x3f800000;
  auVar20 = vfnmadd213ps_fma(auVar110,auVar112,auVar129);
  auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar112,auVar112);
  auVar112 = vrcp14ps_avx512vl(auVar124);
  auVar21 = vfnmadd213ps_fma(auVar124,auVar112,auVar129);
  auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar112,auVar112);
  auVar112 = vrcp14ps_avx512vl(auVar114);
  auVar98 = vfnmadd213ps_fma(auVar114,auVar112,auVar129);
  auVar98 = vfmadd132ps_fma(ZEXT1632(auVar98),auVar112,auVar112);
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 7 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar103));
  auVar118._4_4_ = auVar20._4_4_ * auVar114._4_4_;
  auVar118._0_4_ = auVar20._0_4_ * auVar114._0_4_;
  auVar118._8_4_ = auVar20._8_4_ * auVar114._8_4_;
  auVar118._12_4_ = auVar20._12_4_ * auVar114._12_4_;
  auVar118._16_4_ = auVar114._16_4_ * 0.0;
  auVar118._20_4_ = auVar114._20_4_ * 0.0;
  auVar118._24_4_ = auVar114._24_4_ * 0.0;
  auVar118._28_4_ = auVar114._28_4_;
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 9 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar103));
  auVar113 = vpbroadcastd_avx512vl();
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar1 * 0x10 + 6));
  auVar127._0_4_ = auVar20._0_4_ * auVar114._0_4_;
  auVar127._4_4_ = auVar20._4_4_ * auVar114._4_4_;
  auVar127._8_4_ = auVar20._8_4_ * auVar114._8_4_;
  auVar127._12_4_ = auVar20._12_4_ * auVar114._12_4_;
  auVar127._16_4_ = auVar114._16_4_ * 0.0;
  auVar127._20_4_ = auVar114._20_4_ * 0.0;
  auVar127._24_4_ = auVar114._24_4_ * 0.0;
  auVar127._28_4_ = 0;
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar1 * 0x10 + uVar85 * -2 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar96));
  auVar119._4_4_ = auVar21._4_4_ * auVar114._4_4_;
  auVar119._0_4_ = auVar21._0_4_ * auVar114._0_4_;
  auVar119._8_4_ = auVar21._8_4_ * auVar114._8_4_;
  auVar119._12_4_ = auVar21._12_4_ * auVar114._12_4_;
  auVar119._16_4_ = auVar114._16_4_ * 0.0;
  auVar119._20_4_ = auVar114._20_4_ * 0.0;
  auVar119._24_4_ = auVar114._24_4_ * 0.0;
  auVar119._28_4_ = auVar114._28_4_;
  auVar114 = vcvtdq2ps_avx(auVar112);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar96));
  auVar126._0_4_ = auVar21._0_4_ * auVar114._0_4_;
  auVar126._4_4_ = auVar21._4_4_ * auVar114._4_4_;
  auVar126._8_4_ = auVar21._8_4_ * auVar114._8_4_;
  auVar126._12_4_ = auVar21._12_4_ * auVar114._12_4_;
  auVar126._16_4_ = auVar114._16_4_ * 0.0;
  auVar126._20_4_ = auVar114._20_4_ * 0.0;
  auVar126._24_4_ = auVar114._24_4_ * 0.0;
  auVar126._28_4_ = 0;
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar90 + uVar85 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar108));
  auVar120._4_4_ = auVar114._4_4_ * auVar98._4_4_;
  auVar120._0_4_ = auVar114._0_4_ * auVar98._0_4_;
  auVar120._8_4_ = auVar114._8_4_ * auVar98._8_4_;
  auVar120._12_4_ = auVar114._12_4_ * auVar98._12_4_;
  auVar120._16_4_ = auVar114._16_4_ * 0.0;
  auVar120._20_4_ = auVar114._20_4_ * 0.0;
  auVar120._24_4_ = auVar114._24_4_ * 0.0;
  auVar120._28_4_ = auVar114._28_4_;
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 0x17 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar108));
  auVar125._0_4_ = auVar98._0_4_ * auVar114._0_4_;
  auVar125._4_4_ = auVar98._4_4_ * auVar114._4_4_;
  auVar125._8_4_ = auVar98._8_4_ * auVar114._8_4_;
  auVar125._12_4_ = auVar98._12_4_ * auVar114._12_4_;
  auVar125._16_4_ = auVar114._16_4_ * 0.0;
  auVar125._20_4_ = auVar114._20_4_ * 0.0;
  auVar125._24_4_ = auVar114._24_4_ * 0.0;
  auVar125._28_4_ = 0;
  auVar114 = vpminsd_avx2(auVar118,auVar127);
  auVar112 = vpminsd_avx2(auVar119,auVar126);
  auVar114 = vmaxps_avx(auVar114,auVar112);
  auVar112 = vpminsd_avx2(auVar120,auVar125);
  uVar190 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar115._4_4_ = uVar190;
  auVar115._0_4_ = uVar190;
  auVar115._8_4_ = uVar190;
  auVar115._12_4_ = uVar190;
  auVar115._16_4_ = uVar190;
  auVar115._20_4_ = uVar190;
  auVar115._24_4_ = uVar190;
  auVar115._28_4_ = uVar190;
  auVar112 = vmaxps_avx512vl(auVar112,auVar115);
  auVar114 = vmaxps_avx(auVar114,auVar112);
  auVar112._8_4_ = 0x3f7ffffa;
  auVar112._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar112._12_4_ = 0x3f7ffffa;
  auVar112._16_4_ = 0x3f7ffffa;
  auVar112._20_4_ = 0x3f7ffffa;
  auVar112._24_4_ = 0x3f7ffffa;
  auVar112._28_4_ = 0x3f7ffffa;
  local_640 = vmulps_avx512vl(auVar114,auVar112);
  auVar114 = vpmaxsd_avx2(auVar118,auVar127);
  auVar112 = vpmaxsd_avx2(auVar119,auVar126);
  auVar114 = vminps_avx(auVar114,auVar112);
  auVar112 = vpmaxsd_avx2(auVar120,auVar125);
  uVar190 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar116._4_4_ = uVar190;
  auVar116._0_4_ = uVar190;
  auVar116._8_4_ = uVar190;
  auVar116._12_4_ = uVar190;
  auVar116._16_4_ = uVar190;
  auVar116._20_4_ = uVar190;
  auVar116._24_4_ = uVar190;
  auVar116._28_4_ = uVar190;
  auVar112 = vminps_avx512vl(auVar112,auVar116);
  auVar114 = vminps_avx(auVar114,auVar112);
  auVar117._8_4_ = 0x3f800003;
  auVar117._0_8_ = 0x3f8000033f800003;
  auVar117._12_4_ = 0x3f800003;
  auVar117._16_4_ = 0x3f800003;
  auVar117._20_4_ = 0x3f800003;
  auVar117._24_4_ = 0x3f800003;
  auVar117._28_4_ = 0x3f800003;
  auVar114 = vmulps_avx512vl(auVar114,auVar117);
  uVar23 = vpcmpgtd_avx512vl(auVar113,_DAT_01fe9900);
  uVar22 = vcmpps_avx512vl(local_640,auVar114,2);
  if ((byte)((byte)uVar22 & (byte)uVar23) == 0) {
    return;
  }
  local_8c8 = (ulong)(byte)((byte)uVar22 & (byte)uVar23);
  local_a28 = (undefined1 (*) [32])local_240;
  auVar183 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar183);
  local_8d0 = prim;
LAB_01d76276:
  lVar92 = 0;
  for (uVar88 = local_8c8; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000) {
    lVar92 = lVar92 + 1;
  }
  uVar91 = *(uint *)(prim + 2);
  uVar2 = *(uint *)(prim + lVar92 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar91].ptr;
  uVar88 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar2);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar92 = *(long *)&pGVar3[1].time_range.upper;
  auVar20 = *(undefined1 (*) [16])(lVar92 + (long)p_Var4 * uVar88);
  auVar21 = *(undefined1 (*) [16])(lVar92 + (uVar88 + 1) * (long)p_Var4);
  auVar98 = *(undefined1 (*) [16])(lVar92 + (uVar88 + 2) * (long)p_Var4);
  local_8c8 = local_8c8 - 1 & local_8c8;
  auVar103 = *(undefined1 (*) [16])(lVar92 + (uVar88 + 3) * (long)p_Var4);
  if (local_8c8 != 0) {
    uVar90 = local_8c8 - 1 & local_8c8;
    for (uVar88 = local_8c8; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000) {
    }
    if (uVar90 != 0) {
      for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar108 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar190 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar102._4_4_ = uVar190;
  auVar102._0_4_ = uVar190;
  auVar102._8_4_ = uVar190;
  auVar102._12_4_ = uVar190;
  local_7e0._16_4_ = uVar190;
  local_7e0._0_16_ = auVar102;
  local_7e0._20_4_ = uVar190;
  local_7e0._24_4_ = uVar190;
  local_7e0._28_4_ = uVar190;
  auVar279 = ZEXT3264(local_7e0);
  uVar190 = *(undefined4 *)(ray + k * 4 + 0x140);
  auVar107._4_4_ = uVar190;
  auVar107._0_4_ = uVar190;
  auVar107._8_4_ = uVar190;
  auVar107._12_4_ = uVar190;
  local_800._16_4_ = uVar190;
  local_800._0_16_ = auVar107;
  local_800._20_4_ = uVar190;
  local_800._24_4_ = uVar190;
  local_800._28_4_ = uVar190;
  auVar96 = vunpcklps_avx(auVar102,auVar107);
  fVar263 = *(float *)(ray + k * 4 + 0x180);
  auVar271._4_4_ = fVar263;
  auVar271._0_4_ = fVar263;
  auVar271._8_4_ = fVar263;
  auVar271._12_4_ = fVar263;
  local_820._16_4_ = fVar263;
  local_820._0_16_ = auVar271;
  local_820._20_4_ = fVar263;
  local_820._24_4_ = fVar263;
  local_820._28_4_ = fVar263;
  local_9f0 = vinsertps_avx(auVar96,auVar271,0x28);
  auVar272 = ZEXT1664(local_9f0);
  auVar101._0_4_ = auVar20._0_4_ + auVar21._0_4_ + auVar98._0_4_ + auVar103._0_4_;
  auVar101._4_4_ = auVar20._4_4_ + auVar21._4_4_ + auVar98._4_4_ + auVar103._4_4_;
  auVar101._8_4_ = auVar20._8_4_ + auVar21._8_4_ + auVar98._8_4_ + auVar103._8_4_;
  auVar101._12_4_ = auVar20._12_4_ + auVar21._12_4_ + auVar98._12_4_ + auVar103._12_4_;
  auVar100._8_4_ = 0x3e800000;
  auVar100._0_8_ = 0x3e8000003e800000;
  auVar100._12_4_ = 0x3e800000;
  auVar96 = vmulps_avx512vl(auVar101,auVar100);
  auVar96 = vsubps_avx(auVar96,auVar108);
  auVar96 = vdpps_avx(auVar96,local_9f0,0x7f);
  fVar168 = *(float *)(ray + k * 4 + 0xc0);
  auVar273 = ZEXT464((uint)fVar168);
  local_a00 = vdpps_avx(local_9f0,local_9f0,0x7f);
  auVar275 = ZEXT1664(local_a00);
  auVar105._4_12_ = ZEXT812(0) << 0x20;
  auVar105._0_4_ = local_a00._0_4_;
  auVar97 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar105);
  auVar104 = vfnmadd213ss_fma(auVar97,local_a00,ZEXT416(0x40000000));
  local_620 = auVar96._0_4_ * auVar97._0_4_ * auVar104._0_4_;
  auVar256 = ZEXT464((uint)local_620);
  auVar106._4_4_ = local_620;
  auVar106._0_4_ = local_620;
  auVar106._8_4_ = local_620;
  auVar106._12_4_ = local_620;
  fStack_9d0 = local_620;
  _local_9e0 = auVar106;
  fStack_9cc = local_620;
  fStack_9c8 = local_620;
  fStack_9c4 = local_620;
  auVar96 = vfmadd231ps_fma(auVar108,local_9f0,auVar106);
  auVar96 = vblendps_avx(auVar96,ZEXT816(0) << 0x40,8);
  auVar20 = vsubps_avx(auVar20,auVar96);
  auVar98 = vsubps_avx(auVar98,auVar96);
  auVar262 = ZEXT1664(auVar98);
  auVar21 = vsubps_avx(auVar21,auVar96);
  auVar267 = ZEXT1664(auVar21);
  auVar103 = vsubps_avx(auVar103,auVar96);
  auVar114 = vbroadcastss_avx512vl(auVar20);
  auVar135._8_4_ = 1;
  auVar135._0_8_ = 0x100000001;
  auVar135._12_4_ = 1;
  auVar135._16_4_ = 1;
  auVar135._20_4_ = 1;
  auVar135._24_4_ = 1;
  auVar135._28_4_ = 1;
  local_960 = ZEXT1632(auVar20);
  auVar112 = vpermps_avx512vl(auVar135,local_960);
  auVar136._8_4_ = 2;
  auVar136._0_8_ = 0x200000002;
  auVar136._12_4_ = 2;
  auVar136._16_4_ = 2;
  auVar136._20_4_ = 2;
  auVar136._24_4_ = 2;
  auVar136._28_4_ = 2;
  auVar115 = vpermps_avx512vl(auVar136,local_960);
  auVar137._8_4_ = 3;
  auVar137._0_8_ = 0x300000003;
  auVar137._12_4_ = 3;
  auVar137._16_4_ = 3;
  auVar137._20_4_ = 3;
  auVar137._24_4_ = 3;
  auVar137._28_4_ = 3;
  auVar116 = vpermps_avx512vl(auVar137,local_960);
  local_ae0 = vbroadcastss_avx512vl(auVar21);
  auVar280 = ZEXT3264(local_ae0);
  local_9a0 = ZEXT1632(auVar21);
  auVar117 = vpermps_avx512vl(auVar135,local_9a0);
  local_b00 = vpermps_avx512vl(auVar136,local_9a0);
  auVar281 = ZEXT3264(local_b00);
  auVar113 = vpermps_avx512vl(auVar137,local_9a0);
  local_b20 = vbroadcastss_avx512vl(auVar98);
  auVar282 = ZEXT3264(local_b20);
  local_980 = ZEXT1632(auVar98);
  auVar118 = vpermps_avx512vl(auVar135,local_980);
  local_b40 = vpermps_avx512vl(auVar136,local_980);
  auVar283 = ZEXT3264(local_b40);
  auVar119 = vpermps_avx512vl(auVar137,local_980);
  local_5a0 = vbroadcastss_avx512vl(auVar103);
  _local_9c0 = ZEXT1632(auVar103);
  local_5c0 = vpermps_avx2(auVar135,_local_9c0);
  local_580 = vpermps_avx512vl(auVar136,_local_9c0);
  local_600 = vpermps_avx2(auVar137,_local_9c0);
  auVar20 = vfmadd231ps_fma(ZEXT432((uint)(fVar263 * fVar263)),local_800,local_800);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_7e0,local_7e0);
  local_560._0_4_ = auVar20._0_4_;
  local_560._4_4_ = local_560._0_4_;
  local_560._8_4_ = local_560._0_4_;
  local_560._12_4_ = local_560._0_4_;
  local_560._16_4_ = local_560._0_4_;
  local_560._20_4_ = local_560._0_4_;
  local_560._24_4_ = local_560._0_4_;
  local_560._28_4_ = local_560._0_4_;
  auVar134._8_4_ = 0x7fffffff;
  auVar134._0_8_ = 0x7fffffff7fffffff;
  auVar134._12_4_ = 0x7fffffff;
  auVar134._16_4_ = 0x7fffffff;
  auVar134._20_4_ = 0x7fffffff;
  auVar134._24_4_ = 0x7fffffff;
  auVar134._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_560,auVar134);
  local_930 = ZEXT416((uint)local_620);
  local_620 = fVar168 - local_620;
  fStack_61c = local_620;
  fStack_618 = local_620;
  fStack_614 = local_620;
  fStack_610 = local_620;
  fStack_60c = local_620;
  fStack_608 = local_620;
  fStack_604 = local_620;
  auVar183 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar183);
  iVar89 = 1;
  uVar88 = 0;
  auVar183 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar183);
  auVar20 = vsqrtss_avx(local_a00,local_a00);
  auVar21 = vsqrtss_avx(local_a00,local_a00);
  local_6f0 = ZEXT816(0x3f80000000000000);
  auVar120 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar183 = ZEXT3264(auVar120);
  local_5e0 = local_580;
  do {
    auVar98 = vmovshdup_avx(local_6f0);
    auVar98 = vsubps_avx(auVar98,local_6f0);
    auVar174._0_4_ = auVar98._0_4_;
    fVar253 = auVar174._0_4_ * 0.04761905;
    uVar190 = local_6f0._0_4_;
    local_a80._4_4_ = uVar190;
    local_a80._0_4_ = uVar190;
    local_a80._8_4_ = uVar190;
    local_a80._12_4_ = uVar190;
    local_a80._16_4_ = uVar190;
    local_a80._20_4_ = uVar190;
    local_a80._24_4_ = uVar190;
    local_a80._28_4_ = uVar190;
    auVar174._4_4_ = auVar174._0_4_;
    auVar174._8_4_ = auVar174._0_4_;
    auVar174._12_4_ = auVar174._0_4_;
    auVar174._16_4_ = auVar174._0_4_;
    auVar174._20_4_ = auVar174._0_4_;
    auVar174._24_4_ = auVar174._0_4_;
    auVar174._28_4_ = auVar174._0_4_;
    auVar98 = vfmadd231ps_fma(local_a80,auVar174,_DAT_01faff20);
    auVar121 = vsubps_avx512vl(auVar183._0_32_,ZEXT1632(auVar98));
    fVar263 = auVar121._0_4_;
    fVar269 = auVar121._4_4_;
    fVar243 = auVar121._8_4_;
    fVar245 = auVar121._12_4_;
    fVar246 = auVar121._16_4_;
    fVar251 = auVar121._20_4_;
    fVar252 = auVar121._24_4_;
    fVar169 = fVar263 * fVar263 * fVar263;
    fVar184 = fVar269 * fVar269 * fVar269;
    auVar143._4_4_ = fVar184;
    auVar143._0_4_ = fVar169;
    fVar185 = fVar243 * fVar243 * fVar243;
    auVar143._8_4_ = fVar185;
    fVar186 = fVar245 * fVar245 * fVar245;
    auVar143._12_4_ = fVar186;
    fVar187 = fVar246 * fVar246 * fVar246;
    auVar143._16_4_ = fVar187;
    fVar188 = fVar251 * fVar251 * fVar251;
    auVar143._20_4_ = fVar188;
    fVar189 = fVar252 * fVar252 * fVar252;
    auVar143._24_4_ = fVar189;
    auVar143._28_4_ = auVar174._0_4_;
    auVar120 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar111 = vmulps_avx512vl(auVar143,auVar120);
    fVar268 = auVar98._0_4_;
    fVar270 = auVar98._4_4_;
    fVar244 = auVar98._8_4_;
    fVar229 = auVar98._12_4_;
    fVar210 = fVar268 * fVar268 * fVar268;
    fVar226 = fVar270 * fVar270 * fVar270;
    fVar227 = fVar244 * fVar244 * fVar244;
    fVar228 = fVar229 * fVar229 * fVar229;
    auVar81._28_4_ = DAT_01faff20._28_4_;
    auVar81._0_28_ = ZEXT1628(CONCAT412(fVar228,CONCAT48(fVar227,CONCAT44(fVar226,fVar210))));
    auVar160._0_4_ = fVar268 * fVar263;
    auVar160._4_4_ = fVar270 * fVar269;
    auVar160._8_4_ = fVar244 * fVar243;
    auVar160._12_4_ = fVar229 * fVar245;
    auVar160._16_4_ = fVar246 * 0.0;
    auVar160._20_4_ = fVar251 * 0.0;
    auVar160._28_36_ = auVar272._28_36_;
    auVar160._24_4_ = fVar252 * 0.0;
    auVar122 = vmulps_avx512vl(auVar81,auVar120);
    fVar274 = auVar122._28_4_ + auVar174._0_4_;
    fVar257 = fVar274 + auVar275._28_4_ + auVar256._28_4_;
    auVar144._4_4_ = fVar184 * 0.16666667;
    auVar144._0_4_ = fVar169 * 0.16666667;
    auVar144._8_4_ = fVar185 * 0.16666667;
    auVar144._12_4_ = fVar186 * 0.16666667;
    auVar144._16_4_ = fVar187 * 0.16666667;
    auVar144._20_4_ = fVar188 * 0.16666667;
    auVar144._24_4_ = fVar189 * 0.16666667;
    auVar144._28_4_ = fVar274;
    auVar147._4_4_ =
         (auVar160._4_4_ * fVar269 * 12.0 + auVar160._4_4_ * fVar270 * 6.0 +
         fVar226 + auVar111._4_4_) * 0.16666667;
    auVar147._0_4_ =
         (auVar160._0_4_ * fVar263 * 12.0 + auVar160._0_4_ * fVar268 * 6.0 +
         fVar210 + auVar111._0_4_) * 0.16666667;
    auVar147._8_4_ =
         (auVar160._8_4_ * fVar243 * 12.0 + auVar160._8_4_ * fVar244 * 6.0 +
         fVar227 + auVar111._8_4_) * 0.16666667;
    auVar147._12_4_ =
         (auVar160._12_4_ * fVar245 * 12.0 + auVar160._12_4_ * fVar229 * 6.0 +
         fVar228 + auVar111._12_4_) * 0.16666667;
    auVar147._16_4_ =
         (auVar160._16_4_ * fVar246 * 12.0 + auVar160._16_4_ * 0.0 * 6.0 + auVar111._16_4_ + 0.0) *
         0.16666667;
    auVar147._20_4_ =
         (auVar160._20_4_ * fVar251 * 12.0 + auVar160._20_4_ * 0.0 * 6.0 + auVar111._20_4_ + 0.0) *
         0.16666667;
    auVar147._24_4_ =
         (auVar160._24_4_ * fVar252 * 12.0 + auVar160._24_4_ * 0.0 * 6.0 + auVar111._24_4_ + 0.0) *
         0.16666667;
    auVar147._28_4_ = auVar275._28_4_;
    auVar148._4_4_ =
         (auVar122._4_4_ + fVar184 +
         auVar160._4_4_ * fVar270 * 12.0 + auVar160._4_4_ * fVar269 * 6.0) * 0.16666667;
    auVar148._0_4_ =
         (auVar122._0_4_ + fVar169 +
         auVar160._0_4_ * fVar268 * 12.0 + auVar160._0_4_ * fVar263 * 6.0) * 0.16666667;
    auVar148._8_4_ =
         (auVar122._8_4_ + fVar185 +
         auVar160._8_4_ * fVar244 * 12.0 + auVar160._8_4_ * fVar243 * 6.0) * 0.16666667;
    auVar148._12_4_ =
         (auVar122._12_4_ + fVar186 +
         auVar160._12_4_ * fVar229 * 12.0 + auVar160._12_4_ * fVar245 * 6.0) * 0.16666667;
    auVar148._16_4_ =
         (auVar122._16_4_ + fVar187 + auVar160._16_4_ * 0.0 * 12.0 + auVar160._16_4_ * fVar246 * 6.0
         ) * 0.16666667;
    auVar148._20_4_ =
         (auVar122._20_4_ + fVar188 + auVar160._20_4_ * 0.0 * 12.0 + auVar160._20_4_ * fVar251 * 6.0
         ) * 0.16666667;
    auVar148._24_4_ =
         (auVar122._24_4_ + fVar189 + auVar160._24_4_ * 0.0 * 12.0 + auVar160._24_4_ * fVar252 * 6.0
         ) * 0.16666667;
    auVar148._28_4_ = auVar279._28_4_;
    fVar210 = fVar210 * 0.16666667;
    fVar226 = fVar226 * 0.16666667;
    fVar227 = fVar227 * 0.16666667;
    fVar228 = fVar228 * 0.16666667;
    auVar242._28_4_ = fVar257;
    auVar242._0_28_ = ZEXT1628(CONCAT412(fVar228,CONCAT48(fVar227,CONCAT44(fVar226,fVar210))));
    auVar122 = vmulps_avx512vl(local_5a0,auVar242);
    auVar39._4_4_ = local_5c0._4_4_ * fVar226;
    auVar39._0_4_ = local_5c0._0_4_ * fVar210;
    auVar39._8_4_ = local_5c0._8_4_ * fVar227;
    auVar39._12_4_ = local_5c0._12_4_ * fVar228;
    auVar39._16_4_ = local_5c0._16_4_ * 0.0;
    auVar39._20_4_ = local_5c0._20_4_ * 0.0;
    auVar39._24_4_ = local_5c0._24_4_ * 0.0;
    auVar39._28_4_ = auVar273._28_4_ + auVar279._28_4_ + DAT_01faff20._28_4_ + auVar111._28_4_;
    auVar111 = vmulps_avx512vl(local_5e0,auVar242);
    auVar40._4_4_ = local_600._4_4_ * fVar226;
    auVar40._0_4_ = local_600._0_4_ * fVar210;
    auVar40._8_4_ = local_600._8_4_ * fVar227;
    auVar40._12_4_ = local_600._12_4_ * fVar228;
    auVar40._16_4_ = local_600._16_4_ * 0.0;
    auVar40._20_4_ = local_600._20_4_ * 0.0;
    auVar40._24_4_ = local_600._24_4_ * 0.0;
    auVar40._28_4_ = fVar257;
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar148,auVar282._0_32_);
    auVar123 = vfmadd231ps_avx512vl(auVar39,auVar148,auVar118);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar148,auVar283._0_32_);
    auVar109 = vfmadd231ps_avx512vl(auVar40,auVar119,auVar148);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar147,auVar280._0_32_);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar147,auVar117);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar147,auVar281._0_32_);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar113,auVar147);
    auVar110 = vfmadd231ps_avx512vl(auVar122,auVar144,auVar114);
    auVar124 = vfmadd231ps_avx512vl(auVar123,auVar144,auVar112);
    auVar125 = vfmadd231ps_avx512vl(auVar111,auVar144,auVar115);
    auVar111 = vfmadd231ps_avx512vl(auVar109,auVar116,auVar144);
    auVar109 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar122 = vxorps_avx512vl(auVar121,auVar109);
    auVar123 = vxorps_avx512vl(ZEXT1632(auVar98),auVar109);
    auVar249._0_4_ = auVar123._0_4_ * fVar268;
    auVar249._4_4_ = auVar123._4_4_ * fVar270;
    auVar249._8_4_ = auVar123._8_4_ * fVar244;
    auVar249._12_4_ = auVar123._12_4_ * fVar229;
    auVar249._16_4_ = auVar123._16_4_ * 0.0;
    auVar249._20_4_ = auVar123._20_4_ * 0.0;
    auVar249._24_4_ = auVar123._24_4_ * 0.0;
    auVar249._28_4_ = 0;
    auVar126 = vmulps_avx512vl(auVar160._0_32_,auVar120);
    auVar120 = vsubps_avx(auVar249,auVar126);
    auVar41._4_4_ = auVar122._4_4_ * fVar269 * 0.5;
    auVar41._0_4_ = auVar122._0_4_ * fVar263 * 0.5;
    auVar41._8_4_ = auVar122._8_4_ * fVar243 * 0.5;
    auVar41._12_4_ = auVar122._12_4_ * fVar245 * 0.5;
    auVar41._16_4_ = auVar122._16_4_ * fVar246 * 0.5;
    auVar41._20_4_ = auVar122._20_4_ * fVar251 * 0.5;
    auVar41._24_4_ = auVar122._24_4_ * fVar252 * 0.5;
    auVar41._28_4_ = auVar121._28_4_;
    auVar42._4_4_ = auVar120._4_4_ * 0.5;
    auVar42._0_4_ = auVar120._0_4_ * 0.5;
    auVar42._8_4_ = auVar120._8_4_ * 0.5;
    auVar42._12_4_ = auVar120._12_4_ * 0.5;
    auVar42._16_4_ = auVar120._16_4_ * 0.5;
    auVar42._20_4_ = auVar120._20_4_ * 0.5;
    auVar42._24_4_ = auVar120._24_4_ * 0.5;
    auVar42._28_4_ = auVar120._28_4_;
    auVar43._4_4_ = (auVar126._4_4_ + fVar269 * fVar269) * 0.5;
    auVar43._0_4_ = (auVar126._0_4_ + fVar263 * fVar263) * 0.5;
    auVar43._8_4_ = (auVar126._8_4_ + fVar243 * fVar243) * 0.5;
    auVar43._12_4_ = (auVar126._12_4_ + fVar245 * fVar245) * 0.5;
    auVar43._16_4_ = (auVar126._16_4_ + fVar246 * fVar246) * 0.5;
    auVar43._20_4_ = (auVar126._20_4_ + fVar251 * fVar251) * 0.5;
    auVar43._24_4_ = (auVar126._24_4_ + fVar252 * fVar252) * 0.5;
    auVar43._28_4_ = auVar126._28_4_ + auVar262._28_4_;
    fVar263 = fVar268 * fVar268 * 0.5;
    fVar268 = fVar270 * fVar270 * 0.5;
    fVar269 = fVar244 * fVar244 * 0.5;
    fVar270 = fVar229 * fVar229 * 0.5;
    auVar44._28_4_ = auVar267._28_4_;
    auVar44._0_28_ = ZEXT1628(CONCAT412(fVar270,CONCAT48(fVar269,CONCAT44(fVar268,fVar263))));
    auVar120 = vmulps_avx512vl(local_5a0,auVar44);
    auVar45._4_4_ = local_5c0._4_4_ * fVar268;
    auVar45._0_4_ = local_5c0._0_4_ * fVar263;
    auVar45._8_4_ = local_5c0._8_4_ * fVar269;
    auVar45._12_4_ = local_5c0._12_4_ * fVar270;
    auVar45._16_4_ = local_5c0._16_4_ * 0.0;
    auVar45._20_4_ = local_5c0._20_4_ * 0.0;
    auVar45._24_4_ = local_5c0._24_4_ * 0.0;
    auVar45._28_4_ = auVar123._28_4_;
    auVar121 = vmulps_avx512vl(local_5e0,auVar44);
    auVar46._4_4_ = fVar268 * local_600._4_4_;
    auVar46._0_4_ = fVar263 * local_600._0_4_;
    auVar46._8_4_ = fVar269 * local_600._8_4_;
    auVar46._12_4_ = fVar270 * local_600._12_4_;
    auVar46._16_4_ = local_600._16_4_ * 0.0;
    auVar46._20_4_ = local_600._20_4_ * 0.0;
    auVar46._24_4_ = local_600._24_4_ * 0.0;
    auVar46._28_4_ = auVar267._28_4_;
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar43,auVar282._0_32_);
    auVar122 = vfmadd231ps_avx512vl(auVar45,auVar43,auVar118);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar43,auVar283._0_32_);
    auVar98 = vfmadd231ps_fma(auVar46,auVar119,auVar43);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar42,auVar280._0_32_);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar42,auVar117);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar42,auVar281._0_32_);
    auVar123 = vfmadd231ps_avx512vl(ZEXT1632(auVar98),auVar113,auVar42);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar41,auVar114);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar41,auVar112);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar41,auVar115);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar116,auVar41);
    auVar47._4_4_ = auVar120._4_4_ * fVar253;
    auVar47._0_4_ = auVar120._0_4_ * fVar253;
    auVar47._8_4_ = auVar120._8_4_ * fVar253;
    auVar47._12_4_ = auVar120._12_4_ * fVar253;
    auVar47._16_4_ = auVar120._16_4_ * fVar253;
    auVar47._20_4_ = auVar120._20_4_ * fVar253;
    auVar47._24_4_ = auVar120._24_4_ * fVar253;
    auVar47._28_4_ = auVar119._28_4_;
    auVar279 = ZEXT3264(auVar47);
    auVar48._4_4_ = auVar122._4_4_ * fVar253;
    auVar48._0_4_ = auVar122._0_4_ * fVar253;
    auVar48._8_4_ = auVar122._8_4_ * fVar253;
    auVar48._12_4_ = auVar122._12_4_ * fVar253;
    auVar48._16_4_ = auVar122._16_4_ * fVar253;
    auVar48._20_4_ = auVar122._20_4_ * fVar253;
    auVar48._24_4_ = auVar122._24_4_ * fVar253;
    auVar48._28_4_ = 0x3e2aaaab;
    auVar49._4_4_ = auVar121._4_4_ * fVar253;
    auVar49._0_4_ = auVar121._0_4_ * fVar253;
    auVar49._8_4_ = auVar121._8_4_ * fVar253;
    auVar49._12_4_ = auVar121._12_4_ * fVar253;
    auVar49._16_4_ = auVar121._16_4_ * fVar253;
    auVar49._20_4_ = auVar121._20_4_ * fVar253;
    auVar49._24_4_ = auVar121._24_4_ * fVar253;
    auVar49._28_4_ = 0x40c00000;
    fVar263 = auVar123._0_4_ * fVar253;
    fVar268 = auVar123._4_4_ * fVar253;
    auVar50._4_4_ = fVar268;
    auVar50._0_4_ = fVar263;
    fVar269 = auVar123._8_4_ * fVar253;
    auVar50._8_4_ = fVar269;
    fVar270 = auVar123._12_4_ * fVar253;
    auVar50._12_4_ = fVar270;
    fVar243 = auVar123._16_4_ * fVar253;
    auVar50._16_4_ = fVar243;
    fVar244 = auVar123._20_4_ * fVar253;
    auVar50._20_4_ = fVar244;
    fVar245 = auVar123._24_4_ * fVar253;
    auVar50._24_4_ = fVar245;
    auVar50._28_4_ = fVar253;
    auVar98 = vxorps_avx512vl(auVar183._0_16_,auVar183._0_16_);
    auVar126 = vpermt2ps_avx512vl(auVar110,_DAT_01feed00,ZEXT1632(auVar98));
    auVar272 = ZEXT3264(auVar126);
    auVar127 = vpermt2ps_avx512vl(auVar124,_DAT_01feed00,ZEXT1632(auVar98));
    auVar273 = ZEXT3264(auVar127);
    auVar122 = ZEXT1632(auVar98);
    auVar128 = vpermt2ps_avx512vl(auVar125,_DAT_01feed00,auVar122);
    auVar275 = ZEXT3264(auVar128);
    auVar250._0_4_ = fVar263 + auVar111._0_4_;
    auVar250._4_4_ = fVar268 + auVar111._4_4_;
    auVar250._8_4_ = fVar269 + auVar111._8_4_;
    auVar250._12_4_ = fVar270 + auVar111._12_4_;
    auVar250._16_4_ = fVar243 + auVar111._16_4_;
    auVar250._20_4_ = fVar244 + auVar111._20_4_;
    auVar250._24_4_ = fVar245 + auVar111._24_4_;
    auVar250._28_4_ = fVar253 + auVar111._28_4_;
    auVar120 = vmaxps_avx(auVar111,auVar250);
    auVar121 = vminps_avx(auVar111,auVar250);
    auVar129 = vpermt2ps_avx512vl(auVar111,_DAT_01feed00,auVar122);
    auVar130 = vpermt2ps_avx512vl(auVar47,_DAT_01feed00,auVar122);
    auVar267 = ZEXT3264(auVar130);
    auVar131 = vpermt2ps_avx512vl(auVar48,_DAT_01feed00,auVar122);
    auVar144 = ZEXT1632(auVar98);
    auVar132 = vpermt2ps_avx512vl(auVar49,_DAT_01feed00,auVar144);
    auVar111 = vpermt2ps_avx512vl(auVar50,_DAT_01feed00,auVar144);
    auVar133 = vsubps_avx512vl(auVar129,auVar111);
    auVar111 = vsubps_avx(auVar126,auVar110);
    auVar262 = ZEXT3264(auVar111);
    auVar122 = vsubps_avx(auVar127,auVar124);
    auVar123 = vsubps_avx(auVar128,auVar125);
    auVar256 = ZEXT3264(auVar123);
    auVar134 = vmulps_avx512vl(auVar122,auVar49);
    auVar134 = vfmsub231ps_avx512vl(auVar134,auVar48,auVar123);
    auVar135 = vmulps_avx512vl(auVar123,auVar47);
    auVar135 = vfmsub231ps_avx512vl(auVar135,auVar49,auVar111);
    auVar136 = vmulps_avx512vl(auVar111,auVar48);
    auVar136 = vfmsub231ps_avx512vl(auVar136,auVar47,auVar122);
    auVar136 = vmulps_avx512vl(auVar136,auVar136);
    auVar135 = vfmadd231ps_avx512vl(auVar136,auVar135,auVar135);
    auVar134 = vfmadd231ps_avx512vl(auVar135,auVar134,auVar134);
    auVar135 = vmulps_avx512vl(auVar123,auVar123);
    auVar135 = vfmadd231ps_avx512vl(auVar135,auVar122,auVar122);
    auVar135 = vfmadd231ps_avx512vl(auVar135,auVar111,auVar111);
    auVar136 = vrcp14ps_avx512vl(auVar135);
    auVar137 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar138 = vfnmadd213ps_avx512vl(auVar136,auVar135,auVar137);
    auVar136 = vfmadd132ps_avx512vl(auVar138,auVar136,auVar136);
    auVar134 = vmulps_avx512vl(auVar134,auVar136);
    auVar138 = vmulps_avx512vl(auVar122,auVar132);
    auVar138 = vfmsub231ps_avx512vl(auVar138,auVar131,auVar123);
    auVar139 = vmulps_avx512vl(auVar123,auVar130);
    auVar139 = vfmsub231ps_avx512vl(auVar139,auVar132,auVar111);
    auVar140 = vmulps_avx512vl(auVar111,auVar131);
    auVar140 = vfmsub231ps_avx512vl(auVar140,auVar130,auVar122);
    auVar140 = vmulps_avx512vl(auVar140,auVar140);
    auVar139 = vfmadd231ps_avx512vl(auVar140,auVar139,auVar139);
    auVar138 = vfmadd231ps_avx512vl(auVar139,auVar138,auVar138);
    auVar136 = vmulps_avx512vl(auVar138,auVar136);
    auVar134 = vmaxps_avx512vl(auVar134,auVar136);
    auVar134 = vsqrtps_avx512vl(auVar134);
    auVar136 = vmaxps_avx512vl(auVar133,auVar129);
    auVar120 = vmaxps_avx512vl(auVar120,auVar136);
    auVar136 = vaddps_avx512vl(auVar134,auVar120);
    auVar120 = vminps_avx512vl(auVar133,auVar129);
    auVar120 = vminps_avx(auVar121,auVar120);
    auVar120 = vsubps_avx512vl(auVar120,auVar134);
    auVar138._8_4_ = 0x3f800002;
    auVar138._0_8_ = 0x3f8000023f800002;
    auVar138._12_4_ = 0x3f800002;
    auVar138._16_4_ = 0x3f800002;
    auVar138._20_4_ = 0x3f800002;
    auVar138._24_4_ = 0x3f800002;
    auVar138._28_4_ = 0x3f800002;
    auVar121 = vmulps_avx512vl(auVar136,auVar138);
    auVar139._8_4_ = 0x3f7ffffc;
    auVar139._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar139._12_4_ = 0x3f7ffffc;
    auVar139._16_4_ = 0x3f7ffffc;
    auVar139._20_4_ = 0x3f7ffffc;
    auVar139._24_4_ = 0x3f7ffffc;
    auVar139._28_4_ = 0x3f7ffffc;
    auVar120 = vmulps_avx512vl(auVar120,auVar139);
    auVar121 = vmulps_avx512vl(auVar121,auVar121);
    auVar129 = vrsqrt14ps_avx512vl(auVar135);
    auVar140._8_4_ = 0xbf000000;
    auVar140._0_8_ = 0xbf000000bf000000;
    auVar140._12_4_ = 0xbf000000;
    auVar140._16_4_ = 0xbf000000;
    auVar140._20_4_ = 0xbf000000;
    auVar140._24_4_ = 0xbf000000;
    auVar140._28_4_ = 0xbf000000;
    auVar133 = vmulps_avx512vl(auVar135,auVar140);
    fVar263 = auVar129._0_4_;
    fVar268 = auVar129._4_4_;
    fVar269 = auVar129._8_4_;
    fVar270 = auVar129._12_4_;
    fVar243 = auVar129._16_4_;
    fVar244 = auVar129._20_4_;
    fVar245 = auVar129._24_4_;
    auVar51._4_4_ = fVar268 * fVar268 * fVar268 * auVar133._4_4_;
    auVar51._0_4_ = fVar263 * fVar263 * fVar263 * auVar133._0_4_;
    auVar51._8_4_ = fVar269 * fVar269 * fVar269 * auVar133._8_4_;
    auVar51._12_4_ = fVar270 * fVar270 * fVar270 * auVar133._12_4_;
    auVar51._16_4_ = fVar243 * fVar243 * fVar243 * auVar133._16_4_;
    auVar51._20_4_ = fVar244 * fVar244 * fVar244 * auVar133._20_4_;
    auVar51._24_4_ = fVar245 * fVar245 * fVar245 * auVar133._24_4_;
    auVar51._28_4_ = auVar136._28_4_;
    auVar141._8_4_ = 0x3fc00000;
    auVar141._0_8_ = 0x3fc000003fc00000;
    auVar141._12_4_ = 0x3fc00000;
    auVar141._16_4_ = 0x3fc00000;
    auVar141._20_4_ = 0x3fc00000;
    auVar141._24_4_ = 0x3fc00000;
    auVar141._28_4_ = 0x3fc00000;
    auVar129 = vfmadd231ps_avx512vl(auVar51,auVar129,auVar141);
    auVar133 = vmulps_avx512vl(auVar111,auVar129);
    auVar134 = vmulps_avx512vl(auVar122,auVar129);
    auVar135 = vmulps_avx512vl(auVar123,auVar129);
    auVar136 = vsubps_avx512vl(auVar144,auVar110);
    auVar138 = vsubps_avx512vl(auVar144,auVar124);
    auVar139 = vsubps_avx512vl(auVar144,auVar125);
    auVar140 = vmulps_avx512vl(local_820,auVar139);
    auVar140 = vfmadd231ps_avx512vl(auVar140,local_800,auVar138);
    auVar140 = vfmadd231ps_avx512vl(auVar140,local_7e0,auVar136);
    auVar141 = vmulps_avx512vl(auVar139,auVar139);
    auVar141 = vfmadd231ps_avx512vl(auVar141,auVar138,auVar138);
    auVar141 = vfmadd231ps_avx512vl(auVar141,auVar136,auVar136);
    auVar142 = vmulps_avx512vl(local_820,auVar135);
    auVar142 = vfmadd231ps_avx512vl(auVar142,auVar134,local_800);
    auVar143 = vfmadd231ps_avx512vl(auVar142,auVar133,local_7e0);
    auVar135 = vmulps_avx512vl(auVar139,auVar135);
    auVar134 = vfmadd231ps_avx512vl(auVar135,auVar138,auVar134);
    auVar133 = vfmadd231ps_avx512vl(auVar134,auVar136,auVar133);
    auVar134 = vmulps_avx512vl(auVar143,auVar143);
    auVar135 = vsubps_avx512vl(local_560,auVar134);
    auVar142 = vmulps_avx512vl(auVar143,auVar133);
    auVar140 = vsubps_avx512vl(auVar140,auVar142);
    auVar140 = vaddps_avx512vl(auVar140,auVar140);
    auVar142 = vmulps_avx512vl(auVar133,auVar133);
    local_a20 = vsubps_avx512vl(auVar141,auVar142);
    auVar121 = vsubps_avx512vl(local_a20,auVar121);
    auVar141 = vmulps_avx512vl(auVar140,auVar140);
    auVar142._8_4_ = 0x40800000;
    auVar142._0_8_ = 0x4080000040800000;
    auVar142._12_4_ = 0x40800000;
    auVar142._16_4_ = 0x40800000;
    auVar142._20_4_ = 0x40800000;
    auVar142._24_4_ = 0x40800000;
    auVar142._28_4_ = 0x40800000;
    _local_aa0 = vmulps_avx512vl(auVar135,auVar142);
    auVar142 = vmulps_avx512vl(_local_aa0,auVar121);
    auVar142 = vsubps_avx512vl(auVar141,auVar142);
    uVar90 = vcmpps_avx512vl(auVar142,auVar144,5);
    bVar82 = (byte)uVar90;
    fVar263 = (float)local_9e0._0_4_;
    fVar268 = (float)local_9e0._4_4_;
    fVar269 = fStack_9d8;
    fVar270 = fStack_9d4;
    fVar243 = fStack_9d0;
    fVar244 = fStack_9cc;
    fVar245 = fStack_9c8;
    fVar229 = fStack_9c4;
    if (bVar82 == 0) {
      auVar183 = ZEXT3264(auVar137);
LAB_01d76fa8:
      auVar280 = ZEXT3264(local_ae0);
      auVar281 = ZEXT3264(local_b00);
      auVar282 = ZEXT3264(local_b20);
      auVar283 = ZEXT3264(local_b40);
    }
    else {
      local_7c0._0_32_ = auVar141;
      auVar142 = vsqrtps_avx512vl(auVar142);
      auVar144 = vaddps_avx512vl(auVar135,auVar135);
      local_840 = vrcp14ps_avx512vl(auVar144);
      auVar137 = vfnmadd213ps_avx512vl(local_840,auVar144,auVar137);
      auVar137 = vfmadd132ps_avx512vl(auVar137,local_840,local_840);
      local_ac0 = vxorps_avx512vl(auVar140,auVar109);
      auVar109 = vsubps_avx512vl(local_ac0,auVar142);
      auVar109 = vmulps_avx512vl(auVar109,auVar137);
      auVar142 = vsubps_avx512vl(auVar142,auVar140);
      _local_860 = vmulps_avx512vl(auVar142,auVar137);
      auVar137 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar142 = vblendmps_avx512vl(auVar137,auVar109);
      auVar145._0_4_ =
           (uint)(bVar82 & 1) * auVar142._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar137._0_4_;
      bVar6 = (bool)((byte)(uVar90 >> 1) & 1);
      auVar145._4_4_ = (uint)bVar6 * auVar142._4_4_ | (uint)!bVar6 * auVar137._4_4_;
      bVar6 = (bool)((byte)(uVar90 >> 2) & 1);
      auVar145._8_4_ = (uint)bVar6 * auVar142._8_4_ | (uint)!bVar6 * auVar137._8_4_;
      bVar6 = (bool)((byte)(uVar90 >> 3) & 1);
      auVar145._12_4_ = (uint)bVar6 * auVar142._12_4_ | (uint)!bVar6 * auVar137._12_4_;
      bVar6 = (bool)((byte)(uVar90 >> 4) & 1);
      auVar145._16_4_ = (uint)bVar6 * auVar142._16_4_ | (uint)!bVar6 * auVar137._16_4_;
      bVar6 = (bool)((byte)(uVar90 >> 5) & 1);
      auVar145._20_4_ = (uint)bVar6 * auVar142._20_4_ | (uint)!bVar6 * auVar137._20_4_;
      bVar6 = (bool)((byte)(uVar90 >> 6) & 1);
      auVar145._24_4_ = (uint)bVar6 * auVar142._24_4_ | (uint)!bVar6 * auVar137._24_4_;
      bVar6 = SUB81(uVar90 >> 7,0);
      auVar145._28_4_ = (uint)bVar6 * auVar142._28_4_ | (uint)!bVar6 * auVar137._28_4_;
      auVar137 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar142 = vblendmps_avx512vl(auVar137,_local_860);
      auVar146._0_4_ =
           (uint)(bVar82 & 1) * auVar142._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar137._0_4_;
      bVar6 = (bool)((byte)(uVar90 >> 1) & 1);
      auVar146._4_4_ = (uint)bVar6 * auVar142._4_4_ | (uint)!bVar6 * auVar137._4_4_;
      bVar6 = (bool)((byte)(uVar90 >> 2) & 1);
      auVar146._8_4_ = (uint)bVar6 * auVar142._8_4_ | (uint)!bVar6 * auVar137._8_4_;
      bVar6 = (bool)((byte)(uVar90 >> 3) & 1);
      auVar146._12_4_ = (uint)bVar6 * auVar142._12_4_ | (uint)!bVar6 * auVar137._12_4_;
      bVar6 = (bool)((byte)(uVar90 >> 4) & 1);
      auVar146._16_4_ = (uint)bVar6 * auVar142._16_4_ | (uint)!bVar6 * auVar137._16_4_;
      bVar6 = (bool)((byte)(uVar90 >> 5) & 1);
      auVar146._20_4_ = (uint)bVar6 * auVar142._20_4_ | (uint)!bVar6 * auVar137._20_4_;
      bVar6 = (bool)((byte)(uVar90 >> 6) & 1);
      auVar146._24_4_ = (uint)bVar6 * auVar142._24_4_ | (uint)!bVar6 * auVar137._24_4_;
      bVar6 = SUB81(uVar90 >> 7,0);
      auVar146._28_4_ = (uint)bVar6 * auVar142._28_4_ | (uint)!bVar6 * auVar137._28_4_;
      auVar137 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar134,auVar137);
      local_880 = vmaxps_avx512vl(local_580,auVar137);
      auVar32._8_4_ = 0x36000000;
      auVar32._0_8_ = 0x3600000036000000;
      auVar32._12_4_ = 0x36000000;
      auVar32._16_4_ = 0x36000000;
      auVar32._20_4_ = 0x36000000;
      auVar32._24_4_ = 0x36000000;
      auVar32._28_4_ = 0x36000000;
      local_8a0 = vmulps_avx512vl(local_880,auVar32);
      vandps_avx512vl(auVar135,auVar137);
      uVar85 = vcmpps_avx512vl(local_8a0,local_8a0,1);
      uVar90 = uVar90 & uVar85;
      bVar86 = (byte)uVar90;
      if (bVar86 != 0) {
        uVar85 = vcmpps_avx512vl(auVar121,_DAT_01faff00,2);
        auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar134 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar135 = vblendmps_avx512vl(auVar121,auVar134);
        bVar87 = (byte)uVar85;
        uVar95 = (uint)(bVar87 & 1) * auVar135._0_4_ | (uint)!(bool)(bVar87 & 1) * local_8a0._0_4_;
        bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
        uVar94 = (uint)bVar6 * auVar135._4_4_ | (uint)!bVar6 * local_8a0._4_4_;
        bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
        uVar161 = (uint)bVar6 * auVar135._8_4_ | (uint)!bVar6 * local_8a0._8_4_;
        bVar6 = (bool)((byte)(uVar85 >> 3) & 1);
        uVar162 = (uint)bVar6 * auVar135._12_4_ | (uint)!bVar6 * local_8a0._12_4_;
        bVar6 = (bool)((byte)(uVar85 >> 4) & 1);
        uVar163 = (uint)bVar6 * auVar135._16_4_ | (uint)!bVar6 * local_8a0._16_4_;
        bVar6 = (bool)((byte)(uVar85 >> 5) & 1);
        uVar164 = (uint)bVar6 * auVar135._20_4_ | (uint)!bVar6 * local_8a0._20_4_;
        bVar6 = (bool)((byte)(uVar85 >> 6) & 1);
        uVar165 = (uint)bVar6 * auVar135._24_4_ | (uint)!bVar6 * local_8a0._24_4_;
        bVar6 = SUB81(uVar85 >> 7,0);
        uVar166 = (uint)bVar6 * auVar135._28_4_ | (uint)!bVar6 * local_8a0._28_4_;
        auVar145._0_4_ = (bVar86 & 1) * uVar95 | !(bool)(bVar86 & 1) * auVar145._0_4_;
        bVar6 = (bool)((byte)(uVar90 >> 1) & 1);
        auVar145._4_4_ = bVar6 * uVar94 | !bVar6 * auVar145._4_4_;
        bVar6 = (bool)((byte)(uVar90 >> 2) & 1);
        auVar145._8_4_ = bVar6 * uVar161 | !bVar6 * auVar145._8_4_;
        bVar6 = (bool)((byte)(uVar90 >> 3) & 1);
        auVar145._12_4_ = bVar6 * uVar162 | !bVar6 * auVar145._12_4_;
        bVar6 = (bool)((byte)(uVar90 >> 4) & 1);
        auVar145._16_4_ = bVar6 * uVar163 | !bVar6 * auVar145._16_4_;
        bVar6 = (bool)((byte)(uVar90 >> 5) & 1);
        auVar145._20_4_ = bVar6 * uVar164 | !bVar6 * auVar145._20_4_;
        bVar6 = (bool)((byte)(uVar90 >> 6) & 1);
        auVar145._24_4_ = bVar6 * uVar165 | !bVar6 * auVar145._24_4_;
        bVar6 = SUB81(uVar90 >> 7,0);
        auVar145._28_4_ = bVar6 * uVar166 | !bVar6 * auVar145._28_4_;
        auVar121 = vblendmps_avx512vl(auVar134,auVar121);
        bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar85 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar85 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar85 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar85 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar85 >> 6) & 1);
        bVar13 = SUB81(uVar85 >> 7,0);
        auVar146._0_4_ =
             (uint)(bVar86 & 1) *
             ((uint)(bVar87 & 1) * auVar121._0_4_ | !(bool)(bVar87 & 1) * uVar95) |
             !(bool)(bVar86 & 1) * auVar146._0_4_;
        bVar7 = (bool)((byte)(uVar90 >> 1) & 1);
        auVar146._4_4_ =
             (uint)bVar7 * ((uint)bVar6 * auVar121._4_4_ | !bVar6 * uVar94) |
             !bVar7 * auVar146._4_4_;
        bVar6 = (bool)((byte)(uVar90 >> 2) & 1);
        auVar146._8_4_ =
             (uint)bVar6 * ((uint)bVar8 * auVar121._8_4_ | !bVar8 * uVar161) |
             !bVar6 * auVar146._8_4_;
        bVar6 = (bool)((byte)(uVar90 >> 3) & 1);
        auVar146._12_4_ =
             (uint)bVar6 * ((uint)bVar9 * auVar121._12_4_ | !bVar9 * uVar162) |
             !bVar6 * auVar146._12_4_;
        bVar6 = (bool)((byte)(uVar90 >> 4) & 1);
        auVar146._16_4_ =
             (uint)bVar6 * ((uint)bVar10 * auVar121._16_4_ | !bVar10 * uVar163) |
             !bVar6 * auVar146._16_4_;
        bVar6 = (bool)((byte)(uVar90 >> 5) & 1);
        auVar146._20_4_ =
             (uint)bVar6 * ((uint)bVar11 * auVar121._20_4_ | !bVar11 * uVar164) |
             !bVar6 * auVar146._20_4_;
        bVar6 = (bool)((byte)(uVar90 >> 6) & 1);
        auVar146._24_4_ =
             (uint)bVar6 * ((uint)bVar12 * auVar121._24_4_ | !bVar12 * uVar165) |
             !bVar6 * auVar146._24_4_;
        bVar6 = SUB81(uVar90 >> 7,0);
        auVar146._28_4_ =
             (uint)bVar6 * ((uint)bVar13 * auVar121._28_4_ | !bVar13 * uVar166) |
             !bVar6 * auVar146._28_4_;
        bVar82 = (~bVar86 | bVar87) & bVar82;
      }
      if ((bVar82 & 0x7f) == 0) {
        auVar120 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar183 = ZEXT3264(auVar120);
        goto LAB_01d76fa8;
      }
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar132 = vxorps_avx512vl(auVar132,auVar121);
      auVar130 = vxorps_avx512vl(auVar130,auVar121);
      uVar95 = *(uint *)(ray + k * 4 + 0x200);
      auVar131 = vxorps_avx512vl(auVar131,auVar121);
      local_a40 = ZEXT416(uVar95);
      auVar98 = vsubss_avx512f(local_a40,ZEXT416((uint)local_930._0_4_));
      auVar134 = vbroadcastss_avx512vl(auVar98);
      auVar134 = vminps_avx512vl(auVar134,auVar146);
      auVar80._4_4_ = fStack_61c;
      auVar80._0_4_ = local_620;
      auVar80._8_4_ = fStack_618;
      auVar80._12_4_ = fStack_614;
      auVar80._16_4_ = fStack_610;
      auVar80._20_4_ = fStack_60c;
      auVar80._24_4_ = fStack_608;
      auVar80._28_4_ = fStack_604;
      auVar135 = vmaxps_avx512vl(auVar80,auVar145);
      auVar137 = vmulps_avx512vl(auVar49,auVar139);
      auVar137 = vfmadd213ps_avx512vl(auVar138,auVar48,auVar137);
      auVar98 = vfmadd213ps_fma(auVar136,auVar47,auVar137);
      auVar136 = vmulps_avx512vl(local_820,auVar49);
      auVar136 = vfmadd231ps_avx512vl(auVar136,local_800,auVar48);
      auVar103 = vfmadd231ps_fma(auVar136,local_7e0,auVar47);
      auVar136 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(ZEXT1632(auVar103),auVar136);
      auVar137 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar22 = vcmpps_avx512vl(auVar136,auVar137,1);
      auVar138 = vxorps_avx512vl(ZEXT1632(auVar98),auVar121);
      auVar139 = vrcp14ps_avx512vl(ZEXT1632(auVar103));
      auVar242 = ZEXT1632(auVar103);
      auVar142 = vxorps_avx512vl(auVar242,auVar121);
      auVar147 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar148 = vfnmadd213ps_avx512vl(auVar139,auVar242,auVar147);
      auVar98 = vfmadd132ps_fma(auVar148,auVar139,auVar139);
      fVar246 = auVar98._0_4_ * auVar138._0_4_;
      fVar251 = auVar98._4_4_ * auVar138._4_4_;
      auVar52._4_4_ = fVar251;
      auVar52._0_4_ = fVar246;
      fVar252 = auVar98._8_4_ * auVar138._8_4_;
      auVar52._8_4_ = fVar252;
      fVar253 = auVar98._12_4_ * auVar138._12_4_;
      auVar52._12_4_ = fVar253;
      fVar169 = auVar138._16_4_ * 0.0;
      auVar52._16_4_ = fVar169;
      fVar184 = auVar138._20_4_ * 0.0;
      auVar52._20_4_ = fVar184;
      fVar185 = auVar138._24_4_ * 0.0;
      auVar52._24_4_ = fVar185;
      auVar52._28_4_ = auVar138._28_4_;
      uVar23 = vcmpps_avx512vl(auVar242,auVar142,1);
      bVar86 = (byte)uVar22 | (byte)uVar23;
      auVar278._8_4_ = 0xff800000;
      auVar278._0_8_ = 0xff800000ff800000;
      auVar278._12_4_ = 0xff800000;
      auVar278._16_4_ = 0xff800000;
      auVar278._20_4_ = 0xff800000;
      auVar278._24_4_ = 0xff800000;
      auVar278._28_4_ = 0xff800000;
      auVar139 = vblendmps_avx512vl(auVar52,auVar278);
      auVar149._0_4_ = (uint)(bVar86 & 1) * auVar139._0_4_ | (uint)!(bool)(bVar86 & 1) * -0x800000;
      bVar6 = (bool)(bVar86 >> 1 & 1);
      auVar149._4_4_ = (uint)bVar6 * auVar139._4_4_ | (uint)!bVar6 * -0x800000;
      bVar6 = (bool)(bVar86 >> 2 & 1);
      auVar149._8_4_ = (uint)bVar6 * auVar139._8_4_ | (uint)!bVar6 * -0x800000;
      bVar6 = (bool)(bVar86 >> 3 & 1);
      auVar149._12_4_ = (uint)bVar6 * auVar139._12_4_ | (uint)!bVar6 * -0x800000;
      bVar6 = (bool)(bVar86 >> 4 & 1);
      auVar149._16_4_ = (uint)bVar6 * auVar139._16_4_ | (uint)!bVar6 * -0x800000;
      bVar6 = (bool)(bVar86 >> 5 & 1);
      auVar149._20_4_ = (uint)bVar6 * auVar139._20_4_ | (uint)!bVar6 * -0x800000;
      bVar6 = (bool)(bVar86 >> 6 & 1);
      auVar149._24_4_ = (uint)bVar6 * auVar139._24_4_ | (uint)!bVar6 * -0x800000;
      auVar149._28_4_ =
           (uint)(bVar86 >> 7) * auVar139._28_4_ | (uint)!(bool)(bVar86 >> 7) * -0x800000;
      auVar139 = vmaxps_avx512vl(auVar135,auVar149);
      auVar279 = ZEXT3264(auVar139);
      uVar23 = vcmpps_avx512vl(auVar242,auVar142,6);
      bVar86 = (byte)uVar22 | (byte)uVar23;
      auVar150._0_4_ = (uint)(bVar86 & 1) * 0x7f800000 | (uint)!(bool)(bVar86 & 1) * (int)fVar246;
      bVar6 = (bool)(bVar86 >> 1 & 1);
      auVar150._4_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar251;
      bVar6 = (bool)(bVar86 >> 2 & 1);
      auVar150._8_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar252;
      bVar6 = (bool)(bVar86 >> 3 & 1);
      auVar150._12_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar253;
      bVar6 = (bool)(bVar86 >> 4 & 1);
      auVar150._16_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar169;
      bVar6 = (bool)(bVar86 >> 5 & 1);
      auVar150._20_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar184;
      bVar6 = (bool)(bVar86 >> 6 & 1);
      auVar150._24_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar185;
      auVar150._28_4_ =
           (uint)(bVar86 >> 7) * 0x7f800000 | (uint)!(bool)(bVar86 >> 7) * auVar138._28_4_;
      auVar134 = vminps_avx512vl(auVar134,auVar150);
      auVar98 = vxorps_avx512vl(auVar135._0_16_,auVar135._0_16_);
      auVar126 = vsubps_avx512vl(ZEXT1632(auVar98),auVar126);
      auVar127 = vsubps_avx512vl(ZEXT1632(auVar98),auVar127);
      auVar135 = ZEXT1632(auVar98);
      auVar128 = vsubps_avx512vl(auVar135,auVar128);
      auVar128 = vmulps_avx512vl(auVar128,auVar132);
      auVar127 = vfmadd231ps_avx512vl(auVar128,auVar131,auVar127);
      auVar126 = vfmadd231ps_avx512vl(auVar127,auVar130,auVar126);
      auVar127 = vmulps_avx512vl(local_820,auVar132);
      auVar127 = vfmadd231ps_avx512vl(auVar127,local_800,auVar131);
      auVar127 = vfmadd231ps_avx512vl(auVar127,local_7e0,auVar130);
      vandps_avx512vl(auVar127,auVar136);
      uVar22 = vcmpps_avx512vl(auVar127,auVar137,1);
      auVar126 = vxorps_avx512vl(auVar126,auVar121);
      auVar128 = vrcp14ps_avx512vl(auVar127);
      auVar121 = vxorps_avx512vl(auVar127,auVar121);
      auVar275 = ZEXT3264(auVar121);
      auVar130 = vfnmadd213ps_avx512vl(auVar128,auVar127,auVar147);
      auVar98 = vfmadd132ps_fma(auVar130,auVar128,auVar128);
      fVar246 = auVar98._0_4_ * auVar126._0_4_;
      fVar251 = auVar98._4_4_ * auVar126._4_4_;
      auVar53._4_4_ = fVar251;
      auVar53._0_4_ = fVar246;
      fVar252 = auVar98._8_4_ * auVar126._8_4_;
      auVar53._8_4_ = fVar252;
      fVar253 = auVar98._12_4_ * auVar126._12_4_;
      auVar53._12_4_ = fVar253;
      fVar169 = auVar126._16_4_ * 0.0;
      auVar53._16_4_ = fVar169;
      fVar184 = auVar126._20_4_ * 0.0;
      auVar53._20_4_ = fVar184;
      fVar185 = auVar126._24_4_ * 0.0;
      auVar53._24_4_ = fVar185;
      auVar53._28_4_ = auVar126._28_4_;
      uVar23 = vcmpps_avx512vl(auVar127,auVar121,1);
      bVar86 = (byte)uVar22 | (byte)uVar23;
      auVar33._8_4_ = 0xff800000;
      auVar33._0_8_ = 0xff800000ff800000;
      auVar33._12_4_ = 0xff800000;
      auVar33._16_4_ = 0xff800000;
      auVar33._20_4_ = 0xff800000;
      auVar33._24_4_ = 0xff800000;
      auVar33._28_4_ = 0xff800000;
      auVar130 = vblendmps_avx512vl(auVar53,auVar33);
      auVar151._0_4_ =
           (uint)(bVar86 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar128._0_4_;
      bVar6 = (bool)(bVar86 >> 1 & 1);
      auVar151._4_4_ = (uint)bVar6 * auVar130._4_4_ | (uint)!bVar6 * auVar128._4_4_;
      bVar6 = (bool)(bVar86 >> 2 & 1);
      auVar151._8_4_ = (uint)bVar6 * auVar130._8_4_ | (uint)!bVar6 * auVar128._8_4_;
      bVar6 = (bool)(bVar86 >> 3 & 1);
      auVar151._12_4_ = (uint)bVar6 * auVar130._12_4_ | (uint)!bVar6 * auVar128._12_4_;
      bVar6 = (bool)(bVar86 >> 4 & 1);
      auVar151._16_4_ = (uint)bVar6 * auVar130._16_4_ | (uint)!bVar6 * auVar128._16_4_;
      bVar6 = (bool)(bVar86 >> 5 & 1);
      auVar151._20_4_ = (uint)bVar6 * auVar130._20_4_ | (uint)!bVar6 * auVar128._20_4_;
      bVar6 = (bool)(bVar86 >> 6 & 1);
      auVar151._24_4_ = (uint)bVar6 * auVar130._24_4_ | (uint)!bVar6 * auVar128._24_4_;
      auVar151._28_4_ =
           (uint)(bVar86 >> 7) * auVar130._28_4_ | (uint)!(bool)(bVar86 >> 7) * auVar128._28_4_;
      auVar273 = ZEXT3264(auVar151);
      _local_8c0 = vmaxps_avx(auVar139,auVar151);
      auVar267 = ZEXT3264(_local_8c0);
      uVar23 = vcmpps_avx512vl(auVar127,auVar121,6);
      bVar86 = (byte)uVar22 | (byte)uVar23;
      auVar152._0_4_ = (uint)(bVar86 & 1) * 0x7f800000 | (uint)!(bool)(bVar86 & 1) * (int)fVar246;
      bVar6 = (bool)(bVar86 >> 1 & 1);
      auVar152._4_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar251;
      bVar6 = (bool)(bVar86 >> 2 & 1);
      auVar152._8_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar252;
      bVar6 = (bool)(bVar86 >> 3 & 1);
      auVar152._12_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar253;
      bVar6 = (bool)(bVar86 >> 4 & 1);
      auVar152._16_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar169;
      bVar6 = (bool)(bVar86 >> 5 & 1);
      auVar152._20_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar184;
      bVar6 = (bool)(bVar86 >> 6 & 1);
      auVar152._24_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar185;
      auVar152._28_4_ =
           (uint)(bVar86 >> 7) * 0x7f800000 | (uint)!(bool)(bVar86 >> 7) * auVar126._28_4_;
      local_6a0 = vminps_avx(auVar134,auVar152);
      auVar272 = ZEXT3264(local_6a0);
      uVar22 = vcmpps_avx512vl(_local_8c0,local_6a0,2);
      bVar82 = bVar82 & 0x7f & (byte)uVar22;
      if (bVar82 == 0) {
        auVar183 = ZEXT3264(auVar147);
        goto LAB_01d76fa8;
      }
      auVar121 = vmaxps_avx512vl(auVar135,auVar120);
      auVar120 = vfmadd213ps_avx512vl(auVar109,auVar143,auVar133);
      auVar120 = vmulps_avx512vl(auVar129,auVar120);
      auVar109 = vfmadd213ps_avx512vl(_local_860,auVar143,auVar133);
      auVar54._4_4_ = auVar129._4_4_ * auVar109._4_4_;
      auVar54._0_4_ = auVar129._0_4_ * auVar109._0_4_;
      auVar54._8_4_ = auVar129._8_4_ * auVar109._8_4_;
      auVar54._12_4_ = auVar129._12_4_ * auVar109._12_4_;
      auVar54._16_4_ = auVar129._16_4_ * auVar109._16_4_;
      auVar54._20_4_ = auVar129._20_4_ * auVar109._20_4_;
      auVar54._24_4_ = auVar129._24_4_ * auVar109._24_4_;
      auVar54._28_4_ = auVar151._28_4_;
      auVar120 = vminps_avx512vl(auVar120,auVar147);
      auVar109 = ZEXT832(0) << 0x20;
      auVar120 = vmaxps_avx(auVar120,ZEXT832(0) << 0x20);
      auVar126 = vminps_avx512vl(auVar54,auVar147);
      auVar55._4_4_ = (auVar120._4_4_ + 1.0) * 0.125;
      auVar55._0_4_ = (auVar120._0_4_ + 0.0) * 0.125;
      auVar55._8_4_ = (auVar120._8_4_ + 2.0) * 0.125;
      auVar55._12_4_ = (auVar120._12_4_ + 3.0) * 0.125;
      auVar55._16_4_ = (auVar120._16_4_ + 4.0) * 0.125;
      auVar55._20_4_ = (auVar120._20_4_ + 5.0) * 0.125;
      auVar55._24_4_ = (auVar120._24_4_ + 6.0) * 0.125;
      auVar55._28_4_ = auVar120._28_4_ + 7.0;
      auVar98 = vfmadd213ps_fma(auVar55,auVar174,local_a80);
      local_4e0 = ZEXT1632(auVar98);
      auVar120 = vmaxps_avx(auVar126,ZEXT832(0) << 0x20);
      auVar56._4_4_ = (auVar120._4_4_ + 1.0) * 0.125;
      auVar56._0_4_ = (auVar120._0_4_ + 0.0) * 0.125;
      auVar56._8_4_ = (auVar120._8_4_ + 2.0) * 0.125;
      auVar56._12_4_ = (auVar120._12_4_ + 3.0) * 0.125;
      auVar56._16_4_ = (auVar120._16_4_ + 4.0) * 0.125;
      auVar56._20_4_ = (auVar120._20_4_ + 5.0) * 0.125;
      auVar56._24_4_ = (auVar120._24_4_ + 6.0) * 0.125;
      auVar56._28_4_ = auVar120._28_4_ + 7.0;
      auVar98 = vfmadd213ps_fma(auVar56,auVar174,local_a80);
      local_500 = ZEXT1632(auVar98);
      auVar57._4_4_ = auVar121._4_4_ * auVar121._4_4_;
      auVar57._0_4_ = auVar121._0_4_ * auVar121._0_4_;
      auVar57._8_4_ = auVar121._8_4_ * auVar121._8_4_;
      auVar57._12_4_ = auVar121._12_4_ * auVar121._12_4_;
      auVar57._16_4_ = auVar121._16_4_ * auVar121._16_4_;
      auVar57._20_4_ = auVar121._20_4_ * auVar121._20_4_;
      auVar57._24_4_ = auVar121._24_4_ * auVar121._24_4_;
      auVar57._28_4_ = auVar121._28_4_;
      auVar120 = vsubps_avx(local_a20,auVar57);
      auVar58._4_4_ = auVar120._4_4_ * (float)local_aa0._4_4_;
      auVar58._0_4_ = auVar120._0_4_ * (float)local_aa0._0_4_;
      auVar58._8_4_ = auVar120._8_4_ * fStack_a98;
      auVar58._12_4_ = auVar120._12_4_ * fStack_a94;
      auVar58._16_4_ = auVar120._16_4_ * fStack_a90;
      auVar58._20_4_ = auVar120._20_4_ * fStack_a8c;
      auVar58._24_4_ = auVar120._24_4_ * fStack_a88;
      auVar58._28_4_ = auVar121._28_4_;
      auVar121 = vsubps_avx(auVar141,auVar58);
      uVar22 = vcmpps_avx512vl(auVar121,ZEXT832(0) << 0x20,5);
      bVar86 = (byte)uVar22;
      auVar282 = ZEXT3264(local_b20);
      auVar283 = ZEXT3264(local_b40);
      if (bVar86 == 0) {
        bVar86 = 0;
        auVar111 = ZEXT832(0) << 0x20;
        auVar183 = ZEXT864(0) << 0x20;
        auVar121 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar126 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar273 = ZEXT864(0) << 0x20;
        auVar153._8_4_ = 0x7f800000;
        auVar153._0_8_ = 0x7f8000007f800000;
        auVar153._12_4_ = 0x7f800000;
        auVar153._16_4_ = 0x7f800000;
        auVar153._20_4_ = 0x7f800000;
        auVar153._24_4_ = 0x7f800000;
        auVar153._28_4_ = 0x7f800000;
        auVar154._8_4_ = 0xff800000;
        auVar154._0_8_ = 0xff800000ff800000;
        auVar154._12_4_ = 0xff800000;
        auVar154._16_4_ = 0xff800000;
        auVar154._20_4_ = 0xff800000;
        auVar154._24_4_ = 0xff800000;
        auVar154._28_4_ = 0xff800000;
      }
      else {
        uVar90 = vcmpps_avx512vl(auVar121,auVar135,5);
        auVar121 = vsqrtps_avx(auVar121);
        auVar109 = vfnmadd213ps_avx512vl(auVar144,local_840,auVar147);
        auVar127 = vfmadd132ps_avx512vl(auVar109,local_840,local_840);
        auVar109 = vsubps_avx(local_ac0,auVar121);
        auVar128 = vmulps_avx512vl(auVar109,auVar127);
        auVar121 = vsubps_avx512vl(auVar121,auVar140);
        auVar127 = vmulps_avx512vl(auVar121,auVar127);
        auVar121 = vfmadd213ps_avx512vl(auVar143,auVar128,auVar133);
        auVar59._4_4_ = auVar129._4_4_ * auVar121._4_4_;
        auVar59._0_4_ = auVar129._0_4_ * auVar121._0_4_;
        auVar59._8_4_ = auVar129._8_4_ * auVar121._8_4_;
        auVar59._12_4_ = auVar129._12_4_ * auVar121._12_4_;
        auVar59._16_4_ = auVar129._16_4_ * auVar121._16_4_;
        auVar59._20_4_ = auVar129._20_4_ * auVar121._20_4_;
        auVar59._24_4_ = auVar129._24_4_ * auVar121._24_4_;
        auVar59._28_4_ = auVar126._28_4_;
        auVar121 = vmulps_avx512vl(local_7e0,auVar128);
        auVar109 = vmulps_avx512vl(local_800,auVar128);
        auVar130 = vmulps_avx512vl(local_820,auVar128);
        auVar126 = vfmadd213ps_avx512vl(auVar111,auVar59,auVar110);
        auVar121 = vsubps_avx512vl(auVar121,auVar126);
        auVar126 = vfmadd213ps_avx512vl(auVar122,auVar59,auVar124);
        auVar126 = vsubps_avx512vl(auVar109,auVar126);
        auVar98 = vfmadd213ps_fma(auVar59,auVar123,auVar125);
        auVar109 = vsubps_avx(auVar130,ZEXT1632(auVar98));
        auVar273 = ZEXT3264(auVar109);
        auVar109 = vfmadd213ps_avx512vl(auVar143,auVar127,auVar133);
        auVar129 = vmulps_avx512vl(auVar129,auVar109);
        auVar109 = vmulps_avx512vl(local_7e0,auVar127);
        auVar130 = vmulps_avx512vl(local_800,auVar127);
        auVar131 = vmulps_avx512vl(local_820,auVar127);
        auVar98 = vfmadd213ps_fma(auVar111,auVar129,auVar110);
        auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar98));
        auVar98 = vfmadd213ps_fma(auVar122,auVar129,auVar124);
        auVar111 = vsubps_avx512vl(auVar130,ZEXT1632(auVar98));
        auVar98 = vfmadd213ps_fma(auVar123,auVar129,auVar125);
        auVar122 = vsubps_avx512vl(auVar131,ZEXT1632(auVar98));
        auVar183 = ZEXT3264(auVar122);
        auVar175._8_4_ = 0x7f800000;
        auVar175._0_8_ = 0x7f8000007f800000;
        auVar175._12_4_ = 0x7f800000;
        auVar175._16_4_ = 0x7f800000;
        auVar175._20_4_ = 0x7f800000;
        auVar175._24_4_ = 0x7f800000;
        auVar175._28_4_ = 0x7f800000;
        auVar122 = vblendmps_avx512vl(auVar175,auVar128);
        bVar6 = (bool)((byte)uVar90 & 1);
        auVar153._0_4_ = (uint)bVar6 * auVar122._0_4_ | (uint)!bVar6 * auVar110._0_4_;
        bVar6 = (bool)((byte)(uVar90 >> 1) & 1);
        auVar153._4_4_ = (uint)bVar6 * auVar122._4_4_ | (uint)!bVar6 * auVar110._4_4_;
        bVar6 = (bool)((byte)(uVar90 >> 2) & 1);
        auVar153._8_4_ = (uint)bVar6 * auVar122._8_4_ | (uint)!bVar6 * auVar110._8_4_;
        bVar6 = (bool)((byte)(uVar90 >> 3) & 1);
        auVar153._12_4_ = (uint)bVar6 * auVar122._12_4_ | (uint)!bVar6 * auVar110._12_4_;
        bVar6 = (bool)((byte)(uVar90 >> 4) & 1);
        auVar153._16_4_ = (uint)bVar6 * auVar122._16_4_ | (uint)!bVar6 * auVar110._16_4_;
        bVar6 = (bool)((byte)(uVar90 >> 5) & 1);
        auVar153._20_4_ = (uint)bVar6 * auVar122._20_4_ | (uint)!bVar6 * auVar110._20_4_;
        bVar6 = (bool)((byte)(uVar90 >> 6) & 1);
        auVar153._24_4_ = (uint)bVar6 * auVar122._24_4_ | (uint)!bVar6 * auVar110._24_4_;
        bVar6 = SUB81(uVar90 >> 7,0);
        auVar153._28_4_ = (uint)bVar6 * auVar122._28_4_ | (uint)!bVar6 * auVar110._28_4_;
        auVar176._8_4_ = 0xff800000;
        auVar176._0_8_ = 0xff800000ff800000;
        auVar176._12_4_ = 0xff800000;
        auVar176._16_4_ = 0xff800000;
        auVar176._20_4_ = 0xff800000;
        auVar176._24_4_ = 0xff800000;
        auVar176._28_4_ = 0xff800000;
        auVar122 = vblendmps_avx512vl(auVar176,auVar127);
        bVar6 = (bool)((byte)uVar90 & 1);
        auVar154._0_4_ = (uint)bVar6 * auVar122._0_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar90 >> 1) & 1);
        auVar154._4_4_ = (uint)bVar6 * auVar122._4_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar90 >> 2) & 1);
        auVar154._8_4_ = (uint)bVar6 * auVar122._8_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar90 >> 3) & 1);
        auVar154._12_4_ = (uint)bVar6 * auVar122._12_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar90 >> 4) & 1);
        auVar154._16_4_ = (uint)bVar6 * auVar122._16_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar90 >> 5) & 1);
        auVar154._20_4_ = (uint)bVar6 * auVar122._20_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = (bool)((byte)(uVar90 >> 6) & 1);
        auVar154._24_4_ = (uint)bVar6 * auVar122._24_4_ | (uint)!bVar6 * -0x800000;
        bVar6 = SUB81(uVar90 >> 7,0);
        auVar154._28_4_ = (uint)bVar6 * auVar122._28_4_ | (uint)!bVar6 * -0x800000;
        auVar34._8_4_ = 0x36000000;
        auVar34._0_8_ = 0x3600000036000000;
        auVar34._12_4_ = 0x36000000;
        auVar34._16_4_ = 0x36000000;
        auVar34._20_4_ = 0x36000000;
        auVar34._24_4_ = 0x36000000;
        auVar34._28_4_ = 0x36000000;
        auVar122 = vmulps_avx512vl(local_880,auVar34);
        uVar85 = vcmpps_avx512vl(auVar122,local_8a0,0xe);
        uVar90 = uVar90 & uVar85;
        bVar87 = (byte)uVar90;
        if (bVar87 != 0) {
          uVar85 = vcmpps_avx512vl(auVar120,ZEXT1632(ZEXT816(0) << 0x40),2);
          auVar261._8_4_ = 0x7f800000;
          auVar261._0_8_ = 0x7f8000007f800000;
          auVar261._12_4_ = 0x7f800000;
          auVar261._16_4_ = 0x7f800000;
          auVar261._20_4_ = 0x7f800000;
          auVar261._24_4_ = 0x7f800000;
          auVar261._28_4_ = 0x7f800000;
          auVar266._8_4_ = 0xff800000;
          auVar266._0_8_ = 0xff800000ff800000;
          auVar266._12_4_ = 0xff800000;
          auVar266._16_4_ = 0xff800000;
          auVar266._20_4_ = 0xff800000;
          auVar266._24_4_ = 0xff800000;
          auVar266._28_4_ = 0xff800000;
          auVar120 = vblendmps_avx512vl(auVar261,auVar266);
          bVar93 = (byte)uVar85;
          uVar94 = (uint)(bVar93 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar93 & 1) * auVar122._0_4_;
          bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
          uVar161 = (uint)bVar6 * auVar120._4_4_ | (uint)!bVar6 * auVar122._4_4_;
          bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
          uVar162 = (uint)bVar6 * auVar120._8_4_ | (uint)!bVar6 * auVar122._8_4_;
          bVar6 = (bool)((byte)(uVar85 >> 3) & 1);
          uVar163 = (uint)bVar6 * auVar120._12_4_ | (uint)!bVar6 * auVar122._12_4_;
          bVar6 = (bool)((byte)(uVar85 >> 4) & 1);
          uVar164 = (uint)bVar6 * auVar120._16_4_ | (uint)!bVar6 * auVar122._16_4_;
          bVar6 = (bool)((byte)(uVar85 >> 5) & 1);
          uVar165 = (uint)bVar6 * auVar120._20_4_ | (uint)!bVar6 * auVar122._20_4_;
          bVar6 = (bool)((byte)(uVar85 >> 6) & 1);
          uVar166 = (uint)bVar6 * auVar120._24_4_ | (uint)!bVar6 * auVar122._24_4_;
          bVar6 = SUB81(uVar85 >> 7,0);
          uVar167 = (uint)bVar6 * auVar120._28_4_ | (uint)!bVar6 * auVar122._28_4_;
          auVar153._0_4_ = (bVar87 & 1) * uVar94 | !(bool)(bVar87 & 1) * auVar153._0_4_;
          bVar6 = (bool)((byte)(uVar90 >> 1) & 1);
          auVar153._4_4_ = bVar6 * uVar161 | !bVar6 * auVar153._4_4_;
          bVar6 = (bool)((byte)(uVar90 >> 2) & 1);
          auVar153._8_4_ = bVar6 * uVar162 | !bVar6 * auVar153._8_4_;
          bVar6 = (bool)((byte)(uVar90 >> 3) & 1);
          auVar153._12_4_ = bVar6 * uVar163 | !bVar6 * auVar153._12_4_;
          bVar6 = (bool)((byte)(uVar90 >> 4) & 1);
          auVar153._16_4_ = bVar6 * uVar164 | !bVar6 * auVar153._16_4_;
          bVar6 = (bool)((byte)(uVar90 >> 5) & 1);
          auVar153._20_4_ = bVar6 * uVar165 | !bVar6 * auVar153._20_4_;
          bVar6 = (bool)((byte)(uVar90 >> 6) & 1);
          auVar153._24_4_ = bVar6 * uVar166 | !bVar6 * auVar153._24_4_;
          bVar6 = SUB81(uVar90 >> 7,0);
          auVar153._28_4_ = bVar6 * uVar167 | !bVar6 * auVar153._28_4_;
          auVar120 = vblendmps_avx512vl(auVar266,auVar261);
          bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar85 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar85 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar85 >> 4) & 1);
          bVar11 = (bool)((byte)(uVar85 >> 5) & 1);
          bVar12 = (bool)((byte)(uVar85 >> 6) & 1);
          bVar13 = SUB81(uVar85 >> 7,0);
          auVar154._0_4_ =
               (uint)(bVar87 & 1) *
               ((uint)(bVar93 & 1) * auVar120._0_4_ | !(bool)(bVar93 & 1) * uVar94) |
               !(bool)(bVar87 & 1) * auVar154._0_4_;
          bVar7 = (bool)((byte)(uVar90 >> 1) & 1);
          auVar154._4_4_ =
               (uint)bVar7 * ((uint)bVar6 * auVar120._4_4_ | !bVar6 * uVar161) |
               !bVar7 * auVar154._4_4_;
          bVar6 = (bool)((byte)(uVar90 >> 2) & 1);
          auVar154._8_4_ =
               (uint)bVar6 * ((uint)bVar8 * auVar120._8_4_ | !bVar8 * uVar162) |
               !bVar6 * auVar154._8_4_;
          bVar6 = (bool)((byte)(uVar90 >> 3) & 1);
          auVar154._12_4_ =
               (uint)bVar6 * ((uint)bVar9 * auVar120._12_4_ | !bVar9 * uVar163) |
               !bVar6 * auVar154._12_4_;
          bVar6 = (bool)((byte)(uVar90 >> 4) & 1);
          auVar154._16_4_ =
               (uint)bVar6 * ((uint)bVar10 * auVar120._16_4_ | !bVar10 * uVar164) |
               !bVar6 * auVar154._16_4_;
          bVar6 = (bool)((byte)(uVar90 >> 5) & 1);
          auVar154._20_4_ =
               (uint)bVar6 * ((uint)bVar11 * auVar120._20_4_ | !bVar11 * uVar165) |
               !bVar6 * auVar154._20_4_;
          bVar6 = (bool)((byte)(uVar90 >> 6) & 1);
          auVar154._24_4_ =
               (uint)bVar6 * ((uint)bVar12 * auVar120._24_4_ | !bVar12 * uVar166) |
               !bVar6 * auVar154._24_4_;
          bVar6 = SUB81(uVar90 >> 7,0);
          auVar154._28_4_ =
               (uint)bVar6 * ((uint)bVar13 * auVar120._28_4_ | !bVar13 * uVar167) |
               !bVar6 * auVar154._28_4_;
          bVar86 = (~bVar87 | bVar93) & bVar86;
        }
      }
      auVar279 = ZEXT3264(local_820);
      auVar256._0_4_ = local_820._0_4_ * auVar183._0_4_;
      auVar256._4_4_ = local_820._4_4_ * auVar183._4_4_;
      auVar256._8_4_ = local_820._8_4_ * auVar183._8_4_;
      auVar256._12_4_ = local_820._12_4_ * auVar183._12_4_;
      auVar256._16_4_ = local_820._16_4_ * auVar183._16_4_;
      auVar256._20_4_ = local_820._20_4_ * auVar183._20_4_;
      auVar256._28_36_ = auVar183._28_36_;
      auVar256._24_4_ = local_820._24_4_ * auVar183._24_4_;
      auVar267 = ZEXT3264(local_800);
      auVar98 = vfmadd231ps_fma(auVar256._0_32_,local_800,auVar111);
      auVar262 = ZEXT3264(local_7e0);
      auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),local_7e0,auVar109);
      auVar275 = ZEXT3264(_local_8c0);
      _local_540 = _local_8c0;
      local_520 = vminps_avx(local_6a0,auVar153);
      auVar258._8_4_ = 0x7fffffff;
      auVar258._0_8_ = 0x7fffffff7fffffff;
      auVar258._12_4_ = 0x7fffffff;
      auVar258._16_4_ = 0x7fffffff;
      auVar258._20_4_ = 0x7fffffff;
      auVar258._24_4_ = 0x7fffffff;
      auVar258._28_4_ = 0x7fffffff;
      auVar120 = vandps_avx(ZEXT1632(auVar98),auVar258);
      local_6c0 = vmaxps_avx(_local_8c0,auVar154);
      auVar256 = ZEXT3264(local_6c0);
      auVar178._8_4_ = 0x3e99999a;
      auVar178._0_8_ = 0x3e99999a3e99999a;
      auVar178._12_4_ = 0x3e99999a;
      auVar178._16_4_ = 0x3e99999a;
      auVar178._20_4_ = 0x3e99999a;
      auVar178._24_4_ = 0x3e99999a;
      auVar178._28_4_ = 0x3e99999a;
      uVar22 = vcmpps_avx512vl(auVar120,auVar178,1);
      local_740._0_2_ = (short)uVar22;
      uVar22 = vcmpps_avx512vl(_local_8c0,local_520,2);
      bVar87 = (byte)uVar22 & bVar82;
      uVar23 = vcmpps_avx512vl(local_6c0,local_6a0,2);
      auVar280 = ZEXT3264(local_ae0);
      auVar281 = ZEXT3264(local_b00);
      if ((bVar82 & ((byte)uVar23 | (byte)uVar22)) == 0) {
        auVar120 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar183 = ZEXT3264(auVar120);
      }
      else {
        auVar60._4_4_ = local_820._4_4_ * auVar273._4_4_;
        auVar60._0_4_ = local_820._0_4_ * auVar273._0_4_;
        auVar60._8_4_ = local_820._8_4_ * auVar273._8_4_;
        auVar60._12_4_ = local_820._12_4_ * auVar273._12_4_;
        auVar60._16_4_ = local_820._16_4_ * auVar273._16_4_;
        auVar60._20_4_ = local_820._20_4_ * auVar273._20_4_;
        auVar60._24_4_ = local_820._24_4_ * auVar273._24_4_;
        auVar60._28_4_ = 0x3e99999a;
        auVar98 = vfmadd213ps_fma(auVar126,local_800,auVar60);
        auVar98 = vfmadd213ps_fma(auVar121,local_7e0,ZEXT1632(auVar98));
        auVar120 = vandps_avx(ZEXT1632(auVar98),auVar258);
        uVar22 = vcmpps_avx512vl(auVar120,auVar178,1);
        bVar93 = (byte)uVar22 | ~bVar86;
        auVar179._8_4_ = 2;
        auVar179._0_8_ = 0x200000002;
        auVar179._12_4_ = 2;
        auVar179._16_4_ = 2;
        auVar179._20_4_ = 2;
        auVar179._24_4_ = 2;
        auVar179._28_4_ = 2;
        auVar35._8_4_ = 3;
        auVar35._0_8_ = 0x300000003;
        auVar35._12_4_ = 3;
        auVar35._16_4_ = 3;
        auVar35._20_4_ = 3;
        auVar35._24_4_ = 3;
        auVar35._28_4_ = 3;
        auVar120 = vpblendmd_avx512vl(auVar179,auVar35);
        local_660._0_4_ = (uint)(bVar93 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar93 & 1) * 2;
        bVar6 = (bool)(bVar93 >> 1 & 1);
        local_660._4_4_ = (uint)bVar6 * auVar120._4_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar93 >> 2 & 1);
        local_660._8_4_ = (uint)bVar6 * auVar120._8_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar93 >> 3 & 1);
        local_660._12_4_ = (uint)bVar6 * auVar120._12_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar93 >> 4 & 1);
        local_660._16_4_ = (uint)bVar6 * auVar120._16_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar93 >> 5 & 1);
        local_660._20_4_ = (uint)bVar6 * auVar120._20_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar93 >> 6 & 1);
        local_660._24_4_ = (uint)bVar6 * auVar120._24_4_ | (uint)!bVar6 * 2;
        local_660._28_4_ = (uint)(bVar93 >> 7) * auVar120._28_4_ | (uint)!(bool)(bVar93 >> 7) * 2;
        local_6e0 = vpbroadcastd_avx512vl();
        uVar22 = vpcmpd_avx512vl(local_6e0,local_660,5);
        bVar93 = (byte)uVar22 & bVar87;
        if (bVar93 == 0) {
          auVar181._4_4_ = uVar95;
          auVar181._0_4_ = uVar95;
          auVar181._8_4_ = uVar95;
          auVar181._12_4_ = uVar95;
          auVar181._16_4_ = uVar95;
          auVar181._20_4_ = uVar95;
          auVar181._24_4_ = uVar95;
          auVar181._28_4_ = uVar95;
        }
        else {
          local_680 = local_6c0;
          auVar103 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
          auVar98 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
          auVar96 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar108 = vminps_avx(auVar103,auVar96);
          auVar103 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar96 = vmaxps_avx(auVar98,auVar103);
          auVar211._8_4_ = 0x7fffffff;
          auVar211._0_8_ = 0x7fffffff7fffffff;
          auVar211._12_4_ = 0x7fffffff;
          auVar98 = vandps_avx(auVar108,auVar211);
          auVar103 = vandps_avx(auVar96,auVar211);
          auVar98 = vmaxps_avx(auVar98,auVar103);
          auVar103 = vmovshdup_avx(auVar98);
          auVar103 = vmaxss_avx(auVar103,auVar98);
          auVar98 = vshufpd_avx(auVar98,auVar98,1);
          auVar98 = vmaxss_avx(auVar98,auVar103);
          local_a60._0_4_ = auVar98._0_4_ * 1.9073486e-06;
          local_920 = vshufps_avx(auVar96,auVar96,0xff);
          local_720 = (float)local_8c0._0_4_ + (float)local_9e0._0_4_;
          fStack_71c = (float)local_8c0._4_4_ + (float)local_9e0._4_4_;
          fStack_718 = fStack_8b8 + fStack_9d8;
          fStack_714 = fStack_8b4 + fStack_9d4;
          fStack_710 = fStack_8b0 + fStack_9d0;
          fStack_70c = fStack_8ac + fStack_9cc;
          fStack_708 = fStack_8a8 + fStack_9c8;
          fStack_704 = fStack_8a4 + fStack_9c4;
          do {
            auVar180._8_4_ = 0x7f800000;
            auVar180._0_8_ = 0x7f8000007f800000;
            auVar180._12_4_ = 0x7f800000;
            auVar180._16_4_ = 0x7f800000;
            auVar180._20_4_ = 0x7f800000;
            auVar180._24_4_ = 0x7f800000;
            auVar180._28_4_ = 0x7f800000;
            auVar120 = vblendmps_avx512vl(auVar180,_local_8c0);
            auVar156._0_4_ =
                 (uint)(bVar93 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar93 & 1) * 0x7f800000;
            bVar6 = (bool)(bVar93 >> 1 & 1);
            auVar156._4_4_ = (uint)bVar6 * auVar120._4_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar93 >> 2 & 1);
            auVar156._8_4_ = (uint)bVar6 * auVar120._8_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar93 >> 3 & 1);
            auVar156._12_4_ = (uint)bVar6 * auVar120._12_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar93 >> 4 & 1);
            auVar156._16_4_ = (uint)bVar6 * auVar120._16_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar93 >> 5 & 1);
            auVar156._20_4_ = (uint)bVar6 * auVar120._20_4_ | (uint)!bVar6 * 0x7f800000;
            auVar156._24_4_ =
                 (uint)(bVar93 >> 6) * auVar120._24_4_ | (uint)!(bool)(bVar93 >> 6) * 0x7f800000;
            auVar156._28_4_ = 0x7f800000;
            auVar120 = vshufps_avx(auVar156,auVar156,0xb1);
            auVar120 = vminps_avx(auVar156,auVar120);
            auVar121 = vshufpd_avx(auVar120,auVar120,5);
            auVar120 = vminps_avx(auVar120,auVar121);
            auVar121 = vpermpd_avx2(auVar120,0x4e);
            auVar120 = vminps_avx(auVar120,auVar121);
            uVar22 = vcmpps_avx512vl(auVar156,auVar120,0);
            bVar83 = (byte)uVar22 & bVar93;
            bVar84 = bVar93;
            if (bVar83 != 0) {
              bVar84 = bVar83;
            }
            iVar25 = 0;
            for (uVar95 = (uint)bVar84; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x80000000) {
              iVar25 = iVar25 + 1;
            }
            uVar95 = *(uint *)(local_540 + (uint)(iVar25 << 2));
            fVar263 = auVar21._0_4_;
            auVar98 = ZEXT416(*(uint *)(local_4e0 + (uint)(iVar25 << 2)));
            if ((float)local_a00._0_4_ < 0.0) {
              local_a80._0_16_ = ZEXT416(*(uint *)(local_4e0 + (uint)(iVar25 << 2)));
              fVar263 = sqrtf((float)local_a00._0_4_);
              auVar98 = local_a80._0_16_;
            }
            auVar98 = vinsertps_avx(ZEXT416(uVar95),auVar98,0x10);
            auVar272 = ZEXT1664(auVar98);
            lVar92 = 5;
            do {
              uVar190 = auVar272._0_4_;
              auVar170._4_4_ = uVar190;
              auVar170._0_4_ = uVar190;
              auVar170._8_4_ = uVar190;
              auVar170._12_4_ = uVar190;
              auVar98 = vfmadd132ps_fma(auVar170,ZEXT816(0) << 0x40,local_9f0);
              auVar103 = vmovshdup_avx(auVar272._0_16_);
              fVar244 = auVar103._0_4_;
              fVar243 = 1.0 - fVar244;
              fVar270 = fVar243 * fVar243 * fVar243;
              fVar268 = fVar244 * fVar244;
              fVar245 = fVar268 * fVar244;
              auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar270),
                                        ZEXT416((uint)fVar245));
              fVar269 = fVar244 * fVar243;
              local_a80._0_16_ = ZEXT416((uint)fVar243);
              auVar104 = vfmadd231ss_fma(ZEXT416((uint)(fVar269 * fVar244 * 6.0)),
                                         ZEXT416((uint)(fVar269 * fVar243)),
                                         SUB6416(ZEXT464(0x41400000),0));
              auVar108 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar245),
                                         ZEXT416((uint)fVar270));
              auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar269 * fVar243 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar269 * fVar244)));
              fVar270 = fVar270 * 0.16666667;
              fVar243 = (auVar96._0_4_ + auVar104._0_4_) * 0.16666667;
              fVar244 = (auVar108._0_4_ + auVar97._0_4_) * 0.16666667;
              fVar245 = fVar245 * 0.16666667;
              auVar212._0_4_ = fVar245 * (float)local_9c0._0_4_;
              auVar212._4_4_ = fVar245 * (float)local_9c0._4_4_;
              auVar212._8_4_ = fVar245 * fStack_9b8;
              auVar212._12_4_ = fVar245 * fStack_9b4;
              auVar247._4_4_ = fVar244;
              auVar247._0_4_ = fVar244;
              auVar247._8_4_ = fVar244;
              auVar247._12_4_ = fVar244;
              auVar96 = vfmadd132ps_fma(auVar247,auVar212,local_980._0_16_);
              auVar213._4_4_ = fVar243;
              auVar213._0_4_ = fVar243;
              auVar213._8_4_ = fVar243;
              auVar213._12_4_ = fVar243;
              auVar96 = vfmadd132ps_fma(auVar213,auVar96,local_9a0._0_16_);
              auVar192._4_4_ = fVar270;
              auVar192._0_4_ = fVar270;
              auVar192._8_4_ = fVar270;
              auVar192._12_4_ = fVar270;
              auVar96 = vfmadd132ps_fma(auVar192,auVar96,local_960._0_16_);
              local_840._0_16_ = auVar96;
              auVar96 = vsubps_avx(auVar98,auVar96);
              auVar98 = vdpps_avx(auVar96,auVar96,0x7f);
              local_a20._0_16_ = auVar98;
              local_7c0 = auVar272;
              if (auVar98._0_4_ < 0.0) {
                local_aa0._0_4_ = fVar268;
                local_ac0._0_4_ = fVar269;
                auVar183._0_4_ = sqrtf(auVar98._0_4_);
                auVar183._4_60_ = extraout_var;
                auVar98 = auVar183._0_16_;
                fVar269 = (float)local_ac0._0_4_;
              }
              else {
                auVar98 = vsqrtss_avx(auVar98,auVar98);
                local_aa0._0_4_ = fVar268;
              }
              local_860._4_4_ = local_a80._0_4_;
              local_860._0_4_ = local_860._4_4_;
              fStack_858 = (float)local_860._4_4_;
              fStack_854 = (float)local_860._4_4_;
              auVar104 = vfnmsub213ss_fma(auVar103,auVar103,ZEXT416((uint)(fVar269 * 4.0)));
              auVar108 = vfmadd231ss_fma(ZEXT416((uint)(fVar269 * 4.0)),local_a80._0_16_,
                                         local_a80._0_16_);
              fVar268 = (float)local_860._4_4_ * -(float)local_860._4_4_ * 0.5;
              fVar269 = auVar104._0_4_ * 0.5;
              fVar270 = auVar108._0_4_ * 0.5;
              local_aa0._0_4_ = (float)local_aa0._0_4_ * 0.5;
              auVar230._0_4_ = (float)local_aa0._0_4_ * (float)local_9c0._0_4_;
              auVar230._4_4_ = (float)local_aa0._0_4_ * (float)local_9c0._4_4_;
              auVar230._8_4_ = (float)local_aa0._0_4_ * fStack_9b8;
              auVar230._12_4_ = (float)local_aa0._0_4_ * fStack_9b4;
              auVar193._4_4_ = fVar270;
              auVar193._0_4_ = fVar270;
              auVar193._8_4_ = fVar270;
              auVar193._12_4_ = fVar270;
              auVar108 = vfmadd132ps_fma(auVar193,auVar230,local_980._0_16_);
              auVar214._4_4_ = fVar269;
              auVar214._0_4_ = fVar269;
              auVar214._8_4_ = fVar269;
              auVar214._12_4_ = fVar269;
              auVar108 = vfmadd132ps_fma(auVar214,auVar108,local_9a0._0_16_);
              auVar276._4_4_ = fVar268;
              auVar276._0_4_ = fVar268;
              auVar276._8_4_ = fVar268;
              auVar276._12_4_ = fVar268;
              _local_aa0 = vfmadd132ps_fma(auVar276,auVar108,local_960._0_16_);
              local_880._0_16_ = vdpps_avx(_local_aa0,_local_aa0,0x7f);
              auVar61._12_4_ = 0;
              auVar61._0_12_ = ZEXT812(0);
              fVar268 = local_880._0_4_;
              local_a50 = vrsqrt14ss_avx512f(auVar61 << 0x20,ZEXT416((uint)fVar268));
              fVar269 = local_a50._0_4_;
              local_8a0._0_16_ = vrcp14ss_avx512f(auVar61 << 0x20,ZEXT416((uint)fVar268));
              auVar108 = vfnmadd213ss_fma(local_8a0._0_16_,local_880._0_16_,ZEXT416(0x40000000));
              local_a40._0_4_ = auVar108._0_4_;
              local_ac0._0_4_ = auVar98._0_4_;
              if (fVar268 < -fVar268) {
                fVar270 = sqrtf(fVar268);
                auVar98 = ZEXT416((uint)local_ac0._0_4_);
                auVar108 = _local_aa0;
              }
              else {
                auVar108 = vsqrtss_avx(local_880._0_16_,local_880._0_16_);
                fVar270 = auVar108._0_4_;
                auVar108 = _local_aa0;
              }
              fVar243 = local_a50._0_4_;
              fVar268 = fVar269 * 1.5 + fVar268 * -0.5 * fVar243 * fVar243 * fVar243;
              local_a50._0_4_ = auVar108._0_4_ * fVar268;
              local_a50._4_4_ = auVar108._4_4_ * fVar268;
              local_a50._8_4_ = auVar108._8_4_ * fVar268;
              local_a50._12_4_ = auVar108._12_4_ * fVar268;
              auVar104 = vdpps_avx(auVar96,local_a50,0x7f);
              fVar244 = auVar98._0_4_;
              fVar269 = auVar104._0_4_;
              auVar171._0_4_ = fVar269 * fVar269;
              auVar171._4_4_ = auVar104._4_4_ * auVar104._4_4_;
              auVar171._8_4_ = auVar104._8_4_ * auVar104._8_4_;
              auVar171._12_4_ = auVar104._12_4_ * auVar104._12_4_;
              auVar97 = vsubps_avx(local_a20._0_16_,auVar171);
              fVar243 = auVar97._0_4_;
              auVar194._4_12_ = ZEXT812(0) << 0x20;
              auVar194._0_4_ = fVar243;
              auVar99 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar194);
              auVar100 = vmulss_avx512f(auVar99,ZEXT416(0x3fc00000));
              auVar101 = vmulss_avx512f(auVar97,ZEXT416(0xbf000000));
              if (fVar243 < 0.0) {
                local_8e0._0_4_ = fVar270;
                local_900._0_4_ = auVar100._0_4_;
                local_910._4_4_ = fVar268;
                local_910._0_4_ = fVar268;
                fStack_908 = fVar268;
                fStack_904 = fVar268;
                local_8f0 = auVar99;
                fVar243 = sqrtf(fVar243);
                auVar101 = ZEXT416(auVar101._0_4_);
                auVar100 = ZEXT416((uint)local_900._0_4_);
                auVar98 = ZEXT416((uint)local_ac0._0_4_);
                auVar99 = local_8f0;
                auVar108 = _local_aa0;
                fVar268 = (float)local_910._0_4_;
                fVar245 = (float)local_910._4_4_;
                fVar229 = fStack_908;
                fVar246 = fStack_904;
                fVar270 = (float)local_8e0._0_4_;
              }
              else {
                auVar97 = vsqrtss_avx(auVar97,auVar97);
                fVar243 = auVar97._0_4_;
                fVar245 = fVar268;
                fVar229 = fVar268;
                fVar246 = fVar268;
              }
              auVar279 = ZEXT1664(auVar108);
              auVar275 = ZEXT1664(local_a20._0_16_);
              auVar273 = ZEXT1664(auVar96);
              auVar280 = ZEXT3264(local_ae0);
              auVar281 = ZEXT3264(local_b00);
              auVar282 = ZEXT3264(local_b20);
              auVar283 = ZEXT3264(local_b40);
              auVar97 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_,auVar103);
              auVar105 = vfmadd213ss_fma(auVar103,SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_);
              auVar107 = local_7c0._0_16_;
              auVar103 = vshufps_avx(auVar107,auVar107,0x55);
              auVar215._0_4_ = auVar103._0_4_ * (float)local_9c0._0_4_;
              auVar215._4_4_ = auVar103._4_4_ * (float)local_9c0._4_4_;
              auVar215._8_4_ = auVar103._8_4_ * fStack_9b8;
              auVar215._12_4_ = auVar103._12_4_ * fStack_9b4;
              auVar231._0_4_ = auVar105._0_4_;
              auVar231._4_4_ = auVar231._0_4_;
              auVar231._8_4_ = auVar231._0_4_;
              auVar231._12_4_ = auVar231._0_4_;
              auVar103 = vfmadd132ps_fma(auVar231,auVar215,local_980._0_16_);
              auVar195._0_4_ = auVar97._0_4_;
              auVar195._4_4_ = auVar195._0_4_;
              auVar195._8_4_ = auVar195._0_4_;
              auVar195._12_4_ = auVar195._0_4_;
              auVar103 = vfmadd132ps_fma(auVar195,auVar103,local_9a0._0_16_);
              auVar103 = vfmadd132ps_fma(_local_860,auVar103,local_960._0_16_);
              auVar196._0_4_ = auVar103._0_4_ * (float)local_880._0_4_;
              auVar196._4_4_ = auVar103._4_4_ * (float)local_880._0_4_;
              auVar196._8_4_ = auVar103._8_4_ * (float)local_880._0_4_;
              auVar196._12_4_ = auVar103._12_4_ * (float)local_880._0_4_;
              auVar103 = vdpps_avx(auVar108,auVar103,0x7f);
              fVar251 = auVar103._0_4_;
              auVar216._0_4_ = auVar108._0_4_ * fVar251;
              auVar216._4_4_ = auVar108._4_4_ * fVar251;
              auVar216._8_4_ = auVar108._8_4_ * fVar251;
              auVar216._12_4_ = auVar108._12_4_ * fVar251;
              auVar103 = vsubps_avx(auVar196,auVar216);
              fVar251 = (float)local_a40._0_4_ * (float)local_8a0._0_4_;
              auVar105 = vmaxss_avx(ZEXT416((uint)local_a60._0_4_),
                                    ZEXT416((uint)(local_7c0._0_4_ * fVar263 * 1.9073486e-06)));
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar102 = vxorps_avx512vl(auVar108,auVar26);
              auVar197._0_4_ = fVar268 * auVar103._0_4_ * fVar251;
              auVar197._4_4_ = fVar245 * auVar103._4_4_ * fVar251;
              auVar197._8_4_ = fVar229 * auVar103._8_4_ * fVar251;
              auVar197._12_4_ = fVar246 * auVar103._12_4_ * fVar251;
              auVar103 = vdpps_avx(auVar102,local_a50,0x7f);
              auVar97 = vfmadd213ss_fma(auVar98,ZEXT416((uint)local_a60._0_4_),auVar105);
              auVar98 = vdpps_avx(auVar96,auVar197,0x7f);
              auVar106 = vfmadd213ss_fma(ZEXT416((uint)(fVar244 + 1.0)),
                                         ZEXT416((uint)((float)local_a60._0_4_ / fVar270)),auVar97);
              fVar268 = auVar103._0_4_ + auVar98._0_4_;
              auVar98 = vdpps_avx(local_9f0,local_a50,0x7f);
              auVar103 = vdpps_avx(auVar96,auVar102,0x7f);
              auVar97 = vmulss_avx512f(auVar101,auVar99);
              auVar101 = vaddss_avx512f(auVar100,ZEXT416((uint)(auVar97._0_4_ *
                                                               auVar99._0_4_ * auVar99._0_4_)));
              auVar97 = vdpps_avx(auVar96,local_9f0,0x7f);
              auVar100 = vfnmadd231ss_fma(auVar103,auVar104,ZEXT416((uint)fVar268));
              auVar97 = vfnmadd231ss_fma(auVar97,auVar104,auVar98);
              auVar103 = vpermilps_avx(local_840._0_16_,0xff);
              fVar243 = fVar243 - auVar103._0_4_;
              auVar99 = vshufps_avx(auVar108,auVar108,0xff);
              auVar103 = vfmsub213ss_fma(auVar100,auVar101,auVar99);
              auVar264._8_4_ = 0x80000000;
              auVar264._0_8_ = 0x8000000080000000;
              auVar264._12_4_ = 0x80000000;
              auVar267 = ZEXT1664(auVar264);
              auVar259._0_8_ = auVar103._0_8_ ^ 0x8000000080000000;
              auVar259._8_4_ = auVar103._8_4_ ^ 0x80000000;
              auVar259._12_4_ = auVar103._12_4_ ^ 0x80000000;
              auVar262 = ZEXT1664(auVar259);
              auVar97 = ZEXT416((uint)(auVar97._0_4_ * auVar101._0_4_));
              auVar100 = vfmsub231ss_fma(ZEXT416((uint)(auVar98._0_4_ * auVar103._0_4_)),
                                         ZEXT416((uint)fVar268),auVar97);
              auVar103 = vinsertps_avx(auVar259,auVar97,0x1c);
              auVar254._0_8_ = auVar98._0_8_ ^ 0x8000000080000000;
              auVar254._8_4_ = auVar98._8_4_ ^ 0x80000000;
              auVar254._12_4_ = auVar98._12_4_ ^ 0x80000000;
              auVar97 = vinsertps_avx(ZEXT416((uint)fVar268),auVar254,0x10);
              auVar232._0_4_ = auVar100._0_4_;
              auVar232._4_4_ = auVar232._0_4_;
              auVar232._8_4_ = auVar232._0_4_;
              auVar232._12_4_ = auVar232._0_4_;
              auVar98 = vdivps_avx(auVar103,auVar232);
              auVar103 = vdivps_avx(auVar97,auVar232);
              auVar233._0_4_ = fVar269 * auVar98._0_4_ + fVar243 * auVar103._0_4_;
              auVar233._4_4_ = fVar269 * auVar98._4_4_ + fVar243 * auVar103._4_4_;
              auVar233._8_4_ = fVar269 * auVar98._8_4_ + fVar243 * auVar103._8_4_;
              auVar233._12_4_ = fVar269 * auVar98._12_4_ + fVar243 * auVar103._12_4_;
              auVar98 = vsubps_avx(auVar107,auVar233);
              auVar272 = ZEXT1664(auVar98);
              auVar27._8_4_ = 0x7fffffff;
              auVar27._0_8_ = 0x7fffffff7fffffff;
              auVar27._12_4_ = 0x7fffffff;
              auVar103 = vandps_avx512vl(auVar104,auVar27);
              if (auVar103._0_4_ < auVar106._0_4_) {
                auVar103 = vfmadd231ss_fma(ZEXT416((uint)(auVar106._0_4_ + auVar105._0_4_)),
                                           local_920,ZEXT416(0x36000000));
                auVar28._8_4_ = 0x7fffffff;
                auVar28._0_8_ = 0x7fffffff7fffffff;
                auVar28._12_4_ = 0x7fffffff;
                auVar104 = vandps_avx512vl(ZEXT416((uint)fVar243),auVar28);
                if (auVar104._0_4_ < auVar103._0_4_) {
                  fVar263 = auVar98._0_4_ + (float)local_930._0_4_;
                  if ((fVar263 < fVar168) ||
                     (fVar268 = *(float *)(ray + k * 4 + 0x200), fVar268 < fVar263)) break;
                  auVar103 = vmovshdup_avx(auVar98);
                  fVar269 = auVar103._0_4_;
                  if ((fVar269 < 0.0) || (1.0 < fVar269)) break;
                  auVar103 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_a20._0_4_));
                  fVar270 = auVar103._0_4_;
                  pGVar3 = (context->scene->geometries).items[uVar91].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                  fVar270 = fVar270 * 1.5 + local_a20._0_4_ * -0.5 * fVar270 * fVar270 * fVar270;
                  auVar234._0_4_ = auVar96._0_4_ * fVar270;
                  auVar234._4_4_ = auVar96._4_4_ * fVar270;
                  auVar234._8_4_ = auVar96._8_4_ * fVar270;
                  auVar234._12_4_ = auVar96._12_4_ * fVar270;
                  auVar99 = vfmadd213ps_fma(auVar99,auVar234,auVar108);
                  auVar103 = vshufps_avx(auVar234,auVar234,0xc9);
                  auVar104 = vshufps_avx(auVar108,auVar108,0xc9);
                  auVar235._0_4_ = auVar234._0_4_ * auVar104._0_4_;
                  auVar235._4_4_ = auVar234._4_4_ * auVar104._4_4_;
                  auVar235._8_4_ = auVar234._8_4_ * auVar104._8_4_;
                  auVar235._12_4_ = auVar234._12_4_ * auVar104._12_4_;
                  auVar97 = vfmsub231ps_fma(auVar235,auVar108,auVar103);
                  auVar103 = vshufps_avx(auVar97,auVar97,0xc9);
                  auVar104 = vshufps_avx(auVar99,auVar99,0xc9);
                  auVar97 = vshufps_avx(auVar97,auVar97,0xd2);
                  auVar198._0_4_ = auVar99._0_4_ * auVar97._0_4_;
                  auVar198._4_4_ = auVar99._4_4_ * auVar97._4_4_;
                  auVar198._8_4_ = auVar99._8_4_ * auVar97._8_4_;
                  auVar198._12_4_ = auVar99._12_4_ * auVar97._12_4_;
                  auVar103 = vfmsub231ps_fma(auVar198,auVar103,auVar104);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar263;
                    uVar190 = vextractps_avx(auVar103,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar190;
                    uVar190 = vextractps_avx(auVar103,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar190;
                    *(int *)(ray + k * 4 + 0x380) = auVar103._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar269;
                    *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                    *(uint *)(ray + k * 4 + 0x440) = uVar2;
                    *(uint *)(ray + k * 4 + 0x480) = uVar91;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar5 = context->user;
                  auVar183 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar183,auVar272);
                  auVar183 = vpermps_avx512f(auVar183,ZEXT1664(auVar103));
                  auVar256 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar256,ZEXT1664(auVar103));
                  local_380 = vbroadcastss_avx512f(auVar103);
                  local_400[0] = (RTCHitN)auVar183[0];
                  local_400[1] = (RTCHitN)auVar183[1];
                  local_400[2] = (RTCHitN)auVar183[2];
                  local_400[3] = (RTCHitN)auVar183[3];
                  local_400[4] = (RTCHitN)auVar183[4];
                  local_400[5] = (RTCHitN)auVar183[5];
                  local_400[6] = (RTCHitN)auVar183[6];
                  local_400[7] = (RTCHitN)auVar183[7];
                  local_400[8] = (RTCHitN)auVar183[8];
                  local_400[9] = (RTCHitN)auVar183[9];
                  local_400[10] = (RTCHitN)auVar183[10];
                  local_400[0xb] = (RTCHitN)auVar183[0xb];
                  local_400[0xc] = (RTCHitN)auVar183[0xc];
                  local_400[0xd] = (RTCHitN)auVar183[0xd];
                  local_400[0xe] = (RTCHitN)auVar183[0xe];
                  local_400[0xf] = (RTCHitN)auVar183[0xf];
                  local_400[0x10] = (RTCHitN)auVar183[0x10];
                  local_400[0x11] = (RTCHitN)auVar183[0x11];
                  local_400[0x12] = (RTCHitN)auVar183[0x12];
                  local_400[0x13] = (RTCHitN)auVar183[0x13];
                  local_400[0x14] = (RTCHitN)auVar183[0x14];
                  local_400[0x15] = (RTCHitN)auVar183[0x15];
                  local_400[0x16] = (RTCHitN)auVar183[0x16];
                  local_400[0x17] = (RTCHitN)auVar183[0x17];
                  local_400[0x18] = (RTCHitN)auVar183[0x18];
                  local_400[0x19] = (RTCHitN)auVar183[0x19];
                  local_400[0x1a] = (RTCHitN)auVar183[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar183[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar183[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar183[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar183[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar183[0x1f];
                  local_400[0x20] = (RTCHitN)auVar183[0x20];
                  local_400[0x21] = (RTCHitN)auVar183[0x21];
                  local_400[0x22] = (RTCHitN)auVar183[0x22];
                  local_400[0x23] = (RTCHitN)auVar183[0x23];
                  local_400[0x24] = (RTCHitN)auVar183[0x24];
                  local_400[0x25] = (RTCHitN)auVar183[0x25];
                  local_400[0x26] = (RTCHitN)auVar183[0x26];
                  local_400[0x27] = (RTCHitN)auVar183[0x27];
                  local_400[0x28] = (RTCHitN)auVar183[0x28];
                  local_400[0x29] = (RTCHitN)auVar183[0x29];
                  local_400[0x2a] = (RTCHitN)auVar183[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar183[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar183[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar183[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar183[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar183[0x2f];
                  local_400[0x30] = (RTCHitN)auVar183[0x30];
                  local_400[0x31] = (RTCHitN)auVar183[0x31];
                  local_400[0x32] = (RTCHitN)auVar183[0x32];
                  local_400[0x33] = (RTCHitN)auVar183[0x33];
                  local_400[0x34] = (RTCHitN)auVar183[0x34];
                  local_400[0x35] = (RTCHitN)auVar183[0x35];
                  local_400[0x36] = (RTCHitN)auVar183[0x36];
                  local_400[0x37] = (RTCHitN)auVar183[0x37];
                  local_400[0x38] = (RTCHitN)auVar183[0x38];
                  local_400[0x39] = (RTCHitN)auVar183[0x39];
                  local_400[0x3a] = (RTCHitN)auVar183[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar183[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar183[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar183[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar183[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar183[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar183 = vmovdqa64_avx512f(local_440);
                  local_280 = vmovdqa64_avx512f(auVar183);
                  auVar120 = vpcmpeqd_avx2(auVar183._0_32_,auVar183._0_32_);
                  local_a28[3] = auVar120;
                  local_a28[2] = auVar120;
                  local_a28[1] = auVar120;
                  *local_a28 = auVar120;
                  local_240 = vbroadcastss_avx512f(ZEXT416(pRVar5->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(pRVar5->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar263;
                  auVar183 = vmovdqa64_avx512f(local_4c0);
                  local_780 = vmovdqa64_avx512f(auVar183);
                  local_b70.valid = (int *)local_780;
                  local_b70.geometryUserPtr = pGVar3->userPtr;
                  local_b70.context = context->user;
                  local_b70.hit = local_400;
                  local_b70.N = 0x10;
                  local_b70.ray = (RTCRayN *)ray;
                  if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar262 = ZEXT1664(auVar259);
                    auVar267 = ZEXT1664(auVar264);
                    auVar272 = ZEXT1664(auVar98);
                    auVar273 = ZEXT1664(auVar96);
                    auVar275 = ZEXT1664(local_a20._0_16_);
                    auVar279 = ZEXT1664(auVar108);
                    (*pGVar3->intersectionFilterN)(&local_b70);
                    auVar283 = ZEXT3264(local_b40);
                    auVar282 = ZEXT3264(local_b20);
                    auVar281 = ZEXT3264(local_b00);
                    auVar280 = ZEXT3264(local_ae0);
                    auVar183 = vmovdqa64_avx512f(local_780);
                  }
                  uVar22 = vptestmd_avx512f(auVar183,auVar183);
                  if ((short)uVar22 != 0) {
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar262 = ZEXT1664(auVar262._0_16_);
                      auVar267 = ZEXT1664(auVar267._0_16_);
                      auVar272 = ZEXT1664(auVar272._0_16_);
                      auVar273 = ZEXT1664(auVar273._0_16_);
                      auVar275 = ZEXT1664(auVar275._0_16_);
                      auVar279 = ZEXT1664(auVar279._0_16_);
                      (*p_Var4)(&local_b70);
                      auVar283 = ZEXT3264(local_b40);
                      auVar282 = ZEXT3264(local_b20);
                      auVar281 = ZEXT3264(local_b00);
                      auVar280 = ZEXT3264(local_ae0);
                      auVar183 = vmovdqa64_avx512f(local_780);
                    }
                    uVar90 = vptestmd_avx512f(auVar183,auVar183);
                    if ((short)uVar90 != 0) {
                      iVar63 = *(int *)(local_b70.hit + 4);
                      iVar64 = *(int *)(local_b70.hit + 8);
                      iVar65 = *(int *)(local_b70.hit + 0xc);
                      iVar66 = *(int *)(local_b70.hit + 0x10);
                      iVar67 = *(int *)(local_b70.hit + 0x14);
                      iVar68 = *(int *)(local_b70.hit + 0x18);
                      iVar69 = *(int *)(local_b70.hit + 0x1c);
                      iVar70 = *(int *)(local_b70.hit + 0x20);
                      iVar71 = *(int *)(local_b70.hit + 0x24);
                      iVar72 = *(int *)(local_b70.hit + 0x28);
                      iVar73 = *(int *)(local_b70.hit + 0x2c);
                      iVar74 = *(int *)(local_b70.hit + 0x30);
                      iVar75 = *(int *)(local_b70.hit + 0x34);
                      iVar76 = *(int *)(local_b70.hit + 0x38);
                      iVar77 = *(int *)(local_b70.hit + 0x3c);
                      bVar84 = (byte)uVar90;
                      bVar6 = (bool)((byte)(uVar90 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar90 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar90 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar90 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar90 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar90 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar90 >> 7) & 1);
                      bVar83 = (byte)(uVar90 >> 8);
                      bVar13 = (bool)((byte)(uVar90 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar90 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar90 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar90 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar90 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar90 >> 0xe) & 1);
                      bVar19 = SUB81(uVar90 >> 0xf,0);
                      *(uint *)(local_b70.ray + 0x300) =
                           (uint)(bVar84 & 1) * *(int *)local_b70.hit |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b70.ray + 0x300);
                      *(uint *)(local_b70.ray + 0x304) =
                           (uint)bVar6 * iVar63 | (uint)!bVar6 * *(int *)(local_b70.ray + 0x304);
                      *(uint *)(local_b70.ray + 0x308) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_b70.ray + 0x308);
                      *(uint *)(local_b70.ray + 0x30c) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_b70.ray + 0x30c);
                      *(uint *)(local_b70.ray + 0x310) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_b70.ray + 0x310);
                      *(uint *)(local_b70.ray + 0x314) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_b70.ray + 0x314);
                      *(uint *)(local_b70.ray + 0x318) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_b70.ray + 0x318);
                      *(uint *)(local_b70.ray + 0x31c) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_b70.ray + 0x31c);
                      *(uint *)(local_b70.ray + 800) =
                           (uint)(bVar83 & 1) * iVar70 |
                           (uint)!(bool)(bVar83 & 1) * *(int *)(local_b70.ray + 800);
                      *(uint *)(local_b70.ray + 0x324) =
                           (uint)bVar13 * iVar71 | (uint)!bVar13 * *(int *)(local_b70.ray + 0x324);
                      *(uint *)(local_b70.ray + 0x328) =
                           (uint)bVar14 * iVar72 | (uint)!bVar14 * *(int *)(local_b70.ray + 0x328);
                      *(uint *)(local_b70.ray + 0x32c) =
                           (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_b70.ray + 0x32c);
                      *(uint *)(local_b70.ray + 0x330) =
                           (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_b70.ray + 0x330);
                      *(uint *)(local_b70.ray + 0x334) =
                           (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_b70.ray + 0x334);
                      *(uint *)(local_b70.ray + 0x338) =
                           (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_b70.ray + 0x338);
                      *(uint *)(local_b70.ray + 0x33c) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_b70.ray + 0x33c);
                      iVar63 = *(int *)(local_b70.hit + 0x44);
                      iVar64 = *(int *)(local_b70.hit + 0x48);
                      iVar65 = *(int *)(local_b70.hit + 0x4c);
                      iVar66 = *(int *)(local_b70.hit + 0x50);
                      iVar67 = *(int *)(local_b70.hit + 0x54);
                      iVar68 = *(int *)(local_b70.hit + 0x58);
                      iVar69 = *(int *)(local_b70.hit + 0x5c);
                      iVar70 = *(int *)(local_b70.hit + 0x60);
                      iVar71 = *(int *)(local_b70.hit + 100);
                      iVar72 = *(int *)(local_b70.hit + 0x68);
                      iVar73 = *(int *)(local_b70.hit + 0x6c);
                      iVar74 = *(int *)(local_b70.hit + 0x70);
                      iVar75 = *(int *)(local_b70.hit + 0x74);
                      iVar76 = *(int *)(local_b70.hit + 0x78);
                      iVar77 = *(int *)(local_b70.hit + 0x7c);
                      bVar6 = (bool)((byte)(uVar90 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar90 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar90 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar90 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar90 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar90 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar90 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar90 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar90 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar90 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar90 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar90 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar90 >> 0xe) & 1);
                      bVar19 = SUB81(uVar90 >> 0xf,0);
                      *(uint *)(local_b70.ray + 0x340) =
                           (uint)(bVar84 & 1) * *(int *)(local_b70.hit + 0x40) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b70.ray + 0x340);
                      *(uint *)(local_b70.ray + 0x344) =
                           (uint)bVar6 * iVar63 | (uint)!bVar6 * *(int *)(local_b70.ray + 0x344);
                      *(uint *)(local_b70.ray + 0x348) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_b70.ray + 0x348);
                      *(uint *)(local_b70.ray + 0x34c) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_b70.ray + 0x34c);
                      *(uint *)(local_b70.ray + 0x350) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_b70.ray + 0x350);
                      *(uint *)(local_b70.ray + 0x354) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_b70.ray + 0x354);
                      *(uint *)(local_b70.ray + 0x358) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_b70.ray + 0x358);
                      *(uint *)(local_b70.ray + 0x35c) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_b70.ray + 0x35c);
                      *(uint *)(local_b70.ray + 0x360) =
                           (uint)(bVar83 & 1) * iVar70 |
                           (uint)!(bool)(bVar83 & 1) * *(int *)(local_b70.ray + 0x360);
                      *(uint *)(local_b70.ray + 0x364) =
                           (uint)bVar13 * iVar71 | (uint)!bVar13 * *(int *)(local_b70.ray + 0x364);
                      *(uint *)(local_b70.ray + 0x368) =
                           (uint)bVar14 * iVar72 | (uint)!bVar14 * *(int *)(local_b70.ray + 0x368);
                      *(uint *)(local_b70.ray + 0x36c) =
                           (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_b70.ray + 0x36c);
                      *(uint *)(local_b70.ray + 0x370) =
                           (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_b70.ray + 0x370);
                      *(uint *)(local_b70.ray + 0x374) =
                           (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_b70.ray + 0x374);
                      *(uint *)(local_b70.ray + 0x378) =
                           (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_b70.ray + 0x378);
                      *(uint *)(local_b70.ray + 0x37c) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_b70.ray + 0x37c);
                      iVar63 = *(int *)(local_b70.hit + 0x84);
                      iVar64 = *(int *)(local_b70.hit + 0x88);
                      iVar65 = *(int *)(local_b70.hit + 0x8c);
                      iVar66 = *(int *)(local_b70.hit + 0x90);
                      iVar67 = *(int *)(local_b70.hit + 0x94);
                      iVar68 = *(int *)(local_b70.hit + 0x98);
                      iVar69 = *(int *)(local_b70.hit + 0x9c);
                      iVar70 = *(int *)(local_b70.hit + 0xa0);
                      iVar71 = *(int *)(local_b70.hit + 0xa4);
                      iVar72 = *(int *)(local_b70.hit + 0xa8);
                      iVar73 = *(int *)(local_b70.hit + 0xac);
                      iVar74 = *(int *)(local_b70.hit + 0xb0);
                      iVar75 = *(int *)(local_b70.hit + 0xb4);
                      iVar76 = *(int *)(local_b70.hit + 0xb8);
                      iVar77 = *(int *)(local_b70.hit + 0xbc);
                      bVar6 = (bool)((byte)(uVar90 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar90 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar90 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar90 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar90 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar90 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar90 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar90 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar90 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar90 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar90 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar90 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar90 >> 0xe) & 1);
                      bVar19 = SUB81(uVar90 >> 0xf,0);
                      *(uint *)(local_b70.ray + 0x380) =
                           (uint)(bVar84 & 1) * *(int *)(local_b70.hit + 0x80) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b70.ray + 0x380);
                      *(uint *)(local_b70.ray + 900) =
                           (uint)bVar6 * iVar63 | (uint)!bVar6 * *(int *)(local_b70.ray + 900);
                      *(uint *)(local_b70.ray + 0x388) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_b70.ray + 0x388);
                      *(uint *)(local_b70.ray + 0x38c) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_b70.ray + 0x38c);
                      *(uint *)(local_b70.ray + 0x390) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_b70.ray + 0x390);
                      *(uint *)(local_b70.ray + 0x394) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_b70.ray + 0x394);
                      *(uint *)(local_b70.ray + 0x398) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_b70.ray + 0x398);
                      *(uint *)(local_b70.ray + 0x39c) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_b70.ray + 0x39c);
                      *(uint *)(local_b70.ray + 0x3a0) =
                           (uint)(bVar83 & 1) * iVar70 |
                           (uint)!(bool)(bVar83 & 1) * *(int *)(local_b70.ray + 0x3a0);
                      *(uint *)(local_b70.ray + 0x3a4) =
                           (uint)bVar13 * iVar71 | (uint)!bVar13 * *(int *)(local_b70.ray + 0x3a4);
                      *(uint *)(local_b70.ray + 0x3a8) =
                           (uint)bVar14 * iVar72 | (uint)!bVar14 * *(int *)(local_b70.ray + 0x3a8);
                      *(uint *)(local_b70.ray + 0x3ac) =
                           (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_b70.ray + 0x3ac);
                      *(uint *)(local_b70.ray + 0x3b0) =
                           (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_b70.ray + 0x3b0);
                      *(uint *)(local_b70.ray + 0x3b4) =
                           (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_b70.ray + 0x3b4);
                      *(uint *)(local_b70.ray + 0x3b8) =
                           (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_b70.ray + 0x3b8);
                      *(uint *)(local_b70.ray + 0x3bc) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_b70.ray + 0x3bc);
                      iVar63 = *(int *)(local_b70.hit + 0xc4);
                      iVar64 = *(int *)(local_b70.hit + 200);
                      iVar65 = *(int *)(local_b70.hit + 0xcc);
                      iVar66 = *(int *)(local_b70.hit + 0xd0);
                      iVar67 = *(int *)(local_b70.hit + 0xd4);
                      iVar68 = *(int *)(local_b70.hit + 0xd8);
                      iVar69 = *(int *)(local_b70.hit + 0xdc);
                      iVar70 = *(int *)(local_b70.hit + 0xe0);
                      iVar71 = *(int *)(local_b70.hit + 0xe4);
                      iVar72 = *(int *)(local_b70.hit + 0xe8);
                      iVar73 = *(int *)(local_b70.hit + 0xec);
                      iVar74 = *(int *)(local_b70.hit + 0xf0);
                      iVar75 = *(int *)(local_b70.hit + 0xf4);
                      iVar76 = *(int *)(local_b70.hit + 0xf8);
                      iVar77 = *(int *)(local_b70.hit + 0xfc);
                      bVar6 = (bool)((byte)(uVar90 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar90 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar90 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar90 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar90 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar90 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar90 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar90 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar90 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar90 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar90 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar90 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar90 >> 0xe) & 1);
                      bVar19 = SUB81(uVar90 >> 0xf,0);
                      *(uint *)(local_b70.ray + 0x3c0) =
                           (uint)(bVar84 & 1) * *(int *)(local_b70.hit + 0xc0) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b70.ray + 0x3c0);
                      *(uint *)(local_b70.ray + 0x3c4) =
                           (uint)bVar6 * iVar63 | (uint)!bVar6 * *(int *)(local_b70.ray + 0x3c4);
                      *(uint *)(local_b70.ray + 0x3c8) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_b70.ray + 0x3c8);
                      *(uint *)(local_b70.ray + 0x3cc) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_b70.ray + 0x3cc);
                      *(uint *)(local_b70.ray + 0x3d0) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_b70.ray + 0x3d0);
                      *(uint *)(local_b70.ray + 0x3d4) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_b70.ray + 0x3d4);
                      *(uint *)(local_b70.ray + 0x3d8) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_b70.ray + 0x3d8);
                      *(uint *)(local_b70.ray + 0x3dc) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_b70.ray + 0x3dc);
                      *(uint *)(local_b70.ray + 0x3e0) =
                           (uint)(bVar83 & 1) * iVar70 |
                           (uint)!(bool)(bVar83 & 1) * *(int *)(local_b70.ray + 0x3e0);
                      *(uint *)(local_b70.ray + 0x3e4) =
                           (uint)bVar13 * iVar71 | (uint)!bVar13 * *(int *)(local_b70.ray + 0x3e4);
                      *(uint *)(local_b70.ray + 1000) =
                           (uint)bVar14 * iVar72 | (uint)!bVar14 * *(int *)(local_b70.ray + 1000);
                      *(uint *)(local_b70.ray + 0x3ec) =
                           (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_b70.ray + 0x3ec);
                      *(uint *)(local_b70.ray + 0x3f0) =
                           (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_b70.ray + 0x3f0);
                      *(uint *)(local_b70.ray + 0x3f4) =
                           (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_b70.ray + 0x3f4);
                      *(uint *)(local_b70.ray + 0x3f8) =
                           (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_b70.ray + 0x3f8);
                      *(uint *)(local_b70.ray + 0x3fc) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_b70.ray + 0x3fc);
                      iVar63 = *(int *)(local_b70.hit + 0x104);
                      iVar64 = *(int *)(local_b70.hit + 0x108);
                      iVar65 = *(int *)(local_b70.hit + 0x10c);
                      iVar66 = *(int *)(local_b70.hit + 0x110);
                      iVar67 = *(int *)(local_b70.hit + 0x114);
                      iVar68 = *(int *)(local_b70.hit + 0x118);
                      iVar69 = *(int *)(local_b70.hit + 0x11c);
                      iVar70 = *(int *)(local_b70.hit + 0x120);
                      iVar71 = *(int *)(local_b70.hit + 0x124);
                      iVar72 = *(int *)(local_b70.hit + 0x128);
                      iVar73 = *(int *)(local_b70.hit + 300);
                      iVar74 = *(int *)(local_b70.hit + 0x130);
                      iVar75 = *(int *)(local_b70.hit + 0x134);
                      iVar76 = *(int *)(local_b70.hit + 0x138);
                      iVar77 = *(int *)(local_b70.hit + 0x13c);
                      bVar6 = (bool)((byte)(uVar90 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar90 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar90 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar90 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar90 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar90 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar90 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar90 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar90 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar90 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar90 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar90 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar90 >> 0xe) & 1);
                      bVar19 = SUB81(uVar90 >> 0xf,0);
                      *(uint *)(local_b70.ray + 0x400) =
                           (uint)(bVar84 & 1) * *(int *)(local_b70.hit + 0x100) |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b70.ray + 0x400);
                      *(uint *)(local_b70.ray + 0x404) =
                           (uint)bVar6 * iVar63 | (uint)!bVar6 * *(int *)(local_b70.ray + 0x404);
                      *(uint *)(local_b70.ray + 0x408) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_b70.ray + 0x408);
                      *(uint *)(local_b70.ray + 0x40c) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_b70.ray + 0x40c);
                      *(uint *)(local_b70.ray + 0x410) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_b70.ray + 0x410);
                      *(uint *)(local_b70.ray + 0x414) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_b70.ray + 0x414);
                      *(uint *)(local_b70.ray + 0x418) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_b70.ray + 0x418);
                      *(uint *)(local_b70.ray + 0x41c) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_b70.ray + 0x41c);
                      *(uint *)(local_b70.ray + 0x420) =
                           (uint)(bVar83 & 1) * iVar70 |
                           (uint)!(bool)(bVar83 & 1) * *(int *)(local_b70.ray + 0x420);
                      *(uint *)(local_b70.ray + 0x424) =
                           (uint)bVar13 * iVar71 | (uint)!bVar13 * *(int *)(local_b70.ray + 0x424);
                      *(uint *)(local_b70.ray + 0x428) =
                           (uint)bVar14 * iVar72 | (uint)!bVar14 * *(int *)(local_b70.ray + 0x428);
                      *(uint *)(local_b70.ray + 0x42c) =
                           (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_b70.ray + 0x42c);
                      *(uint *)(local_b70.ray + 0x430) =
                           (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_b70.ray + 0x430);
                      *(uint *)(local_b70.ray + 0x434) =
                           (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_b70.ray + 0x434);
                      *(uint *)(local_b70.ray + 0x438) =
                           (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_b70.ray + 0x438);
                      *(uint *)(local_b70.ray + 0x43c) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_b70.ray + 0x43c);
                      auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b70.hit + 0x140));
                      auVar183 = vmovdqu32_avx512f(auVar183);
                      *(undefined1 (*) [64])(local_b70.ray + 0x440) = auVar183;
                      auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b70.hit + 0x180));
                      auVar183 = vmovdqu32_avx512f(auVar183);
                      *(undefined1 (*) [64])(local_b70.ray + 0x480) = auVar183;
                      auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b70.hit + 0x1c0));
                      auVar183 = vmovdqa32_avx512f(auVar183);
                      *(undefined1 (*) [64])(local_b70.ray + 0x4c0) = auVar183;
                      auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b70.hit + 0x200));
                      auVar183 = vmovdqa32_avx512f(auVar183);
                      *(undefined1 (*) [64])(local_b70.ray + 0x500) = auVar183;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar268;
                  break;
                }
              }
              lVar92 = lVar92 + -1;
            } while (lVar92 != 0);
            uVar190 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar181._4_4_ = uVar190;
            auVar181._0_4_ = uVar190;
            auVar181._8_4_ = uVar190;
            auVar181._12_4_ = uVar190;
            auVar181._16_4_ = uVar190;
            auVar181._20_4_ = uVar190;
            auVar181._24_4_ = uVar190;
            auVar181._28_4_ = uVar190;
            auVar78._4_4_ = fStack_71c;
            auVar78._0_4_ = local_720;
            auVar78._8_4_ = fStack_718;
            auVar78._12_4_ = fStack_714;
            auVar78._16_4_ = fStack_710;
            auVar78._20_4_ = fStack_70c;
            auVar78._24_4_ = fStack_708;
            auVar78._28_4_ = fStack_704;
            uVar22 = vcmpps_avx512vl(auVar181,auVar78,0xd);
            bVar93 = ~('\x01' << ((byte)iVar25 & 0x1f)) & bVar93 & (byte)uVar22;
          } while (bVar93 != 0);
          auVar256 = ZEXT3264(local_680);
        }
        bVar86 = local_740[0] | ~bVar86;
        auVar208._0_4_ = (float)local_9e0._0_4_ + auVar256._0_4_;
        auVar208._4_4_ = (float)local_9e0._4_4_ + auVar256._4_4_;
        auVar208._8_4_ = fStack_9d8 + auVar256._8_4_;
        auVar208._12_4_ = fStack_9d4 + auVar256._12_4_;
        auVar208._16_4_ = fStack_9d0 + auVar256._16_4_;
        auVar208._20_4_ = fStack_9cc + auVar256._20_4_;
        auVar208._24_4_ = fStack_9c8 + auVar256._24_4_;
        auVar208._28_4_ = fStack_9c4 + auVar256._28_4_;
        uVar22 = vcmpps_avx512vl(auVar208,auVar181,2);
        bVar82 = (byte)uVar23 & bVar82 & (byte)uVar22;
        auVar209._8_4_ = 2;
        auVar209._0_8_ = 0x200000002;
        auVar209._12_4_ = 2;
        auVar209._16_4_ = 2;
        auVar209._20_4_ = 2;
        auVar209._24_4_ = 2;
        auVar209._28_4_ = 2;
        auVar36._8_4_ = 3;
        auVar36._0_8_ = 0x300000003;
        auVar36._12_4_ = 3;
        auVar36._16_4_ = 3;
        auVar36._20_4_ = 3;
        auVar36._24_4_ = 3;
        auVar36._28_4_ = 3;
        auVar120 = vpblendmd_avx512vl(auVar209,auVar36);
        auVar157._0_4_ = (uint)(bVar86 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar86 & 1) * 2;
        bVar6 = (bool)(bVar86 >> 1 & 1);
        auVar157._4_4_ = (uint)bVar6 * auVar120._4_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar86 >> 2 & 1);
        auVar157._8_4_ = (uint)bVar6 * auVar120._8_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar86 >> 3 & 1);
        auVar157._12_4_ = (uint)bVar6 * auVar120._12_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar86 >> 4 & 1);
        auVar157._16_4_ = (uint)bVar6 * auVar120._16_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar86 >> 5 & 1);
        auVar157._20_4_ = (uint)bVar6 * auVar120._20_4_ | (uint)!bVar6 * 2;
        bVar6 = (bool)(bVar86 >> 6 & 1);
        auVar157._24_4_ = (uint)bVar6 * auVar120._24_4_ | (uint)!bVar6 * 2;
        auVar157._28_4_ = (uint)(bVar86 >> 7) * auVar120._28_4_ | (uint)!(bool)(bVar86 >> 7) * 2;
        uVar22 = vpcmpd_avx512vl(local_6e0,auVar157,5);
        bVar86 = (byte)uVar22 & bVar82;
        fVar263 = (float)local_9e0._0_4_;
        fVar268 = (float)local_9e0._4_4_;
        fVar269 = fStack_9d8;
        fVar270 = fStack_9d4;
        fVar243 = fStack_9d0;
        fVar244 = fStack_9cc;
        fVar245 = fStack_9c8;
        fVar229 = fStack_9c4;
        if (bVar86 != 0) {
          auVar103 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
          auVar98 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
          auVar96 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar108 = vminps_avx(auVar103,auVar96);
          auVar103 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar96 = vmaxps_avx(auVar98,auVar103);
          auVar217._8_4_ = 0x7fffffff;
          auVar217._0_8_ = 0x7fffffff7fffffff;
          auVar217._12_4_ = 0x7fffffff;
          auVar98 = vandps_avx(auVar108,auVar217);
          auVar103 = vandps_avx(auVar96,auVar217);
          auVar98 = vmaxps_avx(auVar98,auVar103);
          auVar103 = vmovshdup_avx(auVar98);
          auVar103 = vmaxss_avx(auVar103,auVar98);
          auVar98 = vshufpd_avx(auVar98,auVar98,1);
          auVar98 = vmaxss_avx(auVar98,auVar103);
          fVar263 = auVar98._0_4_ * 1.9073486e-06;
          local_920 = vshufps_avx(auVar96,auVar96,0xff);
          local_720 = (float)local_9e0._0_4_ + local_6c0._0_4_;
          fStack_71c = (float)local_9e0._4_4_ + local_6c0._4_4_;
          fStack_718 = fStack_9d8 + local_6c0._8_4_;
          fStack_714 = fStack_9d4 + local_6c0._12_4_;
          fStack_710 = fStack_9d0 + local_6c0._16_4_;
          fStack_70c = fStack_9cc + local_6c0._20_4_;
          fStack_708 = fStack_9c8 + local_6c0._24_4_;
          fStack_704 = fStack_9c4 + local_6c0._28_4_;
          _local_8c0 = local_6c0;
          local_740 = auVar157;
          do {
            auVar182._8_4_ = 0x7f800000;
            auVar182._0_8_ = 0x7f8000007f800000;
            auVar182._12_4_ = 0x7f800000;
            auVar182._16_4_ = 0x7f800000;
            auVar182._20_4_ = 0x7f800000;
            auVar182._24_4_ = 0x7f800000;
            auVar182._28_4_ = 0x7f800000;
            auVar120 = vblendmps_avx512vl(auVar182,_local_8c0);
            auVar158._0_4_ =
                 (uint)(bVar86 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar86 & 1) * 0x7f800000;
            bVar6 = (bool)(bVar86 >> 1 & 1);
            auVar158._4_4_ = (uint)bVar6 * auVar120._4_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar86 >> 2 & 1);
            auVar158._8_4_ = (uint)bVar6 * auVar120._8_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar86 >> 3 & 1);
            auVar158._12_4_ = (uint)bVar6 * auVar120._12_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar86 >> 4 & 1);
            auVar158._16_4_ = (uint)bVar6 * auVar120._16_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar86 >> 5 & 1);
            auVar158._20_4_ = (uint)bVar6 * auVar120._20_4_ | (uint)!bVar6 * 0x7f800000;
            auVar158._24_4_ =
                 (uint)(bVar86 >> 6) * auVar120._24_4_ | (uint)!(bool)(bVar86 >> 6) * 0x7f800000;
            auVar158._28_4_ = 0x7f800000;
            auVar120 = vshufps_avx(auVar158,auVar158,0xb1);
            auVar120 = vminps_avx(auVar158,auVar120);
            auVar121 = vshufpd_avx(auVar120,auVar120,5);
            auVar120 = vminps_avx(auVar120,auVar121);
            auVar121 = vpermpd_avx2(auVar120,0x4e);
            auVar120 = vminps_avx(auVar120,auVar121);
            uVar22 = vcmpps_avx512vl(auVar158,auVar120,0);
            bVar84 = (byte)uVar22 & bVar86;
            bVar93 = bVar86;
            if (bVar84 != 0) {
              bVar93 = bVar84;
            }
            iVar25 = 0;
            for (uVar95 = (uint)bVar93; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x80000000) {
              iVar25 = iVar25 + 1;
            }
            uVar95 = *(uint *)(local_6a0 + (uint)(iVar25 << 2));
            fVar268 = auVar20._0_4_;
            auVar98 = ZEXT416(*(uint *)(local_500 + (uint)(iVar25 << 2)));
            if ((float)local_a00._0_4_ < 0.0) {
              local_a80._0_16_ = ZEXT416(*(uint *)(local_500 + (uint)(iVar25 << 2)));
              fVar268 = sqrtf((float)local_a00._0_4_);
              auVar98 = local_a80._0_16_;
            }
            local_a50._0_4_ = fVar268 * 1.9073486e-06;
            auVar98 = vinsertps_avx(ZEXT416(uVar95),auVar98,0x10);
            auVar272 = ZEXT1664(auVar98);
            lVar92 = 5;
            do {
              uVar190 = auVar272._0_4_;
              auVar172._4_4_ = uVar190;
              auVar172._0_4_ = uVar190;
              auVar172._8_4_ = uVar190;
              auVar172._12_4_ = uVar190;
              auVar98 = vfmadd132ps_fma(auVar172,ZEXT816(0) << 0x40,local_9f0);
              auVar103 = vmovshdup_avx(auVar272._0_16_);
              fVar244 = auVar103._0_4_;
              fVar243 = 1.0 - fVar244;
              fVar270 = fVar243 * fVar243 * fVar243;
              fVar268 = fVar244 * fVar244;
              fVar245 = fVar268 * fVar244;
              auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar270),
                                        ZEXT416((uint)fVar245));
              fVar269 = fVar244 * fVar243;
              local_a80._0_16_ = ZEXT416((uint)fVar243);
              auVar104 = vfmadd231ss_fma(ZEXT416((uint)(fVar269 * fVar244 * 6.0)),
                                         ZEXT416((uint)(fVar269 * fVar243)),
                                         SUB6416(ZEXT464(0x41400000),0));
              auVar108 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar245),
                                         ZEXT416((uint)fVar270));
              auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar269 * fVar243 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar269 * fVar244)));
              fVar270 = fVar270 * 0.16666667;
              fVar243 = (auVar96._0_4_ + auVar104._0_4_) * 0.16666667;
              fVar244 = (auVar108._0_4_ + auVar97._0_4_) * 0.16666667;
              fVar245 = fVar245 * 0.16666667;
              auVar218._0_4_ = fVar245 * (float)local_9c0._0_4_;
              auVar218._4_4_ = fVar245 * (float)local_9c0._4_4_;
              auVar218._8_4_ = fVar245 * fStack_9b8;
              auVar218._12_4_ = fVar245 * fStack_9b4;
              auVar248._4_4_ = fVar244;
              auVar248._0_4_ = fVar244;
              auVar248._8_4_ = fVar244;
              auVar248._12_4_ = fVar244;
              auVar96 = vfmadd132ps_fma(auVar248,auVar218,local_980._0_16_);
              auVar219._4_4_ = fVar243;
              auVar219._0_4_ = fVar243;
              auVar219._8_4_ = fVar243;
              auVar219._12_4_ = fVar243;
              auVar96 = vfmadd132ps_fma(auVar219,auVar96,local_9a0._0_16_);
              auVar199._4_4_ = fVar270;
              auVar199._0_4_ = fVar270;
              auVar199._8_4_ = fVar270;
              auVar199._12_4_ = fVar270;
              auVar96 = vfmadd132ps_fma(auVar199,auVar96,local_960._0_16_);
              local_840._0_16_ = auVar96;
              auVar96 = vsubps_avx(auVar98,auVar96);
              auVar98 = vdpps_avx(auVar96,auVar96,0x7f);
              local_a20._0_16_ = auVar98;
              local_7c0 = auVar272;
              if (auVar98._0_4_ < 0.0) {
                local_aa0._0_4_ = fVar268;
                local_ac0._0_4_ = fVar269;
                auVar262._0_4_ = sqrtf(auVar98._0_4_);
                auVar262._4_60_ = extraout_var_00;
                auVar98 = auVar262._0_16_;
                fVar269 = (float)local_ac0._0_4_;
              }
              else {
                auVar98 = vsqrtss_avx(auVar98,auVar98);
                local_aa0._0_4_ = fVar268;
              }
              local_860._4_4_ = local_a80._0_4_;
              local_860._0_4_ = local_860._4_4_;
              fStack_858 = (float)local_860._4_4_;
              fStack_854 = (float)local_860._4_4_;
              auVar104 = vfnmsub213ss_fma(auVar103,auVar103,ZEXT416((uint)(fVar269 * 4.0)));
              auVar108 = vfmadd231ss_fma(ZEXT416((uint)(fVar269 * 4.0)),local_a80._0_16_,
                                         local_a80._0_16_);
              fVar268 = (float)local_860._4_4_ * -(float)local_860._4_4_ * 0.5;
              fVar269 = auVar104._0_4_ * 0.5;
              fVar270 = auVar108._0_4_ * 0.5;
              local_aa0._0_4_ = (float)local_aa0._0_4_ * 0.5;
              auVar236._0_4_ = (float)local_aa0._0_4_ * (float)local_9c0._0_4_;
              auVar236._4_4_ = (float)local_aa0._0_4_ * (float)local_9c0._4_4_;
              auVar236._8_4_ = (float)local_aa0._0_4_ * fStack_9b8;
              auVar236._12_4_ = (float)local_aa0._0_4_ * fStack_9b4;
              auVar200._4_4_ = fVar270;
              auVar200._0_4_ = fVar270;
              auVar200._8_4_ = fVar270;
              auVar200._12_4_ = fVar270;
              auVar108 = vfmadd132ps_fma(auVar200,auVar236,local_980._0_16_);
              auVar220._4_4_ = fVar269;
              auVar220._0_4_ = fVar269;
              auVar220._8_4_ = fVar269;
              auVar220._12_4_ = fVar269;
              auVar108 = vfmadd132ps_fma(auVar220,auVar108,local_9a0._0_16_);
              auVar277._4_4_ = fVar268;
              auVar277._0_4_ = fVar268;
              auVar277._8_4_ = fVar268;
              auVar277._12_4_ = fVar268;
              _local_aa0 = vfmadd132ps_fma(auVar277,auVar108,local_960._0_16_);
              local_880._0_16_ = vdpps_avx(_local_aa0,_local_aa0,0x7f);
              auVar62._12_4_ = 0;
              auVar62._0_12_ = ZEXT812(0);
              fVar268 = local_880._0_4_;
              auVar104 = vrsqrt14ss_avx512f(auVar62 << 0x20,ZEXT416((uint)fVar268));
              local_8a0._0_16_ = vrcp14ss_avx512f(auVar62 << 0x20,ZEXT416((uint)fVar268));
              auVar108 = vfnmadd213ss_fma(local_8a0._0_16_,local_880._0_16_,ZEXT416(0x40000000));
              local_a40._0_4_ = auVar108._0_4_;
              local_ac0._0_4_ = auVar98._0_4_;
              if (fVar268 < -fVar268) {
                local_a60 = auVar104;
                fVar269 = sqrtf(fVar268);
                auVar98 = ZEXT416((uint)local_ac0._0_4_);
                auVar108 = local_a60;
                auVar97 = _local_aa0;
              }
              else {
                auVar108 = vsqrtss_avx(local_880._0_16_,local_880._0_16_);
                fVar269 = auVar108._0_4_;
                auVar108 = auVar104;
                auVar97 = _local_aa0;
              }
              fVar270 = auVar108._0_4_;
              auVar101 = vbroadcastss_avx512vl
                                   (ZEXT416((uint)(auVar104._0_4_ * 1.5 +
                                                  fVar268 * -0.5 * fVar270 * fVar270 * fVar270)));
              auVar100 = vmulps_avx512vl(auVar97,auVar101);
              auVar108 = vdpps_avx(auVar96,auVar100,0x7f);
              fVar268 = auVar98._0_4_ + 1.0;
              fVar270 = auVar108._0_4_;
              auVar173._0_4_ = fVar270 * fVar270;
              auVar173._4_4_ = auVar108._4_4_ * auVar108._4_4_;
              auVar173._8_4_ = auVar108._8_4_ * auVar108._8_4_;
              auVar173._12_4_ = auVar108._12_4_ * auVar108._12_4_;
              auVar104 = vsubps_avx(local_a20._0_16_,auVar173);
              fVar243 = auVar104._0_4_;
              auVar201._4_12_ = ZEXT812(0) << 0x20;
              auVar201._0_4_ = fVar243;
              auVar99 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar201);
              auVar105 = vmulss_avx512f(auVar99,ZEXT416(0x3fc00000));
              auVar106 = vmulss_avx512f(auVar104,ZEXT416(0xbf000000));
              if (fVar243 < 0.0) {
                local_a60._0_4_ = fVar268;
                local_8f0._0_4_ = auVar105._0_4_;
                _local_910 = auVar101;
                local_900 = auVar100;
                local_8e0 = auVar99;
                fVar243 = sqrtf(fVar243);
                auVar106 = ZEXT416(auVar106._0_4_);
                auVar105 = ZEXT416((uint)local_8f0._0_4_);
                auVar98 = ZEXT416((uint)local_ac0._0_4_);
                auVar99 = local_8e0;
                auVar97 = _local_aa0;
                fVar268 = (float)local_a60._0_4_;
                auVar100 = local_900;
                auVar101 = _local_910;
              }
              else {
                auVar104 = vsqrtss_avx(auVar104,auVar104);
                fVar243 = auVar104._0_4_;
              }
              auVar279 = ZEXT1664(auVar97);
              auVar275 = ZEXT1664(local_a20._0_16_);
              auVar273 = ZEXT1664(auVar96);
              auVar280 = ZEXT3264(local_ae0);
              auVar281 = ZEXT3264(local_b00);
              auVar282 = ZEXT3264(local_b20);
              auVar283 = ZEXT3264(local_b40);
              auVar104 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_,auVar103);
              auVar102 = vfmadd213ss_fma(auVar103,SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_);
              auVar271 = local_7c0._0_16_;
              auVar103 = vshufps_avx(auVar271,auVar271,0x55);
              auVar221._0_4_ = auVar103._0_4_ * (float)local_9c0._0_4_;
              auVar221._4_4_ = auVar103._4_4_ * (float)local_9c0._4_4_;
              auVar221._8_4_ = auVar103._8_4_ * fStack_9b8;
              auVar221._12_4_ = auVar103._12_4_ * fStack_9b4;
              auVar237._0_4_ = auVar102._0_4_;
              auVar237._4_4_ = auVar237._0_4_;
              auVar237._8_4_ = auVar237._0_4_;
              auVar237._12_4_ = auVar237._0_4_;
              auVar103 = vfmadd132ps_fma(auVar237,auVar221,local_980._0_16_);
              auVar202._0_4_ = auVar104._0_4_;
              auVar202._4_4_ = auVar202._0_4_;
              auVar202._8_4_ = auVar202._0_4_;
              auVar202._12_4_ = auVar202._0_4_;
              auVar103 = vfmadd132ps_fma(auVar202,auVar103,local_9a0._0_16_);
              auVar103 = vfmadd132ps_fma(_local_860,auVar103,local_960._0_16_);
              auVar203._0_4_ = auVar103._0_4_ * (float)local_880._0_4_;
              auVar203._4_4_ = auVar103._4_4_ * (float)local_880._0_4_;
              auVar203._8_4_ = auVar103._8_4_ * (float)local_880._0_4_;
              auVar203._12_4_ = auVar103._12_4_ * (float)local_880._0_4_;
              auVar103 = vdpps_avx(auVar97,auVar103,0x7f);
              fVar244 = auVar103._0_4_;
              auVar222._0_4_ = auVar97._0_4_ * fVar244;
              auVar222._4_4_ = auVar97._4_4_ * fVar244;
              auVar222._8_4_ = auVar97._8_4_ * fVar244;
              auVar222._12_4_ = auVar97._12_4_ * fVar244;
              auVar103 = vsubps_avx(auVar203,auVar222);
              fVar244 = (float)local_a40._0_4_ * (float)local_8a0._0_4_;
              auVar102 = vmaxss_avx(ZEXT416((uint)fVar263),
                                    ZEXT416((uint)(local_7c0._0_4_ * (float)local_a50._0_4_)));
              auVar204._0_4_ = auVar103._0_4_ * fVar244;
              auVar204._4_4_ = auVar103._4_4_ * fVar244;
              auVar204._8_4_ = auVar103._8_4_ * fVar244;
              auVar204._12_4_ = auVar103._12_4_ * fVar244;
              auVar29._8_4_ = 0x80000000;
              auVar29._0_8_ = 0x8000000080000000;
              auVar29._12_4_ = 0x80000000;
              auVar107 = vxorps_avx512vl(auVar97,auVar29);
              auVar101 = vmulps_avx512vl(auVar101,auVar204);
              auVar103 = vdpps_avx(auVar107,auVar100,0x7f);
              auVar104 = vfmadd213ss_fma(auVar98,ZEXT416((uint)fVar263),auVar102);
              auVar98 = vdpps_avx(auVar96,auVar101,0x7f);
              auVar101 = vfmadd213ss_fma(ZEXT416((uint)fVar268),ZEXT416((uint)(fVar263 / fVar269)),
                                         auVar104);
              fVar268 = auVar103._0_4_ + auVar98._0_4_;
              auVar98 = vdpps_avx(local_9f0,auVar100,0x7f);
              auVar103 = vdpps_avx(auVar96,auVar107,0x7f);
              auVar104 = vmulss_avx512f(auVar106,auVar99);
              auVar105 = vaddss_avx512f(auVar105,ZEXT416((uint)(auVar104._0_4_ *
                                                               auVar99._0_4_ * auVar99._0_4_)));
              auVar104 = vdpps_avx(auVar96,local_9f0,0x7f);
              auVar100 = vfnmadd231ss_fma(auVar103,auVar108,ZEXT416((uint)fVar268));
              auVar104 = vfnmadd231ss_fma(auVar104,auVar108,auVar98);
              auVar103 = vpermilps_avx(local_840._0_16_,0xff);
              fVar243 = fVar243 - auVar103._0_4_;
              auVar99 = vshufps_avx(auVar97,auVar97,0xff);
              auVar103 = vfmsub213ss_fma(auVar100,auVar105,auVar99);
              auVar265._8_4_ = 0x80000000;
              auVar265._0_8_ = 0x8000000080000000;
              auVar265._12_4_ = 0x80000000;
              auVar267 = ZEXT1664(auVar265);
              auVar260._0_8_ = auVar103._0_8_ ^ 0x8000000080000000;
              auVar260._8_4_ = auVar103._8_4_ ^ 0x80000000;
              auVar260._12_4_ = auVar103._12_4_ ^ 0x80000000;
              auVar262 = ZEXT1664(auVar260);
              auVar104 = ZEXT416((uint)(auVar104._0_4_ * auVar105._0_4_));
              auVar100 = vfmsub231ss_fma(ZEXT416((uint)(auVar98._0_4_ * auVar103._0_4_)),
                                         ZEXT416((uint)fVar268),auVar104);
              auVar103 = vinsertps_avx(auVar260,auVar104,0x1c);
              auVar255._0_8_ = auVar98._0_8_ ^ 0x8000000080000000;
              auVar255._8_4_ = auVar98._8_4_ ^ 0x80000000;
              auVar255._12_4_ = auVar98._12_4_ ^ 0x80000000;
              auVar104 = vinsertps_avx(ZEXT416((uint)fVar268),auVar255,0x10);
              auVar238._0_4_ = auVar100._0_4_;
              auVar238._4_4_ = auVar238._0_4_;
              auVar238._8_4_ = auVar238._0_4_;
              auVar238._12_4_ = auVar238._0_4_;
              auVar98 = vdivps_avx(auVar103,auVar238);
              auVar103 = vdivps_avx(auVar104,auVar238);
              auVar256 = ZEXT1664(CONCAT412(fVar243,CONCAT48(fVar243,CONCAT44(fVar243,fVar243))));
              auVar239._0_4_ = fVar270 * auVar98._0_4_ + fVar243 * auVar103._0_4_;
              auVar239._4_4_ = fVar270 * auVar98._4_4_ + fVar243 * auVar103._4_4_;
              auVar239._8_4_ = fVar270 * auVar98._8_4_ + fVar243 * auVar103._8_4_;
              auVar239._12_4_ = fVar270 * auVar98._12_4_ + fVar243 * auVar103._12_4_;
              auVar98 = vsubps_avx(auVar271,auVar239);
              auVar272 = ZEXT1664(auVar98);
              auVar30._8_4_ = 0x7fffffff;
              auVar30._0_8_ = 0x7fffffff7fffffff;
              auVar30._12_4_ = 0x7fffffff;
              auVar103 = vandps_avx512vl(auVar108,auVar30);
              if (auVar103._0_4_ < auVar101._0_4_) {
                auVar103 = vfmadd231ss_fma(ZEXT416((uint)(auVar101._0_4_ + auVar102._0_4_)),
                                           local_920,ZEXT416(0x36000000));
                auVar31._8_4_ = 0x7fffffff;
                auVar31._0_8_ = 0x7fffffff7fffffff;
                auVar31._12_4_ = 0x7fffffff;
                auVar108 = vandps_avx512vl(ZEXT416((uint)fVar243),auVar31);
                if (auVar108._0_4_ < auVar103._0_4_) {
                  fVar268 = auVar98._0_4_ + (float)local_930._0_4_;
                  if ((fVar268 < fVar168) ||
                     (fVar269 = *(float *)(ray + k * 4 + 0x200), fVar269 < fVar268)) break;
                  auVar103 = vmovshdup_avx(auVar98);
                  fVar270 = auVar103._0_4_;
                  if ((fVar270 < 0.0) || (1.0 < fVar270)) break;
                  auVar103 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_a20._0_4_));
                  fVar244 = auVar103._0_4_;
                  fVar243 = local_a20._0_4_ * -0.5;
                  auVar256 = ZEXT464((uint)fVar243);
                  pGVar3 = (context->scene->geometries).items[uVar91].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                  fVar243 = fVar244 * 1.5 + fVar243 * fVar244 * fVar244 * fVar244;
                  auVar240._0_4_ = auVar96._0_4_ * fVar243;
                  auVar240._4_4_ = auVar96._4_4_ * fVar243;
                  auVar240._8_4_ = auVar96._8_4_ * fVar243;
                  auVar240._12_4_ = auVar96._12_4_ * fVar243;
                  auVar99 = vfmadd213ps_fma(auVar99,auVar240,auVar97);
                  auVar103 = vshufps_avx(auVar240,auVar240,0xc9);
                  auVar108 = vshufps_avx(auVar97,auVar97,0xc9);
                  auVar241._0_4_ = auVar240._0_4_ * auVar108._0_4_;
                  auVar241._4_4_ = auVar240._4_4_ * auVar108._4_4_;
                  auVar241._8_4_ = auVar240._8_4_ * auVar108._8_4_;
                  auVar241._12_4_ = auVar240._12_4_ * auVar108._12_4_;
                  auVar104 = vfmsub231ps_fma(auVar241,auVar97,auVar103);
                  auVar103 = vshufps_avx(auVar104,auVar104,0xc9);
                  auVar108 = vshufps_avx(auVar99,auVar99,0xc9);
                  auVar256 = ZEXT1664(auVar108);
                  auVar104 = vshufps_avx(auVar104,auVar104,0xd2);
                  auVar205._0_4_ = auVar99._0_4_ * auVar104._0_4_;
                  auVar205._4_4_ = auVar99._4_4_ * auVar104._4_4_;
                  auVar205._8_4_ = auVar99._8_4_ * auVar104._8_4_;
                  auVar205._12_4_ = auVar99._12_4_ * auVar104._12_4_;
                  auVar103 = vfmsub231ps_fma(auVar205,auVar103,auVar108);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar268;
                    uVar190 = vextractps_avx(auVar103,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar190;
                    uVar190 = vextractps_avx(auVar103,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar190;
                    *(int *)(ray + k * 4 + 0x380) = auVar103._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar270;
                    *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                    *(uint *)(ray + k * 4 + 0x440) = uVar2;
                    *(uint *)(ray + k * 4 + 0x480) = uVar91;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar5 = context->user;
                  auVar183 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar183,auVar272);
                  auVar183 = vpermps_avx512f(auVar183,ZEXT1664(auVar103));
                  auVar160 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar160,ZEXT1664(auVar103));
                  local_380 = vbroadcastss_avx512f(auVar103);
                  local_400[0] = (RTCHitN)auVar183[0];
                  local_400[1] = (RTCHitN)auVar183[1];
                  local_400[2] = (RTCHitN)auVar183[2];
                  local_400[3] = (RTCHitN)auVar183[3];
                  local_400[4] = (RTCHitN)auVar183[4];
                  local_400[5] = (RTCHitN)auVar183[5];
                  local_400[6] = (RTCHitN)auVar183[6];
                  local_400[7] = (RTCHitN)auVar183[7];
                  local_400[8] = (RTCHitN)auVar183[8];
                  local_400[9] = (RTCHitN)auVar183[9];
                  local_400[10] = (RTCHitN)auVar183[10];
                  local_400[0xb] = (RTCHitN)auVar183[0xb];
                  local_400[0xc] = (RTCHitN)auVar183[0xc];
                  local_400[0xd] = (RTCHitN)auVar183[0xd];
                  local_400[0xe] = (RTCHitN)auVar183[0xe];
                  local_400[0xf] = (RTCHitN)auVar183[0xf];
                  local_400[0x10] = (RTCHitN)auVar183[0x10];
                  local_400[0x11] = (RTCHitN)auVar183[0x11];
                  local_400[0x12] = (RTCHitN)auVar183[0x12];
                  local_400[0x13] = (RTCHitN)auVar183[0x13];
                  local_400[0x14] = (RTCHitN)auVar183[0x14];
                  local_400[0x15] = (RTCHitN)auVar183[0x15];
                  local_400[0x16] = (RTCHitN)auVar183[0x16];
                  local_400[0x17] = (RTCHitN)auVar183[0x17];
                  local_400[0x18] = (RTCHitN)auVar183[0x18];
                  local_400[0x19] = (RTCHitN)auVar183[0x19];
                  local_400[0x1a] = (RTCHitN)auVar183[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar183[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar183[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar183[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar183[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar183[0x1f];
                  local_400[0x20] = (RTCHitN)auVar183[0x20];
                  local_400[0x21] = (RTCHitN)auVar183[0x21];
                  local_400[0x22] = (RTCHitN)auVar183[0x22];
                  local_400[0x23] = (RTCHitN)auVar183[0x23];
                  local_400[0x24] = (RTCHitN)auVar183[0x24];
                  local_400[0x25] = (RTCHitN)auVar183[0x25];
                  local_400[0x26] = (RTCHitN)auVar183[0x26];
                  local_400[0x27] = (RTCHitN)auVar183[0x27];
                  local_400[0x28] = (RTCHitN)auVar183[0x28];
                  local_400[0x29] = (RTCHitN)auVar183[0x29];
                  local_400[0x2a] = (RTCHitN)auVar183[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar183[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar183[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar183[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar183[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar183[0x2f];
                  local_400[0x30] = (RTCHitN)auVar183[0x30];
                  local_400[0x31] = (RTCHitN)auVar183[0x31];
                  local_400[0x32] = (RTCHitN)auVar183[0x32];
                  local_400[0x33] = (RTCHitN)auVar183[0x33];
                  local_400[0x34] = (RTCHitN)auVar183[0x34];
                  local_400[0x35] = (RTCHitN)auVar183[0x35];
                  local_400[0x36] = (RTCHitN)auVar183[0x36];
                  local_400[0x37] = (RTCHitN)auVar183[0x37];
                  local_400[0x38] = (RTCHitN)auVar183[0x38];
                  local_400[0x39] = (RTCHitN)auVar183[0x39];
                  local_400[0x3a] = (RTCHitN)auVar183[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar183[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar183[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar183[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar183[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar183[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar183 = vmovdqa64_avx512f(local_440);
                  local_280 = vmovdqa64_avx512f(auVar183);
                  auVar120 = vpcmpeqd_avx2(auVar183._0_32_,auVar183._0_32_);
                  local_a28[3] = auVar120;
                  local_a28[2] = auVar120;
                  local_a28[1] = auVar120;
                  *local_a28 = auVar120;
                  local_240 = vbroadcastss_avx512f(ZEXT416(pRVar5->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(pRVar5->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar268;
                  auVar183 = vmovdqa64_avx512f(local_4c0);
                  local_780 = vmovdqa64_avx512f(auVar183);
                  local_b70.valid = (int *)local_780;
                  local_b70.geometryUserPtr = pGVar3->userPtr;
                  local_b70.context = context->user;
                  local_b70.hit = local_400;
                  local_b70.N = 0x10;
                  local_b70.ray = (RTCRayN *)ray;
                  if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar256 = ZEXT1664(auVar108);
                    auVar262 = ZEXT1664(auVar260);
                    auVar267 = ZEXT1664(auVar265);
                    auVar272 = ZEXT1664(auVar98);
                    auVar273 = ZEXT1664(auVar96);
                    auVar275 = ZEXT1664(local_a20._0_16_);
                    auVar279 = ZEXT1664(auVar97);
                    (*pGVar3->intersectionFilterN)(&local_b70);
                    auVar283 = ZEXT3264(local_b40);
                    auVar282 = ZEXT3264(local_b20);
                    auVar281 = ZEXT3264(local_b00);
                    auVar280 = ZEXT3264(local_ae0);
                    auVar183 = vmovdqa64_avx512f(local_780);
                  }
                  uVar22 = vptestmd_avx512f(auVar183,auVar183);
                  if ((short)uVar22 != 0) {
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar256 = ZEXT1664(auVar256._0_16_);
                      auVar262 = ZEXT1664(auVar262._0_16_);
                      auVar267 = ZEXT1664(auVar267._0_16_);
                      auVar272 = ZEXT1664(auVar272._0_16_);
                      auVar273 = ZEXT1664(auVar273._0_16_);
                      auVar275 = ZEXT1664(auVar275._0_16_);
                      auVar279 = ZEXT1664(auVar279._0_16_);
                      (*p_Var4)(&local_b70);
                      auVar283 = ZEXT3264(local_b40);
                      auVar282 = ZEXT3264(local_b20);
                      auVar281 = ZEXT3264(local_b00);
                      auVar280 = ZEXT3264(local_ae0);
                      auVar183 = vmovdqa64_avx512f(local_780);
                    }
                    uVar90 = vptestmd_avx512f(auVar183,auVar183);
                    if ((short)uVar90 != 0) {
                      iVar63 = *(int *)(local_b70.hit + 4);
                      iVar64 = *(int *)(local_b70.hit + 8);
                      iVar65 = *(int *)(local_b70.hit + 0xc);
                      iVar66 = *(int *)(local_b70.hit + 0x10);
                      iVar67 = *(int *)(local_b70.hit + 0x14);
                      iVar68 = *(int *)(local_b70.hit + 0x18);
                      iVar69 = *(int *)(local_b70.hit + 0x1c);
                      iVar70 = *(int *)(local_b70.hit + 0x20);
                      iVar71 = *(int *)(local_b70.hit + 0x24);
                      iVar72 = *(int *)(local_b70.hit + 0x28);
                      iVar73 = *(int *)(local_b70.hit + 0x2c);
                      iVar74 = *(int *)(local_b70.hit + 0x30);
                      iVar75 = *(int *)(local_b70.hit + 0x34);
                      iVar76 = *(int *)(local_b70.hit + 0x38);
                      iVar77 = *(int *)(local_b70.hit + 0x3c);
                      bVar93 = (byte)uVar90;
                      bVar6 = (bool)((byte)(uVar90 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar90 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar90 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar90 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar90 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar90 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar90 >> 7) & 1);
                      bVar84 = (byte)(uVar90 >> 8);
                      bVar13 = (bool)((byte)(uVar90 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar90 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar90 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar90 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar90 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar90 >> 0xe) & 1);
                      bVar19 = SUB81(uVar90 >> 0xf,0);
                      *(uint *)(local_b70.ray + 0x300) =
                           (uint)(bVar93 & 1) * *(int *)local_b70.hit |
                           (uint)!(bool)(bVar93 & 1) * *(int *)(local_b70.ray + 0x300);
                      *(uint *)(local_b70.ray + 0x304) =
                           (uint)bVar6 * iVar63 | (uint)!bVar6 * *(int *)(local_b70.ray + 0x304);
                      *(uint *)(local_b70.ray + 0x308) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_b70.ray + 0x308);
                      *(uint *)(local_b70.ray + 0x30c) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_b70.ray + 0x30c);
                      *(uint *)(local_b70.ray + 0x310) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_b70.ray + 0x310);
                      *(uint *)(local_b70.ray + 0x314) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_b70.ray + 0x314);
                      *(uint *)(local_b70.ray + 0x318) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_b70.ray + 0x318);
                      *(uint *)(local_b70.ray + 0x31c) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_b70.ray + 0x31c);
                      *(uint *)(local_b70.ray + 800) =
                           (uint)(bVar84 & 1) * iVar70 |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b70.ray + 800);
                      *(uint *)(local_b70.ray + 0x324) =
                           (uint)bVar13 * iVar71 | (uint)!bVar13 * *(int *)(local_b70.ray + 0x324);
                      *(uint *)(local_b70.ray + 0x328) =
                           (uint)bVar14 * iVar72 | (uint)!bVar14 * *(int *)(local_b70.ray + 0x328);
                      *(uint *)(local_b70.ray + 0x32c) =
                           (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_b70.ray + 0x32c);
                      *(uint *)(local_b70.ray + 0x330) =
                           (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_b70.ray + 0x330);
                      *(uint *)(local_b70.ray + 0x334) =
                           (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_b70.ray + 0x334);
                      *(uint *)(local_b70.ray + 0x338) =
                           (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_b70.ray + 0x338);
                      *(uint *)(local_b70.ray + 0x33c) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_b70.ray + 0x33c);
                      iVar63 = *(int *)(local_b70.hit + 0x44);
                      iVar64 = *(int *)(local_b70.hit + 0x48);
                      iVar65 = *(int *)(local_b70.hit + 0x4c);
                      iVar66 = *(int *)(local_b70.hit + 0x50);
                      iVar67 = *(int *)(local_b70.hit + 0x54);
                      iVar68 = *(int *)(local_b70.hit + 0x58);
                      iVar69 = *(int *)(local_b70.hit + 0x5c);
                      iVar70 = *(int *)(local_b70.hit + 0x60);
                      iVar71 = *(int *)(local_b70.hit + 100);
                      iVar72 = *(int *)(local_b70.hit + 0x68);
                      iVar73 = *(int *)(local_b70.hit + 0x6c);
                      iVar74 = *(int *)(local_b70.hit + 0x70);
                      iVar75 = *(int *)(local_b70.hit + 0x74);
                      iVar76 = *(int *)(local_b70.hit + 0x78);
                      iVar77 = *(int *)(local_b70.hit + 0x7c);
                      bVar6 = (bool)((byte)(uVar90 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar90 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar90 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar90 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar90 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar90 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar90 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar90 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar90 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar90 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar90 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar90 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar90 >> 0xe) & 1);
                      bVar19 = SUB81(uVar90 >> 0xf,0);
                      *(uint *)(local_b70.ray + 0x340) =
                           (uint)(bVar93 & 1) * *(int *)(local_b70.hit + 0x40) |
                           (uint)!(bool)(bVar93 & 1) * *(int *)(local_b70.ray + 0x340);
                      *(uint *)(local_b70.ray + 0x344) =
                           (uint)bVar6 * iVar63 | (uint)!bVar6 * *(int *)(local_b70.ray + 0x344);
                      *(uint *)(local_b70.ray + 0x348) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_b70.ray + 0x348);
                      *(uint *)(local_b70.ray + 0x34c) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_b70.ray + 0x34c);
                      *(uint *)(local_b70.ray + 0x350) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_b70.ray + 0x350);
                      *(uint *)(local_b70.ray + 0x354) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_b70.ray + 0x354);
                      *(uint *)(local_b70.ray + 0x358) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_b70.ray + 0x358);
                      *(uint *)(local_b70.ray + 0x35c) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_b70.ray + 0x35c);
                      *(uint *)(local_b70.ray + 0x360) =
                           (uint)(bVar84 & 1) * iVar70 |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b70.ray + 0x360);
                      *(uint *)(local_b70.ray + 0x364) =
                           (uint)bVar13 * iVar71 | (uint)!bVar13 * *(int *)(local_b70.ray + 0x364);
                      *(uint *)(local_b70.ray + 0x368) =
                           (uint)bVar14 * iVar72 | (uint)!bVar14 * *(int *)(local_b70.ray + 0x368);
                      *(uint *)(local_b70.ray + 0x36c) =
                           (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_b70.ray + 0x36c);
                      *(uint *)(local_b70.ray + 0x370) =
                           (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_b70.ray + 0x370);
                      *(uint *)(local_b70.ray + 0x374) =
                           (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_b70.ray + 0x374);
                      *(uint *)(local_b70.ray + 0x378) =
                           (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_b70.ray + 0x378);
                      *(uint *)(local_b70.ray + 0x37c) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_b70.ray + 0x37c);
                      iVar63 = *(int *)(local_b70.hit + 0x84);
                      iVar64 = *(int *)(local_b70.hit + 0x88);
                      iVar65 = *(int *)(local_b70.hit + 0x8c);
                      iVar66 = *(int *)(local_b70.hit + 0x90);
                      iVar67 = *(int *)(local_b70.hit + 0x94);
                      iVar68 = *(int *)(local_b70.hit + 0x98);
                      iVar69 = *(int *)(local_b70.hit + 0x9c);
                      iVar70 = *(int *)(local_b70.hit + 0xa0);
                      iVar71 = *(int *)(local_b70.hit + 0xa4);
                      iVar72 = *(int *)(local_b70.hit + 0xa8);
                      iVar73 = *(int *)(local_b70.hit + 0xac);
                      iVar74 = *(int *)(local_b70.hit + 0xb0);
                      iVar75 = *(int *)(local_b70.hit + 0xb4);
                      iVar76 = *(int *)(local_b70.hit + 0xb8);
                      iVar77 = *(int *)(local_b70.hit + 0xbc);
                      bVar6 = (bool)((byte)(uVar90 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar90 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar90 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar90 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar90 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar90 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar90 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar90 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar90 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar90 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar90 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar90 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar90 >> 0xe) & 1);
                      bVar19 = SUB81(uVar90 >> 0xf,0);
                      *(uint *)(local_b70.ray + 0x380) =
                           (uint)(bVar93 & 1) * *(int *)(local_b70.hit + 0x80) |
                           (uint)!(bool)(bVar93 & 1) * *(int *)(local_b70.ray + 0x380);
                      *(uint *)(local_b70.ray + 900) =
                           (uint)bVar6 * iVar63 | (uint)!bVar6 * *(int *)(local_b70.ray + 900);
                      *(uint *)(local_b70.ray + 0x388) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_b70.ray + 0x388);
                      *(uint *)(local_b70.ray + 0x38c) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_b70.ray + 0x38c);
                      *(uint *)(local_b70.ray + 0x390) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_b70.ray + 0x390);
                      *(uint *)(local_b70.ray + 0x394) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_b70.ray + 0x394);
                      *(uint *)(local_b70.ray + 0x398) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_b70.ray + 0x398);
                      *(uint *)(local_b70.ray + 0x39c) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_b70.ray + 0x39c);
                      *(uint *)(local_b70.ray + 0x3a0) =
                           (uint)(bVar84 & 1) * iVar70 |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b70.ray + 0x3a0);
                      *(uint *)(local_b70.ray + 0x3a4) =
                           (uint)bVar13 * iVar71 | (uint)!bVar13 * *(int *)(local_b70.ray + 0x3a4);
                      *(uint *)(local_b70.ray + 0x3a8) =
                           (uint)bVar14 * iVar72 | (uint)!bVar14 * *(int *)(local_b70.ray + 0x3a8);
                      *(uint *)(local_b70.ray + 0x3ac) =
                           (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_b70.ray + 0x3ac);
                      *(uint *)(local_b70.ray + 0x3b0) =
                           (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_b70.ray + 0x3b0);
                      *(uint *)(local_b70.ray + 0x3b4) =
                           (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_b70.ray + 0x3b4);
                      *(uint *)(local_b70.ray + 0x3b8) =
                           (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_b70.ray + 0x3b8);
                      *(uint *)(local_b70.ray + 0x3bc) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_b70.ray + 0x3bc);
                      iVar63 = *(int *)(local_b70.hit + 0xc4);
                      iVar64 = *(int *)(local_b70.hit + 200);
                      iVar65 = *(int *)(local_b70.hit + 0xcc);
                      iVar66 = *(int *)(local_b70.hit + 0xd0);
                      iVar67 = *(int *)(local_b70.hit + 0xd4);
                      iVar68 = *(int *)(local_b70.hit + 0xd8);
                      iVar69 = *(int *)(local_b70.hit + 0xdc);
                      iVar70 = *(int *)(local_b70.hit + 0xe0);
                      iVar71 = *(int *)(local_b70.hit + 0xe4);
                      iVar72 = *(int *)(local_b70.hit + 0xe8);
                      iVar73 = *(int *)(local_b70.hit + 0xec);
                      iVar74 = *(int *)(local_b70.hit + 0xf0);
                      iVar75 = *(int *)(local_b70.hit + 0xf4);
                      iVar76 = *(int *)(local_b70.hit + 0xf8);
                      iVar77 = *(int *)(local_b70.hit + 0xfc);
                      bVar6 = (bool)((byte)(uVar90 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar90 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar90 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar90 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar90 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar90 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar90 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar90 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar90 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar90 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar90 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar90 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar90 >> 0xe) & 1);
                      bVar19 = SUB81(uVar90 >> 0xf,0);
                      *(uint *)(local_b70.ray + 0x3c0) =
                           (uint)(bVar93 & 1) * *(int *)(local_b70.hit + 0xc0) |
                           (uint)!(bool)(bVar93 & 1) * *(int *)(local_b70.ray + 0x3c0);
                      *(uint *)(local_b70.ray + 0x3c4) =
                           (uint)bVar6 * iVar63 | (uint)!bVar6 * *(int *)(local_b70.ray + 0x3c4);
                      *(uint *)(local_b70.ray + 0x3c8) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_b70.ray + 0x3c8);
                      *(uint *)(local_b70.ray + 0x3cc) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_b70.ray + 0x3cc);
                      *(uint *)(local_b70.ray + 0x3d0) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_b70.ray + 0x3d0);
                      *(uint *)(local_b70.ray + 0x3d4) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_b70.ray + 0x3d4);
                      *(uint *)(local_b70.ray + 0x3d8) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_b70.ray + 0x3d8);
                      *(uint *)(local_b70.ray + 0x3dc) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_b70.ray + 0x3dc);
                      *(uint *)(local_b70.ray + 0x3e0) =
                           (uint)(bVar84 & 1) * iVar70 |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b70.ray + 0x3e0);
                      *(uint *)(local_b70.ray + 0x3e4) =
                           (uint)bVar13 * iVar71 | (uint)!bVar13 * *(int *)(local_b70.ray + 0x3e4);
                      *(uint *)(local_b70.ray + 1000) =
                           (uint)bVar14 * iVar72 | (uint)!bVar14 * *(int *)(local_b70.ray + 1000);
                      *(uint *)(local_b70.ray + 0x3ec) =
                           (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_b70.ray + 0x3ec);
                      *(uint *)(local_b70.ray + 0x3f0) =
                           (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_b70.ray + 0x3f0);
                      *(uint *)(local_b70.ray + 0x3f4) =
                           (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_b70.ray + 0x3f4);
                      *(uint *)(local_b70.ray + 0x3f8) =
                           (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_b70.ray + 0x3f8);
                      *(uint *)(local_b70.ray + 0x3fc) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_b70.ray + 0x3fc);
                      iVar63 = *(int *)(local_b70.hit + 0x104);
                      iVar64 = *(int *)(local_b70.hit + 0x108);
                      iVar65 = *(int *)(local_b70.hit + 0x10c);
                      iVar66 = *(int *)(local_b70.hit + 0x110);
                      iVar67 = *(int *)(local_b70.hit + 0x114);
                      iVar68 = *(int *)(local_b70.hit + 0x118);
                      iVar69 = *(int *)(local_b70.hit + 0x11c);
                      iVar70 = *(int *)(local_b70.hit + 0x120);
                      iVar71 = *(int *)(local_b70.hit + 0x124);
                      iVar72 = *(int *)(local_b70.hit + 0x128);
                      iVar73 = *(int *)(local_b70.hit + 300);
                      iVar74 = *(int *)(local_b70.hit + 0x130);
                      iVar75 = *(int *)(local_b70.hit + 0x134);
                      iVar76 = *(int *)(local_b70.hit + 0x138);
                      iVar77 = *(int *)(local_b70.hit + 0x13c);
                      bVar6 = (bool)((byte)(uVar90 >> 1) & 1);
                      bVar7 = (bool)((byte)(uVar90 >> 2) & 1);
                      bVar8 = (bool)((byte)(uVar90 >> 3) & 1);
                      bVar9 = (bool)((byte)(uVar90 >> 4) & 1);
                      bVar10 = (bool)((byte)(uVar90 >> 5) & 1);
                      bVar11 = (bool)((byte)(uVar90 >> 6) & 1);
                      bVar12 = (bool)((byte)(uVar90 >> 7) & 1);
                      bVar13 = (bool)((byte)(uVar90 >> 9) & 1);
                      bVar14 = (bool)((byte)(uVar90 >> 10) & 1);
                      bVar15 = (bool)((byte)(uVar90 >> 0xb) & 1);
                      bVar16 = (bool)((byte)(uVar90 >> 0xc) & 1);
                      bVar17 = (bool)((byte)(uVar90 >> 0xd) & 1);
                      bVar18 = (bool)((byte)(uVar90 >> 0xe) & 1);
                      bVar19 = SUB81(uVar90 >> 0xf,0);
                      *(uint *)(local_b70.ray + 0x400) =
                           (uint)(bVar93 & 1) * *(int *)(local_b70.hit + 0x100) |
                           (uint)!(bool)(bVar93 & 1) * *(int *)(local_b70.ray + 0x400);
                      *(uint *)(local_b70.ray + 0x404) =
                           (uint)bVar6 * iVar63 | (uint)!bVar6 * *(int *)(local_b70.ray + 0x404);
                      *(uint *)(local_b70.ray + 0x408) =
                           (uint)bVar7 * iVar64 | (uint)!bVar7 * *(int *)(local_b70.ray + 0x408);
                      *(uint *)(local_b70.ray + 0x40c) =
                           (uint)bVar8 * iVar65 | (uint)!bVar8 * *(int *)(local_b70.ray + 0x40c);
                      *(uint *)(local_b70.ray + 0x410) =
                           (uint)bVar9 * iVar66 | (uint)!bVar9 * *(int *)(local_b70.ray + 0x410);
                      *(uint *)(local_b70.ray + 0x414) =
                           (uint)bVar10 * iVar67 | (uint)!bVar10 * *(int *)(local_b70.ray + 0x414);
                      *(uint *)(local_b70.ray + 0x418) =
                           (uint)bVar11 * iVar68 | (uint)!bVar11 * *(int *)(local_b70.ray + 0x418);
                      *(uint *)(local_b70.ray + 0x41c) =
                           (uint)bVar12 * iVar69 | (uint)!bVar12 * *(int *)(local_b70.ray + 0x41c);
                      *(uint *)(local_b70.ray + 0x420) =
                           (uint)(bVar84 & 1) * iVar70 |
                           (uint)!(bool)(bVar84 & 1) * *(int *)(local_b70.ray + 0x420);
                      *(uint *)(local_b70.ray + 0x424) =
                           (uint)bVar13 * iVar71 | (uint)!bVar13 * *(int *)(local_b70.ray + 0x424);
                      *(uint *)(local_b70.ray + 0x428) =
                           (uint)bVar14 * iVar72 | (uint)!bVar14 * *(int *)(local_b70.ray + 0x428);
                      *(uint *)(local_b70.ray + 0x42c) =
                           (uint)bVar15 * iVar73 | (uint)!bVar15 * *(int *)(local_b70.ray + 0x42c);
                      *(uint *)(local_b70.ray + 0x430) =
                           (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_b70.ray + 0x430);
                      *(uint *)(local_b70.ray + 0x434) =
                           (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_b70.ray + 0x434);
                      *(uint *)(local_b70.ray + 0x438) =
                           (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_b70.ray + 0x438);
                      *(uint *)(local_b70.ray + 0x43c) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_b70.ray + 0x43c);
                      auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b70.hit + 0x140));
                      auVar183 = vmovdqu32_avx512f(auVar183);
                      *(undefined1 (*) [64])(local_b70.ray + 0x440) = auVar183;
                      auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b70.hit + 0x180));
                      auVar183 = vmovdqu32_avx512f(auVar183);
                      *(undefined1 (*) [64])(local_b70.ray + 0x480) = auVar183;
                      auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b70.hit + 0x1c0));
                      auVar183 = vmovdqa32_avx512f(auVar183);
                      *(undefined1 (*) [64])(local_b70.ray + 0x4c0) = auVar183;
                      auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b70.hit + 0x200));
                      auVar183 = vmovdqa32_avx512f(auVar183);
                      *(undefined1 (*) [64])(local_b70.ray + 0x500) = auVar183;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar269;
                  break;
                }
              }
              lVar92 = lVar92 + -1;
            } while (lVar92 != 0);
            uVar190 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar181._4_4_ = uVar190;
            auVar181._0_4_ = uVar190;
            auVar181._8_4_ = uVar190;
            auVar181._12_4_ = uVar190;
            auVar181._16_4_ = uVar190;
            auVar181._20_4_ = uVar190;
            auVar181._24_4_ = uVar190;
            auVar181._28_4_ = uVar190;
            auVar79._4_4_ = fStack_71c;
            auVar79._0_4_ = local_720;
            auVar79._8_4_ = fStack_718;
            auVar79._12_4_ = fStack_714;
            auVar79._16_4_ = fStack_710;
            auVar79._20_4_ = fStack_70c;
            auVar79._24_4_ = fStack_708;
            auVar79._28_4_ = fStack_704;
            uVar22 = vcmpps_avx512vl(auVar181,auVar79,0xd);
            bVar86 = ~('\x01' << ((byte)iVar25 & 0x1f)) & bVar86 & (byte)uVar22;
          } while (bVar86 != 0);
          auVar157 = local_740;
          fVar263 = (float)local_9e0._0_4_;
          fVar268 = (float)local_9e0._4_4_;
          fVar269 = fStack_9d8;
          fVar270 = fStack_9d4;
          fVar243 = fStack_9d0;
          fVar244 = fStack_9cc;
          fVar245 = fStack_9c8;
          fVar229 = fStack_9c4;
        }
        uVar23 = vpcmpgtd_avx512vl(auVar157,local_6e0);
        uVar24 = vpcmpd_avx512vl(local_6e0,local_660,1);
        auVar224._0_4_ = fVar263 + (float)local_540._0_4_;
        auVar224._4_4_ = fVar268 + (float)local_540._4_4_;
        auVar224._8_4_ = fVar269 + fStack_538;
        auVar224._12_4_ = fVar270 + fStack_534;
        auVar224._16_4_ = fVar243 + fStack_530;
        auVar224._20_4_ = fVar244 + fStack_52c;
        auVar224._24_4_ = fVar245 + fStack_528;
        auVar224._28_4_ = fVar229 + fStack_524;
        uVar22 = vcmpps_avx512vl(auVar224,auVar181,2);
        bVar87 = bVar87 & (byte)uVar24 & (byte)uVar22;
        auVar225._0_4_ = fVar263 + local_6c0._0_4_;
        auVar225._4_4_ = fVar268 + local_6c0._4_4_;
        auVar225._8_4_ = fVar269 + local_6c0._8_4_;
        auVar225._12_4_ = fVar270 + local_6c0._12_4_;
        auVar225._16_4_ = fVar243 + local_6c0._16_4_;
        auVar225._20_4_ = fVar244 + local_6c0._20_4_;
        auVar225._24_4_ = fVar245 + local_6c0._24_4_;
        auVar225._28_4_ = fVar229 + local_6c0._28_4_;
        uVar22 = vcmpps_avx512vl(auVar225,auVar181,2);
        bVar82 = bVar82 & (byte)uVar23 & (byte)uVar22 | bVar87;
        auVar120 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar183 = ZEXT3264(auVar120);
        prim = local_8d0;
        if (bVar82 != 0) {
          abStack_1a0[uVar88 * 0x60] = bVar82;
          auVar159._0_4_ =
               (uint)(bVar87 & 1) * local_540._0_4_ |
               (uint)!(bool)(bVar87 & 1) * (int)local_6c0._0_4_;
          bVar6 = (bool)(bVar87 >> 1 & 1);
          auVar159._4_4_ = (uint)bVar6 * local_540._4_4_ | (uint)!bVar6 * (int)local_6c0._4_4_;
          bVar6 = (bool)(bVar87 >> 2 & 1);
          auVar159._8_4_ = (uint)bVar6 * (int)fStack_538 | (uint)!bVar6 * (int)local_6c0._8_4_;
          bVar6 = (bool)(bVar87 >> 3 & 1);
          auVar159._12_4_ = (uint)bVar6 * (int)fStack_534 | (uint)!bVar6 * (int)local_6c0._12_4_;
          bVar6 = (bool)(bVar87 >> 4 & 1);
          auVar159._16_4_ = (uint)bVar6 * (int)fStack_530 | (uint)!bVar6 * (int)local_6c0._16_4_;
          bVar6 = (bool)(bVar87 >> 5 & 1);
          auVar159._20_4_ = (uint)bVar6 * (int)fStack_52c | (uint)!bVar6 * (int)local_6c0._20_4_;
          auVar159._24_4_ =
               (uint)(bVar87 >> 6) * (int)fStack_528 |
               (uint)!(bool)(bVar87 >> 6) * (int)local_6c0._24_4_;
          auVar159._28_4_ = local_6c0._28_4_;
          *(undefined1 (*) [32])(auStack_180 + uVar88 * 0x60) = auVar159;
          uVar90 = vmovlps_avx(local_6f0);
          (&uStack_160)[uVar88 * 0xc] = uVar90;
          aiStack_158[uVar88 * 0x18] = iVar89 + 1;
          uVar88 = (ulong)((int)uVar88 + 1);
        }
      }
    }
    do {
      uVar95 = (uint)uVar88;
      uVar88 = (ulong)(uVar95 - 1);
      if (uVar95 == 0) {
        uVar190 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar38._4_4_ = uVar190;
        auVar38._0_4_ = uVar190;
        auVar38._8_4_ = uVar190;
        auVar38._12_4_ = uVar190;
        auVar38._16_4_ = uVar190;
        auVar38._20_4_ = uVar190;
        auVar38._24_4_ = uVar190;
        auVar38._28_4_ = uVar190;
        uVar22 = vcmpps_avx512vl(local_640,auVar38,2);
        uVar91 = (uint)local_8c8 & (uint)uVar22;
        local_8c8 = (ulong)uVar91;
        if (uVar91 == 0) {
          return;
        }
        goto LAB_01d76276;
      }
      lVar92 = uVar88 * 0x60;
      auVar120 = *(undefined1 (*) [32])(auStack_180 + lVar92);
      auVar206._0_4_ = fVar263 + auVar120._0_4_;
      auVar206._4_4_ = fVar268 + auVar120._4_4_;
      auVar206._8_4_ = fVar269 + auVar120._8_4_;
      auVar206._12_4_ = fVar270 + auVar120._12_4_;
      auVar206._16_4_ = fVar243 + auVar120._16_4_;
      auVar206._20_4_ = fVar244 + auVar120._20_4_;
      auVar206._24_4_ = fVar245 + auVar120._24_4_;
      auVar206._28_4_ = fVar229 + auVar120._28_4_;
      uVar190 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar37._4_4_ = uVar190;
      auVar37._0_4_ = uVar190;
      auVar37._8_4_ = uVar190;
      auVar37._12_4_ = uVar190;
      auVar37._16_4_ = uVar190;
      auVar37._20_4_ = uVar190;
      auVar37._24_4_ = uVar190;
      auVar37._28_4_ = uVar190;
      uVar22 = vcmpps_avx512vl(auVar206,auVar37,2);
      uVar94 = (uint)uVar22 & (uint)abStack_1a0[lVar92];
    } while (uVar94 == 0);
    uVar90 = (&uStack_160)[uVar88 * 0xc];
    auVar191._8_8_ = 0;
    auVar191._0_8_ = uVar90;
    auVar223._8_4_ = 0x7f800000;
    auVar223._0_8_ = 0x7f8000007f800000;
    auVar223._12_4_ = 0x7f800000;
    auVar223._16_4_ = 0x7f800000;
    auVar223._20_4_ = 0x7f800000;
    auVar223._24_4_ = 0x7f800000;
    auVar223._28_4_ = 0x7f800000;
    auVar121 = vblendmps_avx512vl(auVar223,auVar120);
    bVar82 = (byte)uVar94;
    auVar155._0_4_ =
         (uint)(bVar82 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar82 & 1) * (int)auVar120._0_4_;
    bVar6 = (bool)((byte)(uVar94 >> 1) & 1);
    auVar155._4_4_ = (uint)bVar6 * auVar121._4_4_ | (uint)!bVar6 * (int)auVar120._4_4_;
    bVar6 = (bool)((byte)(uVar94 >> 2) & 1);
    auVar155._8_4_ = (uint)bVar6 * auVar121._8_4_ | (uint)!bVar6 * (int)auVar120._8_4_;
    bVar6 = (bool)((byte)(uVar94 >> 3) & 1);
    auVar155._12_4_ = (uint)bVar6 * auVar121._12_4_ | (uint)!bVar6 * (int)auVar120._12_4_;
    bVar6 = (bool)((byte)(uVar94 >> 4) & 1);
    auVar155._16_4_ = (uint)bVar6 * auVar121._16_4_ | (uint)!bVar6 * (int)auVar120._16_4_;
    bVar6 = (bool)((byte)(uVar94 >> 5) & 1);
    auVar155._20_4_ = (uint)bVar6 * auVar121._20_4_ | (uint)!bVar6 * (int)auVar120._20_4_;
    bVar6 = (bool)((byte)(uVar94 >> 6) & 1);
    auVar155._24_4_ = (uint)bVar6 * auVar121._24_4_ | (uint)!bVar6 * (int)auVar120._24_4_;
    auVar155._28_4_ =
         (uVar94 >> 7) * auVar121._28_4_ | (uint)!SUB41(uVar94 >> 7,0) * (int)auVar120._28_4_;
    auVar120 = vshufps_avx(auVar155,auVar155,0xb1);
    auVar120 = vminps_avx(auVar155,auVar120);
    auVar121 = vshufpd_avx(auVar120,auVar120,5);
    auVar120 = vminps_avx(auVar120,auVar121);
    auVar121 = vpermpd_avx2(auVar120,0x4e);
    auVar120 = vminps_avx(auVar120,auVar121);
    uVar22 = vcmpps_avx512vl(auVar155,auVar120,0);
    bVar86 = (byte)uVar22 & bVar82;
    if (bVar86 != 0) {
      uVar94 = (uint)bVar86;
    }
    uVar161 = 0;
    for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
      uVar161 = uVar161 + 1;
    }
    iVar89 = aiStack_158[uVar88 * 0x18];
    bVar82 = ~('\x01' << ((byte)uVar161 & 0x1f)) & bVar82;
    abStack_1a0[lVar92] = bVar82;
    if (bVar82 == 0) {
      uVar95 = uVar95 - 1;
    }
    uVar190 = (undefined4)uVar90;
    auVar177._4_4_ = uVar190;
    auVar177._0_4_ = uVar190;
    auVar177._8_4_ = uVar190;
    auVar177._12_4_ = uVar190;
    auVar177._16_4_ = uVar190;
    auVar177._20_4_ = uVar190;
    auVar177._24_4_ = uVar190;
    auVar177._28_4_ = uVar190;
    auVar98 = vmovshdup_avx(auVar191);
    auVar98 = vsubps_avx(auVar98,auVar191);
    auVar207._0_4_ = auVar98._0_4_;
    auVar207._4_4_ = auVar207._0_4_;
    auVar207._8_4_ = auVar207._0_4_;
    auVar207._12_4_ = auVar207._0_4_;
    auVar207._16_4_ = auVar207._0_4_;
    auVar207._20_4_ = auVar207._0_4_;
    auVar207._24_4_ = auVar207._0_4_;
    auVar207._28_4_ = auVar207._0_4_;
    auVar98 = vfmadd132ps_fma(auVar207,auVar177,_DAT_01faff20);
    auVar120 = ZEXT1632(auVar98);
    local_400[0] = (RTCHitN)auVar120[0];
    local_400[1] = (RTCHitN)auVar120[1];
    local_400[2] = (RTCHitN)auVar120[2];
    local_400[3] = (RTCHitN)auVar120[3];
    local_400[4] = (RTCHitN)auVar120[4];
    local_400[5] = (RTCHitN)auVar120[5];
    local_400[6] = (RTCHitN)auVar120[6];
    local_400[7] = (RTCHitN)auVar120[7];
    local_400[8] = (RTCHitN)auVar120[8];
    local_400[9] = (RTCHitN)auVar120[9];
    local_400[10] = (RTCHitN)auVar120[10];
    local_400[0xb] = (RTCHitN)auVar120[0xb];
    local_400[0xc] = (RTCHitN)auVar120[0xc];
    local_400[0xd] = (RTCHitN)auVar120[0xd];
    local_400[0xe] = (RTCHitN)auVar120[0xe];
    local_400[0xf] = (RTCHitN)auVar120[0xf];
    local_400[0x10] = (RTCHitN)auVar120[0x10];
    local_400[0x11] = (RTCHitN)auVar120[0x11];
    local_400[0x12] = (RTCHitN)auVar120[0x12];
    local_400[0x13] = (RTCHitN)auVar120[0x13];
    local_400[0x14] = (RTCHitN)auVar120[0x14];
    local_400[0x15] = (RTCHitN)auVar120[0x15];
    local_400[0x16] = (RTCHitN)auVar120[0x16];
    local_400[0x17] = (RTCHitN)auVar120[0x17];
    local_400[0x18] = (RTCHitN)auVar120[0x18];
    local_400[0x19] = (RTCHitN)auVar120[0x19];
    local_400[0x1a] = (RTCHitN)auVar120[0x1a];
    local_400[0x1b] = (RTCHitN)auVar120[0x1b];
    local_400[0x1c] = (RTCHitN)auVar120[0x1c];
    local_400[0x1d] = (RTCHitN)auVar120[0x1d];
    local_400[0x1e] = (RTCHitN)auVar120[0x1e];
    local_400[0x1f] = (RTCHitN)auVar120[0x1f];
    local_6f0._8_8_ = 0;
    local_6f0._0_8_ = *(ulong *)(local_400 + (ulong)uVar161 * 4);
    uVar88 = (ulong)uVar95;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }